

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  __int_type_conflict _Var36;
  RTCFilterFunctionN p_Var37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  bool bVar129;
  bool bVar130;
  bool bVar131;
  bool bVar132;
  bool bVar133;
  bool bVar134;
  bool bVar135;
  bool bVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [28];
  undefined1 auVar154 [28];
  undefined1 auVar155 [28];
  undefined1 auVar156 [28];
  undefined1 auVar157 [28];
  uint uVar158;
  uint uVar159;
  uint uVar160;
  ulong uVar161;
  ulong uVar162;
  uint uVar163;
  long lVar164;
  long lVar165;
  long lVar166;
  Geometry *pGVar167;
  long lVar168;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar169;
  float fVar194;
  float fVar197;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar170;
  float fVar195;
  float fVar198;
  float fVar200;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar174 [16];
  float fVar171;
  float fVar196;
  float fVar199;
  float fVar201;
  float fVar205;
  float fVar206;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar207 [16];
  undefined1 auVar210 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar225;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar241;
  undefined1 auVar234 [32];
  float fVar243;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar245;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar242;
  float fVar244;
  undefined1 auVar240 [64];
  float fVar246;
  float fVar262;
  undefined1 auVar247 [16];
  float fVar261;
  float fVar263;
  undefined1 auVar249 [16];
  float fVar260;
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar248 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar267;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  float fVar268;
  float fVar281;
  float fVar285;
  float fVar288;
  undefined1 auVar272 [16];
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar275 [16];
  float fVar282;
  undefined1 auVar274 [16];
  float fVar283;
  float fVar286;
  float fVar289;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar276 [32];
  float fVar284;
  float fVar287;
  float fVar290;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar294;
  float fVar304;
  float fVar305;
  undefined1 auVar295 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar296 [32];
  float fVar306;
  float fVar311;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar312;
  undefined1 auVar313 [16];
  float fVar320;
  float fVar321;
  float fVar323;
  float fVar324;
  float fVar325;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar322;
  float fVar326;
  undefined1 auVar319 [32];
  undefined1 auVar329 [16];
  float fVar327;
  float fVar328;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  float fVar340;
  undefined1 auVar335 [64];
  float fVar345;
  undefined1 auVar348 [16];
  float fVar359;
  float fVar361;
  float fVar363;
  float fVar364;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar346;
  undefined1 auVar356 [32];
  float fVar360;
  float fVar362;
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar375;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar376;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [64];
  float fVar386;
  float fVar393;
  float fVar394;
  float fVar395;
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  float in_register_0000151c;
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar404;
  float fVar405;
  undefined1 auVar406 [16];
  float fVar411;
  float fVar413;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  float fVar412;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  float fVar417;
  float fVar418;
  float fVar423;
  float fVar425;
  float fVar426;
  float in_register_0000159c;
  undefined1 auVar420 [32];
  float fVar424;
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float fVar427;
  float fVar433;
  float fVar434;
  float fVar435;
  float in_register_000015dc;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 uStack_908;
  RTCFilterFunctionNArguments local_8f0;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [8];
  undefined8 uStack_858;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  float local_840;
  float fStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined1 local_790 [8];
  undefined8 uStack_788;
  undefined8 *local_778;
  undefined1 (*local_770) [16];
  undefined1 (*local_768) [32];
  undefined8 local_760;
  undefined1 auStack_758 [8];
  undefined1 auStack_750 [8];
  float fStack_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [16];
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  LinearSpace3fa *local_6b0;
  Primitive *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  uint local_460;
  uint local_45c;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_400 [32];
  float local_3e0 [4];
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  RTCHitN local_2a0 [16];
  undefined1 auStack_290 [16];
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar273 [16];
  undefined1 auVar347 [16];
  undefined1 auVar419 [16];
  
  PVar31 = prim[1];
  uVar161 = (ulong)(byte)PVar31;
  lVar164 = uVar161 * 0x25;
  auVar173 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar173 = vinsertps_avx(auVar173,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar230 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar230 = vinsertps_avx(auVar230,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar173 = vsubps_avx(auVar173,*(undefined1 (*) [16])(prim + lVar164 + 6));
  fVar246 = *(float *)(prim + lVar164 + 0x12);
  auVar207._0_4_ = fVar246 * auVar173._0_4_;
  auVar207._4_4_ = fVar246 * auVar173._4_4_;
  auVar207._8_4_ = fVar246 * auVar173._8_4_;
  auVar207._12_4_ = fVar246 * auVar173._12_4_;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 4 + 6)));
  auVar295._0_4_ = fVar246 * auVar230._0_4_;
  auVar295._4_4_ = fVar246 * auVar230._4_4_;
  auVar295._8_4_ = fVar246 * auVar230._8_4_;
  auVar295._12_4_ = fVar246 * auVar230._12_4_;
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 4 + 10)));
  auVar175._16_16_ = auVar230;
  auVar175._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar175);
  lVar168 = uVar161 * 5;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar168 + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar168 + 10)));
  auVar234._16_16_ = auVar230;
  auVar234._0_16_ = auVar173;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 6 + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 6 + 10)));
  auVar186 = vcvtdq2ps_avx(auVar234);
  auVar250._16_16_ = auVar230;
  auVar250._0_16_ = auVar173;
  auVar38 = vcvtdq2ps_avx(auVar250);
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0xf + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0xf + 10)));
  auVar251._16_16_ = auVar230;
  auVar251._0_16_ = auVar173;
  auVar39 = vcvtdq2ps_avx(auVar251);
  lVar165 = (ulong)(byte)PVar31 * 0x10;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar165 + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar165 + 10)));
  auVar314._16_16_ = auVar230;
  auVar314._0_16_ = auVar173;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar165 + uVar161 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar314);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar165 + uVar161 + 10)));
  auVar330._16_16_ = auVar230;
  auVar330._0_16_ = auVar173;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1a + 6)));
  auVar371 = vcvtdq2ps_avx(auVar330);
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1a + 10)));
  auVar331._16_16_ = auVar230;
  auVar331._0_16_ = auVar173;
  auVar357 = vcvtdq2ps_avx(auVar331);
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1b + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1b + 10)));
  auVar365._16_16_ = auVar230;
  auVar365._0_16_ = auVar173;
  auVar173 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1c + 6)));
  auVar230 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar161 * 0x1c + 10)));
  auVar41 = vcvtdq2ps_avx(auVar365);
  auVar377._16_16_ = auVar230;
  auVar377._0_16_ = auVar173;
  auVar431 = vcvtdq2ps_avx(auVar377);
  auVar173 = vshufps_avx(auVar295,auVar295,0);
  auVar230 = vshufps_avx(auVar295,auVar295,0x55);
  auVar275 = vshufps_avx(auVar295,auVar295,0xaa);
  fVar246 = auVar275._0_4_;
  fVar261 = auVar275._4_4_;
  fVar260 = auVar275._8_4_;
  fVar263 = auVar275._12_4_;
  fVar243 = auVar230._0_4_;
  fVar244 = auVar230._4_4_;
  fVar262 = auVar230._8_4_;
  fVar309 = auVar230._12_4_;
  fVar264 = auVar173._0_4_;
  fVar265 = auVar173._4_4_;
  fVar266 = auVar173._8_4_;
  fVar268 = auVar173._12_4_;
  auVar396._0_4_ = fVar264 * auVar175._0_4_ + fVar243 * auVar186._0_4_ + fVar246 * auVar38._0_4_;
  auVar396._4_4_ = fVar265 * auVar175._4_4_ + fVar244 * auVar186._4_4_ + fVar261 * auVar38._4_4_;
  auVar396._8_4_ = fVar266 * auVar175._8_4_ + fVar262 * auVar186._8_4_ + fVar260 * auVar38._8_4_;
  auVar396._12_4_ = fVar268 * auVar175._12_4_ + fVar309 * auVar186._12_4_ + fVar263 * auVar38._12_4_
  ;
  auVar396._16_4_ = fVar264 * auVar175._16_4_ + fVar243 * auVar186._16_4_ + fVar246 * auVar38._16_4_
  ;
  auVar396._20_4_ = fVar265 * auVar175._20_4_ + fVar244 * auVar186._20_4_ + fVar261 * auVar38._20_4_
  ;
  auVar396._24_4_ = fVar266 * auVar175._24_4_ + fVar262 * auVar186._24_4_ + fVar260 * auVar38._24_4_
  ;
  auVar396._28_4_ = fVar309 + in_register_000015dc + in_register_0000151c;
  auVar387._0_4_ = fVar264 * auVar39._0_4_ + fVar243 * auVar40._0_4_ + auVar371._0_4_ * fVar246;
  auVar387._4_4_ = fVar265 * auVar39._4_4_ + fVar244 * auVar40._4_4_ + auVar371._4_4_ * fVar261;
  auVar387._8_4_ = fVar266 * auVar39._8_4_ + fVar262 * auVar40._8_4_ + auVar371._8_4_ * fVar260;
  auVar387._12_4_ = fVar268 * auVar39._12_4_ + fVar309 * auVar40._12_4_ + auVar371._12_4_ * fVar263;
  auVar387._16_4_ = fVar264 * auVar39._16_4_ + fVar243 * auVar40._16_4_ + auVar371._16_4_ * fVar246;
  auVar387._20_4_ = fVar265 * auVar39._20_4_ + fVar244 * auVar40._20_4_ + auVar371._20_4_ * fVar261;
  auVar387._24_4_ = fVar266 * auVar39._24_4_ + fVar262 * auVar40._24_4_ + auVar371._24_4_ * fVar260;
  auVar387._28_4_ = fVar309 + in_register_000015dc + in_register_0000159c;
  auVar296._0_4_ = fVar264 * auVar357._0_4_ + fVar243 * auVar41._0_4_ + auVar431._0_4_ * fVar246;
  auVar296._4_4_ = fVar265 * auVar357._4_4_ + fVar244 * auVar41._4_4_ + auVar431._4_4_ * fVar261;
  auVar296._8_4_ = fVar266 * auVar357._8_4_ + fVar262 * auVar41._8_4_ + auVar431._8_4_ * fVar260;
  auVar296._12_4_ = fVar268 * auVar357._12_4_ + fVar309 * auVar41._12_4_ + auVar431._12_4_ * fVar263
  ;
  auVar296._16_4_ = fVar264 * auVar357._16_4_ + fVar243 * auVar41._16_4_ + auVar431._16_4_ * fVar246
  ;
  auVar296._20_4_ = fVar265 * auVar357._20_4_ + fVar244 * auVar41._20_4_ + auVar431._20_4_ * fVar261
  ;
  auVar296._24_4_ = fVar266 * auVar357._24_4_ + fVar262 * auVar41._24_4_ + auVar431._24_4_ * fVar260
  ;
  auVar296._28_4_ = fVar268 + fVar309 + fVar263;
  auVar173 = vshufps_avx(auVar207,auVar207,0);
  auVar230 = vshufps_avx(auVar207,auVar207,0x55);
  auVar275 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar246 = auVar275._0_4_;
  fVar261 = auVar275._4_4_;
  fVar260 = auVar275._8_4_;
  fVar263 = auVar275._12_4_;
  fVar265 = auVar230._0_4_;
  fVar266 = auVar230._4_4_;
  fVar268 = auVar230._8_4_;
  fVar281 = auVar230._12_4_;
  fVar243 = auVar186._28_4_ + auVar38._28_4_;
  fVar244 = auVar173._0_4_;
  fVar262 = auVar173._4_4_;
  fVar309 = auVar173._8_4_;
  fVar264 = auVar173._12_4_;
  auVar210._0_4_ = fVar244 * auVar175._0_4_ + fVar265 * auVar186._0_4_ + fVar246 * auVar38._0_4_;
  auVar210._4_4_ = fVar262 * auVar175._4_4_ + fVar266 * auVar186._4_4_ + fVar261 * auVar38._4_4_;
  auVar210._8_4_ = fVar309 * auVar175._8_4_ + fVar268 * auVar186._8_4_ + fVar260 * auVar38._8_4_;
  auVar210._12_4_ = fVar264 * auVar175._12_4_ + fVar281 * auVar186._12_4_ + fVar263 * auVar38._12_4_
  ;
  auVar210._16_4_ = fVar244 * auVar175._16_4_ + fVar265 * auVar186._16_4_ + fVar246 * auVar38._16_4_
  ;
  auVar210._20_4_ = fVar262 * auVar175._20_4_ + fVar266 * auVar186._20_4_ + fVar261 * auVar38._20_4_
  ;
  auVar210._24_4_ = fVar309 * auVar175._24_4_ + fVar268 * auVar186._24_4_ + fVar260 * auVar38._24_4_
  ;
  auVar210._28_4_ = auVar175._28_4_ + fVar243;
  auVar176._0_4_ = fVar244 * auVar39._0_4_ + auVar371._0_4_ * fVar246 + fVar265 * auVar40._0_4_;
  auVar176._4_4_ = fVar262 * auVar39._4_4_ + auVar371._4_4_ * fVar261 + fVar266 * auVar40._4_4_;
  auVar176._8_4_ = fVar309 * auVar39._8_4_ + auVar371._8_4_ * fVar260 + fVar268 * auVar40._8_4_;
  auVar176._12_4_ = fVar264 * auVar39._12_4_ + auVar371._12_4_ * fVar263 + fVar281 * auVar40._12_4_;
  auVar176._16_4_ = fVar244 * auVar39._16_4_ + auVar371._16_4_ * fVar246 + fVar265 * auVar40._16_4_;
  auVar176._20_4_ = fVar262 * auVar39._20_4_ + auVar371._20_4_ * fVar261 + fVar266 * auVar40._20_4_;
  auVar176._24_4_ = fVar309 * auVar39._24_4_ + auVar371._24_4_ * fVar260 + fVar268 * auVar40._24_4_;
  auVar176._28_4_ = auVar175._28_4_ + auVar371._28_4_ + auVar38._28_4_;
  auVar349._8_4_ = 0x7fffffff;
  auVar349._0_8_ = 0x7fffffff7fffffff;
  auVar349._12_4_ = 0x7fffffff;
  auVar349._16_4_ = 0x7fffffff;
  auVar349._20_4_ = 0x7fffffff;
  auVar349._24_4_ = 0x7fffffff;
  auVar349._28_4_ = 0x7fffffff;
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  auVar252._16_4_ = 0x219392ef;
  auVar252._20_4_ = 0x219392ef;
  auVar252._24_4_ = 0x219392ef;
  auVar252._28_4_ = 0x219392ef;
  auVar175 = vandps_avx(auVar396,auVar349);
  auVar175 = vcmpps_avx(auVar175,auVar252,1);
  auVar186 = vblendvps_avx(auVar396,auVar252,auVar175);
  auVar175 = vandps_avx(auVar387,auVar349);
  auVar175 = vcmpps_avx(auVar175,auVar252,1);
  auVar38 = vblendvps_avx(auVar387,auVar252,auVar175);
  auVar175 = vandps_avx(auVar349,auVar296);
  auVar175 = vcmpps_avx(auVar175,auVar252,1);
  auVar175 = vblendvps_avx(auVar296,auVar252,auVar175);
  auVar235._0_4_ = fVar244 * auVar357._0_4_ + fVar265 * auVar41._0_4_ + auVar431._0_4_ * fVar246;
  auVar235._4_4_ = fVar262 * auVar357._4_4_ + fVar266 * auVar41._4_4_ + auVar431._4_4_ * fVar261;
  auVar235._8_4_ = fVar309 * auVar357._8_4_ + fVar268 * auVar41._8_4_ + auVar431._8_4_ * fVar260;
  auVar235._12_4_ = fVar264 * auVar357._12_4_ + fVar281 * auVar41._12_4_ + auVar431._12_4_ * fVar263
  ;
  auVar235._16_4_ = fVar244 * auVar357._16_4_ + fVar265 * auVar41._16_4_ + auVar431._16_4_ * fVar246
  ;
  auVar235._20_4_ = fVar262 * auVar357._20_4_ + fVar266 * auVar41._20_4_ + auVar431._20_4_ * fVar261
  ;
  auVar235._24_4_ = fVar309 * auVar357._24_4_ + fVar268 * auVar41._24_4_ + auVar431._24_4_ * fVar260
  ;
  auVar235._28_4_ = fVar243 + auVar40._28_4_ + fVar263;
  auVar39 = vrcpps_avx(auVar186);
  fVar246 = auVar39._0_4_;
  fVar260 = auVar39._4_4_;
  auVar40._4_4_ = auVar186._4_4_ * fVar260;
  auVar40._0_4_ = auVar186._0_4_ * fVar246;
  fVar243 = auVar39._8_4_;
  auVar40._8_4_ = auVar186._8_4_ * fVar243;
  fVar262 = auVar39._12_4_;
  auVar40._12_4_ = auVar186._12_4_ * fVar262;
  fVar264 = auVar39._16_4_;
  auVar40._16_4_ = auVar186._16_4_ * fVar264;
  fVar265 = auVar39._20_4_;
  auVar40._20_4_ = auVar186._20_4_ * fVar265;
  fVar266 = auVar39._24_4_;
  auVar40._24_4_ = auVar186._24_4_ * fVar266;
  auVar40._28_4_ = auVar186._28_4_;
  auVar350._8_4_ = 0x3f800000;
  auVar350._0_8_ = &DAT_3f8000003f800000;
  auVar350._12_4_ = 0x3f800000;
  auVar350._16_4_ = 0x3f800000;
  auVar350._20_4_ = 0x3f800000;
  auVar350._24_4_ = 0x3f800000;
  auVar350._28_4_ = 0x3f800000;
  auVar371 = vsubps_avx(auVar350,auVar40);
  auVar40 = vrcpps_avx(auVar38);
  fVar246 = fVar246 + fVar246 * auVar371._0_4_;
  fVar260 = fVar260 + fVar260 * auVar371._4_4_;
  fVar243 = fVar243 + fVar243 * auVar371._8_4_;
  fVar262 = fVar262 + fVar262 * auVar371._12_4_;
  fVar264 = fVar264 + fVar264 * auVar371._16_4_;
  fVar265 = fVar265 + fVar265 * auVar371._20_4_;
  fVar266 = fVar266 + fVar266 * auVar371._24_4_;
  fVar268 = auVar40._0_4_;
  fVar281 = auVar40._4_4_;
  auVar186._4_4_ = fVar281 * auVar38._4_4_;
  auVar186._0_4_ = fVar268 * auVar38._0_4_;
  fVar285 = auVar40._8_4_;
  auVar186._8_4_ = fVar285 * auVar38._8_4_;
  fVar288 = auVar40._12_4_;
  auVar186._12_4_ = fVar288 * auVar38._12_4_;
  fVar291 = auVar40._16_4_;
  auVar186._16_4_ = fVar291 * auVar38._16_4_;
  fVar292 = auVar40._20_4_;
  auVar186._20_4_ = fVar292 * auVar38._20_4_;
  fVar293 = auVar40._24_4_;
  auVar186._24_4_ = fVar293 * auVar38._24_4_;
  auVar186._28_4_ = auVar371._28_4_;
  auVar38 = vsubps_avx(auVar350,auVar186);
  fVar268 = fVar268 + fVar268 * auVar38._0_4_;
  fVar281 = fVar281 + fVar281 * auVar38._4_4_;
  fVar285 = fVar285 + fVar285 * auVar38._8_4_;
  fVar288 = fVar288 + fVar288 * auVar38._12_4_;
  fVar291 = fVar291 + fVar291 * auVar38._16_4_;
  fVar292 = fVar292 + fVar292 * auVar38._20_4_;
  fVar293 = fVar293 + fVar293 * auVar38._24_4_;
  auVar186 = vrcpps_avx(auVar175);
  fVar294 = auVar186._0_4_;
  fVar304 = auVar186._4_4_;
  auVar357._4_4_ = fVar304 * auVar175._4_4_;
  auVar357._0_4_ = fVar294 * auVar175._0_4_;
  fVar305 = auVar186._8_4_;
  auVar357._8_4_ = fVar305 * auVar175._8_4_;
  fVar306 = auVar186._12_4_;
  auVar357._12_4_ = fVar306 * auVar175._12_4_;
  fVar307 = auVar186._16_4_;
  auVar357._16_4_ = fVar307 * auVar175._16_4_;
  fVar308 = auVar186._20_4_;
  auVar357._20_4_ = fVar308 * auVar175._20_4_;
  fVar310 = auVar186._24_4_;
  auVar357._24_4_ = fVar310 * auVar175._24_4_;
  auVar357._28_4_ = auVar175._28_4_;
  auVar175 = vsubps_avx(auVar350,auVar357);
  fVar294 = fVar294 + fVar294 * auVar175._0_4_;
  fVar304 = fVar304 + fVar304 * auVar175._4_4_;
  fVar305 = fVar305 + fVar305 * auVar175._8_4_;
  fVar306 = fVar306 + fVar306 * auVar175._12_4_;
  fVar307 = fVar307 + fVar307 * auVar175._16_4_;
  fVar308 = fVar308 + fVar308 * auVar175._20_4_;
  fVar310 = fVar310 + fVar310 * auVar175._24_4_;
  auVar173 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar164 + 0x16)) *
                           *(float *)(prim + lVar164 + 0x1a)));
  auVar42 = vshufps_avx(auVar173,auVar173,0);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar161 * 7 + 6);
  auVar173 = vpmovsxwd_avx(auVar173);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *(ulong *)(prim + uVar161 * 7 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar230);
  auVar332._16_16_ = auVar230;
  auVar332._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar332);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *(ulong *)(prim + uVar161 * 0xb + 6);
  auVar173 = vpmovsxwd_avx(auVar275);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *(ulong *)(prim + uVar161 * 0xb + 0xe);
  auVar230 = vpmovsxwd_avx(auVar249);
  auVar351._16_16_ = auVar230;
  auVar351._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar351);
  auVar186 = vsubps_avx(auVar186,auVar175);
  fVar261 = auVar42._0_4_;
  fVar263 = auVar42._4_4_;
  fVar244 = auVar42._8_4_;
  fVar309 = auVar42._12_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar161 * 9 + 6);
  auVar173 = vpmovsxwd_avx(auVar42);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar161 * 9 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar12);
  auVar333._0_4_ = auVar186._0_4_ * fVar261 + auVar175._0_4_;
  auVar333._4_4_ = auVar186._4_4_ * fVar263 + auVar175._4_4_;
  auVar333._8_4_ = auVar186._8_4_ * fVar244 + auVar175._8_4_;
  auVar333._12_4_ = auVar186._12_4_ * fVar309 + auVar175._12_4_;
  auVar333._16_4_ = auVar186._16_4_ * fVar261 + auVar175._16_4_;
  auVar333._20_4_ = auVar186._20_4_ * fVar263 + auVar175._20_4_;
  auVar333._24_4_ = auVar186._24_4_ * fVar244 + auVar175._24_4_;
  auVar333._28_4_ = auVar186._28_4_ + auVar175._28_4_;
  auVar352._16_16_ = auVar230;
  auVar352._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar352);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar161 * 0xd + 6);
  auVar173 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar161 * 0xd + 0xe);
  auVar230 = vpmovsxwd_avx(auVar14);
  auVar366._16_16_ = auVar230;
  auVar366._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar366);
  auVar186 = vsubps_avx(auVar186,auVar175);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar161 * 0x12 + 6);
  auVar173 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar161 * 0x12 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar16);
  auVar353._0_4_ = auVar175._0_4_ + auVar186._0_4_ * fVar261;
  auVar353._4_4_ = auVar175._4_4_ + auVar186._4_4_ * fVar263;
  auVar353._8_4_ = auVar175._8_4_ + auVar186._8_4_ * fVar244;
  auVar353._12_4_ = auVar175._12_4_ + auVar186._12_4_ * fVar309;
  auVar353._16_4_ = auVar175._16_4_ + auVar186._16_4_ * fVar261;
  auVar353._20_4_ = auVar175._20_4_ + auVar186._20_4_ * fVar263;
  auVar353._24_4_ = auVar175._24_4_ + auVar186._24_4_ * fVar244;
  auVar353._28_4_ = auVar175._28_4_ + auVar186._28_4_;
  auVar367._16_16_ = auVar230;
  auVar367._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar367);
  uVar162 = (ulong)(uint)((int)lVar168 << 2);
  lVar164 = uVar161 * 2 + uVar162;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar164 + 6);
  auVar173 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar164 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar18);
  auVar378._16_16_ = auVar230;
  auVar378._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar378);
  auVar186 = vsubps_avx(auVar186,auVar175);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar162 + 6);
  auVar173 = vpmovsxwd_avx(auVar19);
  auVar368._0_4_ = auVar175._0_4_ + auVar186._0_4_ * fVar261;
  auVar368._4_4_ = auVar175._4_4_ + auVar186._4_4_ * fVar263;
  auVar368._8_4_ = auVar175._8_4_ + auVar186._8_4_ * fVar244;
  auVar368._12_4_ = auVar175._12_4_ + auVar186._12_4_ * fVar309;
  auVar368._16_4_ = auVar175._16_4_ + auVar186._16_4_ * fVar261;
  auVar368._20_4_ = auVar175._20_4_ + auVar186._20_4_ * fVar263;
  auVar368._24_4_ = auVar175._24_4_ + auVar186._24_4_ * fVar244;
  auVar368._28_4_ = auVar175._28_4_ + auVar186._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar162 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar20);
  auVar379._16_16_ = auVar230;
  auVar379._0_16_ = auVar173;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar161 * 0x18 + 6);
  auVar173 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar161 * 0x18 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar22);
  auVar175 = vcvtdq2ps_avx(auVar379);
  auVar388._16_16_ = auVar230;
  auVar388._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar388);
  auVar186 = vsubps_avx(auVar186,auVar175);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar161 * 0x1d + 6);
  auVar173 = vpmovsxwd_avx(auVar23);
  auVar380._0_4_ = auVar175._0_4_ + auVar186._0_4_ * fVar261;
  auVar380._4_4_ = auVar175._4_4_ + auVar186._4_4_ * fVar263;
  auVar380._8_4_ = auVar175._8_4_ + auVar186._8_4_ * fVar244;
  auVar380._12_4_ = auVar175._12_4_ + auVar186._12_4_ * fVar309;
  auVar380._16_4_ = auVar175._16_4_ + auVar186._16_4_ * fVar261;
  auVar380._20_4_ = auVar175._20_4_ + auVar186._20_4_ * fVar263;
  auVar380._24_4_ = auVar175._24_4_ + auVar186._24_4_ * fVar244;
  auVar380._28_4_ = auVar175._28_4_ + auVar186._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar161 * 0x1d + 0xe);
  auVar230 = vpmovsxwd_avx(auVar24);
  auVar389._16_16_ = auVar230;
  auVar389._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar389);
  lVar164 = uVar161 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar164 + 6);
  auVar173 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar164 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar26);
  auVar397._16_16_ = auVar230;
  auVar397._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar397);
  auVar186 = vsubps_avx(auVar186,auVar175);
  auVar390._0_4_ = auVar175._0_4_ + auVar186._0_4_ * fVar261;
  auVar390._4_4_ = auVar175._4_4_ + auVar186._4_4_ * fVar263;
  auVar390._8_4_ = auVar175._8_4_ + auVar186._8_4_ * fVar244;
  auVar390._12_4_ = auVar175._12_4_ + auVar186._12_4_ * fVar309;
  auVar390._16_4_ = auVar175._16_4_ + auVar186._16_4_ * fVar261;
  auVar390._20_4_ = auVar175._20_4_ + auVar186._20_4_ * fVar263;
  auVar390._24_4_ = auVar175._24_4_ + auVar186._24_4_ * fVar244;
  auVar390._28_4_ = auVar175._28_4_ + auVar186._28_4_;
  lVar164 = (ulong)(byte)PVar31 * 0x20 - uVar161;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar164 + 6);
  auVar173 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar164 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar28);
  auVar398._16_16_ = auVar230;
  auVar398._0_16_ = auVar173;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar161 * 0x23 + 6);
  auVar173 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar161 * 0x23 + 0xe);
  auVar230 = vpmovsxwd_avx(auVar30);
  auVar407._16_16_ = auVar230;
  auVar407._0_16_ = auVar173;
  auVar175 = vcvtdq2ps_avx(auVar398);
  auVar186 = vcvtdq2ps_avx(auVar407);
  auVar186 = vsubps_avx(auVar186,auVar175);
  auVar399._0_4_ = auVar175._0_4_ + auVar186._0_4_ * fVar261;
  auVar399._4_4_ = auVar175._4_4_ + auVar186._4_4_ * fVar263;
  auVar399._8_4_ = auVar175._8_4_ + auVar186._8_4_ * fVar244;
  auVar399._12_4_ = auVar175._12_4_ + auVar186._12_4_ * fVar309;
  auVar399._16_4_ = auVar175._16_4_ + auVar186._16_4_ * fVar261;
  auVar399._20_4_ = auVar175._20_4_ + auVar186._20_4_ * fVar263;
  auVar399._24_4_ = auVar175._24_4_ + auVar186._24_4_ * fVar244;
  auVar399._28_4_ = auVar175._28_4_ + fVar309;
  auVar175 = vsubps_avx(auVar333,auVar210);
  auVar313._0_4_ = fVar246 * auVar175._0_4_;
  auVar313._4_4_ = fVar260 * auVar175._4_4_;
  auVar313._8_4_ = fVar243 * auVar175._8_4_;
  auVar313._12_4_ = fVar262 * auVar175._12_4_;
  auVar41._16_4_ = fVar264 * auVar175._16_4_;
  auVar41._0_16_ = auVar313;
  auVar41._20_4_ = fVar265 * auVar175._20_4_;
  auVar41._24_4_ = fVar266 * auVar175._24_4_;
  auVar41._28_4_ = auVar175._28_4_;
  auVar175 = vsubps_avx(auVar353,auVar210);
  auVar247._0_4_ = fVar246 * auVar175._0_4_;
  auVar247._4_4_ = fVar260 * auVar175._4_4_;
  auVar247._8_4_ = fVar243 * auVar175._8_4_;
  auVar247._12_4_ = fVar262 * auVar175._12_4_;
  auVar431._16_4_ = fVar264 * auVar175._16_4_;
  auVar431._0_16_ = auVar247;
  auVar431._20_4_ = fVar265 * auVar175._20_4_;
  auVar431._24_4_ = fVar266 * auVar175._24_4_;
  auVar431._28_4_ = auVar39._28_4_ + auVar371._28_4_;
  auVar175 = vsubps_avx(auVar368,auVar176);
  auVar208._0_4_ = fVar268 * auVar175._0_4_;
  auVar208._4_4_ = fVar281 * auVar175._4_4_;
  auVar208._8_4_ = fVar285 * auVar175._8_4_;
  auVar208._12_4_ = fVar288 * auVar175._12_4_;
  auVar39._16_4_ = fVar291 * auVar175._16_4_;
  auVar39._0_16_ = auVar208;
  auVar39._20_4_ = fVar292 * auVar175._20_4_;
  auVar39._24_4_ = fVar293 * auVar175._24_4_;
  auVar39._28_4_ = auVar175._28_4_;
  auVar175 = vsubps_avx(auVar380,auVar176);
  auVar272._0_4_ = fVar268 * auVar175._0_4_;
  auVar272._4_4_ = fVar281 * auVar175._4_4_;
  auVar272._8_4_ = fVar285 * auVar175._8_4_;
  auVar272._12_4_ = fVar288 * auVar175._12_4_;
  auVar371._16_4_ = fVar291 * auVar175._16_4_;
  auVar371._0_16_ = auVar272;
  auVar371._20_4_ = fVar292 * auVar175._20_4_;
  auVar371._24_4_ = fVar293 * auVar175._24_4_;
  auVar371._28_4_ = auVar40._28_4_ + auVar38._28_4_;
  auVar175 = vsubps_avx(auVar390,auVar235);
  auVar172._0_4_ = fVar294 * auVar175._0_4_;
  auVar172._4_4_ = fVar304 * auVar175._4_4_;
  auVar172._8_4_ = fVar305 * auVar175._8_4_;
  auVar172._12_4_ = fVar306 * auVar175._12_4_;
  auVar38._16_4_ = fVar307 * auVar175._16_4_;
  auVar38._0_16_ = auVar172;
  auVar38._20_4_ = fVar308 * auVar175._20_4_;
  auVar38._24_4_ = fVar310 * auVar175._24_4_;
  auVar38._28_4_ = auVar175._28_4_;
  auVar175 = vsubps_avx(auVar399,auVar235);
  auVar226._0_4_ = fVar294 * auVar175._0_4_;
  auVar226._4_4_ = fVar304 * auVar175._4_4_;
  auVar226._8_4_ = fVar305 * auVar175._8_4_;
  auVar226._12_4_ = fVar306 * auVar175._12_4_;
  auVar44._16_4_ = fVar307 * auVar175._16_4_;
  auVar44._0_16_ = auVar226;
  auVar44._20_4_ = fVar308 * auVar175._20_4_;
  auVar44._24_4_ = fVar310 * auVar175._24_4_;
  auVar44._28_4_ = auVar175._28_4_;
  auVar173 = vpminsd_avx(auVar41._16_16_,auVar431._16_16_);
  auVar230 = vpminsd_avx(auVar313,auVar247);
  auVar354._16_16_ = auVar173;
  auVar354._0_16_ = auVar230;
  auVar173 = vpminsd_avx(auVar39._16_16_,auVar371._16_16_);
  auVar230 = vpminsd_avx(auVar208,auVar272);
  auVar391._16_16_ = auVar173;
  auVar391._0_16_ = auVar230;
  auVar175 = vmaxps_avx(auVar354,auVar391);
  auVar173 = vpminsd_avx(auVar38._16_16_,auVar44._16_16_);
  auVar230 = vpminsd_avx(auVar172,auVar226);
  auVar408._16_16_ = auVar173;
  auVar408._0_16_ = auVar230;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar420._4_4_ = uVar11;
  auVar420._0_4_ = uVar11;
  auVar420._8_4_ = uVar11;
  auVar420._12_4_ = uVar11;
  auVar420._16_4_ = uVar11;
  auVar420._20_4_ = uVar11;
  auVar420._24_4_ = uVar11;
  auVar420._28_4_ = uVar11;
  auVar186 = vmaxps_avx(auVar408,auVar420);
  auVar175 = vmaxps_avx(auVar175,auVar186);
  local_80._4_4_ = auVar175._4_4_ * 0.99999964;
  local_80._0_4_ = auVar175._0_4_ * 0.99999964;
  local_80._8_4_ = auVar175._8_4_ * 0.99999964;
  local_80._12_4_ = auVar175._12_4_ * 0.99999964;
  local_80._16_4_ = auVar175._16_4_ * 0.99999964;
  local_80._20_4_ = auVar175._20_4_ * 0.99999964;
  local_80._24_4_ = auVar175._24_4_ * 0.99999964;
  local_80._28_4_ = auVar175._28_4_;
  auVar173 = vpmaxsd_avx(auVar41._16_16_,auVar431._16_16_);
  auVar230 = vpmaxsd_avx(auVar313,auVar247);
  auVar253._16_16_ = auVar173;
  auVar253._0_16_ = auVar230;
  auVar173 = vpmaxsd_avx(auVar39._16_16_,auVar371._16_16_);
  auVar230 = vpmaxsd_avx(auVar208,auVar272);
  auVar211._16_16_ = auVar173;
  auVar211._0_16_ = auVar230;
  auVar175 = vminps_avx(auVar253,auVar211);
  auVar173 = vpmaxsd_avx(auVar38._16_16_,auVar44._16_16_);
  auVar230 = vpmaxsd_avx(auVar172,auVar226);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar236._4_4_ = uVar11;
  auVar236._0_4_ = uVar11;
  auVar236._8_4_ = uVar11;
  auVar236._12_4_ = uVar11;
  auVar236._16_4_ = uVar11;
  auVar236._20_4_ = uVar11;
  auVar236._24_4_ = uVar11;
  auVar236._28_4_ = uVar11;
  auVar177._16_16_ = auVar173;
  auVar177._0_16_ = auVar230;
  auVar186 = vminps_avx(auVar177,auVar236);
  auVar175 = vminps_avx(auVar175,auVar186);
  auVar43._4_4_ = auVar175._4_4_ * 1.0000004;
  auVar43._0_4_ = auVar175._0_4_ * 1.0000004;
  auVar43._8_4_ = auVar175._8_4_ * 1.0000004;
  auVar43._12_4_ = auVar175._12_4_ * 1.0000004;
  auVar43._16_4_ = auVar175._16_4_ * 1.0000004;
  auVar43._20_4_ = auVar175._20_4_ * 1.0000004;
  auVar43._24_4_ = auVar175._24_4_ * 1.0000004;
  auVar43._28_4_ = auVar175._28_4_;
  auVar175 = vcmpps_avx(local_80,auVar43,2);
  auVar173 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar212._16_16_ = auVar173;
  auVar212._0_16_ = auVar173;
  auVar186 = vcvtdq2ps_avx(auVar212);
  auVar186 = vcmpps_avx(_DAT_02020f40,auVar186,1);
  auVar175 = vandps_avx(auVar175,auVar186);
  uVar158 = vmovmskps_avx(auVar175);
  if (uVar158 != 0) {
    uVar158 = uVar158 & 0xff;
    local_6b0 = pre->ray_space + k;
    local_6a0 = mm_lookupmask_ps._16_8_;
    uStack_698 = mm_lookupmask_ps._24_8_;
    uStack_690 = mm_lookupmask_ps._16_8_;
    uStack_688 = mm_lookupmask_ps._24_8_;
    uVar163 = 1 << ((byte)k & 0x1f);
    local_768 = (undefined1 (*) [32])&local_1c0;
    local_770 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar163 & 0xf) << 4));
    local_778 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar163 >> 4) * 0x10);
    local_6a8 = prim;
    do {
      lVar164 = 0;
      if (uVar158 != 0) {
        for (; (uVar158 >> lVar164 & 1) == 0; lVar164 = lVar164 + 1) {
        }
      }
      uVar32 = *(uint *)(local_6a8 + 2);
      uVar33 = *(uint *)(local_6a8 + lVar164 * 4 + 6);
      pGVar167 = (context->scene->geometries).items[uVar32].ptr;
      uVar161 = (ulong)*(uint *)(*(long *)&pGVar167->field_0x58 +
                                (ulong)uVar33 *
                                pGVar167[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar246 = (pGVar167->time_range).lower;
      fVar246 = pGVar167->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar246) /
                ((pGVar167->time_range).upper - fVar246));
      auVar173 = vroundss_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),9);
      auVar173 = vminss_avx(auVar173,ZEXT416((uint)(pGVar167->fnumTimeSegments + -1.0)));
      auVar173 = vmaxss_avx(ZEXT816(0) << 0x20,auVar173);
      fVar246 = fVar246 - auVar173._0_4_;
      _Var36 = pGVar167[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar166 = (long)(int)auVar173._0_4_ * 0x38;
      lVar164 = *(long *)(_Var36 + 0x10 + lVar166);
      lVar168 = *(long *)(_Var36 + 0x38 + lVar166);
      lVar165 = *(long *)(_Var36 + 0x48 + lVar166);
      auVar173 = vshufps_avx(ZEXT416((uint)fVar246),ZEXT416((uint)fVar246),0);
      pfVar1 = (float *)(lVar168 + uVar161 * lVar165);
      fVar261 = auVar173._0_4_;
      fVar260 = auVar173._4_4_;
      fVar263 = auVar173._8_4_;
      fVar243 = auVar173._12_4_;
      pfVar2 = (float *)(lVar168 + (uVar161 + 1) * lVar165);
      pfVar3 = (float *)(lVar168 + (uVar161 + 2) * lVar165);
      pfVar4 = (float *)(lVar168 + lVar165 * (uVar161 + 3));
      lVar168 = *(long *)(_Var36 + lVar166);
      auVar173 = vshufps_avx(ZEXT416((uint)(1.0 - fVar246)),ZEXT416((uint)(1.0 - fVar246)),0);
      pfVar5 = (float *)(lVar168 + lVar164 * uVar161);
      fVar246 = auVar173._0_4_;
      fVar244 = auVar173._4_4_;
      fVar262 = auVar173._8_4_;
      fVar309 = auVar173._12_4_;
      pfVar6 = (float *)(lVar168 + lVar164 * (uVar161 + 1));
      pfVar7 = (float *)(lVar168 + lVar164 * (uVar161 + 2));
      pfVar8 = (float *)(lVar168 + lVar164 * (uVar161 + 3));
      uVar34 = (uint)pGVar167[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar164 = (long)(int)uVar34 * 0x44;
      fVar269 = fVar261 * *pfVar1 + fVar246 * *pfVar5;
      fVar282 = fVar260 * pfVar1[1] + fVar244 * pfVar5[1];
      auVar273._0_8_ = CONCAT44(fVar282,fVar269);
      auVar273._8_4_ = fVar263 * pfVar1[2] + fVar262 * pfVar5[2];
      auVar273._12_4_ = fVar243 * pfVar1[3] + fVar309 * pfVar5[3];
      fVar345 = fVar246 * *pfVar6 + fVar261 * *pfVar2;
      fVar359 = fVar244 * pfVar6[1] + fVar260 * pfVar2[1];
      auVar347._0_8_ = CONCAT44(fVar359,fVar345);
      auVar347._8_4_ = fVar262 * pfVar6[2] + fVar263 * pfVar2[2];
      auVar347._12_4_ = fVar309 * pfVar6[3] + fVar243 * pfVar2[3];
      local_840 = fVar246 * *pfVar7 + fVar261 * *pfVar3;
      fStack_83c = fVar244 * pfVar7[1] + fVar260 * pfVar3[1];
      auVar406._0_8_ = CONCAT44(fStack_83c,local_840);
      auVar406._8_4_ = fVar262 * pfVar7[2] + fVar263 * pfVar3[2];
      auVar406._12_4_ = fVar309 * pfVar7[3] + fVar243 * pfVar3[3];
      fVar417 = fVar246 * *pfVar8 + fVar261 * *pfVar4;
      fVar423 = fVar244 * pfVar8[1] + fVar260 * pfVar4[1];
      auVar419._0_8_ = CONCAT44(fVar423,fVar417);
      auVar419._8_4_ = fVar262 * pfVar8[2] + fVar263 * pfVar4[2];
      auVar419._12_4_ = fVar309 * pfVar8[3] + fVar243 * pfVar4[3];
      auVar173 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar249 = vinsertps_avx(auVar173,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar275 = vsubps_avx(auVar273,auVar249);
      auVar173 = vshufps_avx(auVar275,auVar275,0);
      auVar230 = vshufps_avx(auVar275,auVar275,0x55);
      auVar275 = vshufps_avx(auVar275,auVar275,0xaa);
      fVar246 = (local_6b0->vx).field_0.m128[0];
      fVar261 = (local_6b0->vx).field_0.m128[1];
      fVar260 = (local_6b0->vx).field_0.m128[2];
      fVar263 = (local_6b0->vx).field_0.m128[3];
      fVar243 = (local_6b0->vy).field_0.m128[0];
      fVar244 = (local_6b0->vy).field_0.m128[1];
      fVar262 = (local_6b0->vy).field_0.m128[2];
      fVar309 = (local_6b0->vy).field_0.m128[3];
      fVar264 = (local_6b0->vz).field_0.m128[0];
      fVar265 = (local_6b0->vz).field_0.m128[1];
      fVar266 = (local_6b0->vz).field_0.m128[2];
      fVar268 = (local_6b0->vz).field_0.m128[3];
      auVar248._0_8_ =
           CONCAT44(auVar173._4_4_ * fVar261 + auVar230._4_4_ * fVar244 + fVar265 * auVar275._4_4_,
                    auVar173._0_4_ * fVar246 + auVar230._0_4_ * fVar243 + fVar264 * auVar275._0_4_);
      auVar248._8_4_ =
           auVar173._8_4_ * fVar260 + auVar230._8_4_ * fVar262 + fVar266 * auVar275._8_4_;
      auVar248._12_4_ =
           auVar173._12_4_ * fVar263 + auVar230._12_4_ * fVar309 + fVar268 * auVar275._12_4_;
      auVar173 = vblendps_avx(auVar248,auVar273,8);
      auVar42 = vsubps_avx(auVar347,auVar249);
      auVar230 = vshufps_avx(auVar42,auVar42,0);
      auVar275 = vshufps_avx(auVar42,auVar42,0x55);
      auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
      auVar329._0_4_ = auVar230._0_4_ * fVar246 + auVar275._0_4_ * fVar243 + fVar264 * auVar42._0_4_
      ;
      auVar329._4_4_ = auVar230._4_4_ * fVar261 + auVar275._4_4_ * fVar244 + fVar265 * auVar42._4_4_
      ;
      auVar329._8_4_ = auVar230._8_4_ * fVar260 + auVar275._8_4_ * fVar262 + fVar266 * auVar42._8_4_
      ;
      auVar329._12_4_ =
           auVar230._12_4_ * fVar263 + auVar275._12_4_ * fVar309 + fVar268 * auVar42._12_4_;
      auVar230 = vblendps_avx(auVar329,auVar347,8);
      auVar12 = vsubps_avx(auVar406,auVar249);
      auVar275 = vshufps_avx(auVar12,auVar12,0);
      auVar42 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar348._0_4_ = auVar275._0_4_ * fVar246 + auVar42._0_4_ * fVar243 + auVar12._0_4_ * fVar264;
      auVar348._4_4_ = auVar275._4_4_ * fVar261 + auVar42._4_4_ * fVar244 + auVar12._4_4_ * fVar265;
      auVar348._8_4_ = auVar275._8_4_ * fVar260 + auVar42._8_4_ * fVar262 + auVar12._8_4_ * fVar266;
      auVar348._12_4_ =
           auVar275._12_4_ * fVar263 + auVar42._12_4_ * fVar309 + auVar12._12_4_ * fVar268;
      auVar275 = vblendps_avx(auVar348,auVar406,8);
      auVar12 = vsubps_avx(auVar419,auVar249);
      auVar249 = vshufps_avx(auVar12,auVar12,0);
      auVar42 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar209._0_4_ = auVar249._0_4_ * fVar246 + auVar42._0_4_ * fVar243 + fVar264 * auVar12._0_4_;
      auVar209._4_4_ = auVar249._4_4_ * fVar261 + auVar42._4_4_ * fVar244 + fVar265 * auVar12._4_4_;
      auVar209._8_4_ = auVar249._8_4_ * fVar260 + auVar42._8_4_ * fVar262 + fVar266 * auVar12._8_4_;
      auVar209._12_4_ =
           auVar249._12_4_ * fVar263 + auVar42._12_4_ * fVar309 + fVar268 * auVar12._12_4_;
      auVar249 = vblendps_avx(auVar209,auVar419,8);
      auVar274._8_4_ = 0x7fffffff;
      auVar274._0_8_ = 0x7fffffff7fffffff;
      auVar274._12_4_ = 0x7fffffff;
      auVar173 = vandps_avx(auVar173,auVar274);
      auVar230 = vandps_avx(auVar230,auVar274);
      auVar42 = vmaxps_avx(auVar173,auVar230);
      auVar173 = vandps_avx(auVar275,auVar274);
      auVar230 = vandps_avx(auVar249,auVar274);
      auVar173 = vmaxps_avx(auVar173,auVar230);
      auVar173 = vmaxps_avx(auVar42,auVar173);
      auVar230 = vmovshdup_avx(auVar173);
      auVar230 = vmaxss_avx(auVar230,auVar173);
      auVar173 = vshufpd_avx(auVar173,auVar173,1);
      auVar173 = vmaxss_avx(auVar173,auVar230);
      fVar288 = *(float *)(bspline_basis0 + lVar164 + 0x908);
      fVar291 = *(float *)(bspline_basis0 + lVar164 + 0x90c);
      fVar292 = *(float *)(bspline_basis0 + lVar164 + 0x910);
      fVar293 = *(float *)(bspline_basis0 + lVar164 + 0x914);
      fVar294 = *(float *)(bspline_basis0 + lVar164 + 0x918);
      fVar304 = *(float *)(bspline_basis0 + lVar164 + 0x91c);
      fVar305 = *(float *)(bspline_basis0 + lVar164 + 0x920);
      auVar230 = vshufps_avx(auVar348,auVar348,0);
      register0x00001250 = auVar230;
      _local_4e0 = auVar230;
      auVar275 = vshufps_avx(auVar348,auVar348,0x55);
      register0x00001290 = auVar275;
      _local_5c0 = auVar275;
      fVar243 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar164 + 0xd8c);
      fVar244 = *(float *)(bspline_basis0 + lVar164 + 0xd90);
      fVar262 = *(float *)(bspline_basis0 + lVar164 + 0xd94);
      fVar309 = *(float *)(bspline_basis0 + lVar164 + 0xd98);
      fVar264 = *(float *)(bspline_basis0 + lVar164 + 0xd9c);
      fVar265 = *(float *)(bspline_basis0 + lVar164 + 0xda0);
      fVar266 = *(float *)(bspline_basis0 + lVar164 + 0xda4);
      auVar153 = *(undefined1 (*) [28])(bspline_basis0 + lVar164 + 0xd8c);
      auVar249 = vshufps_avx(auVar209,auVar209,0);
      register0x000014d0 = auVar249;
      _local_540 = auVar249;
      fVar386 = auVar249._0_4_;
      fVar393 = auVar249._4_4_;
      fVar394 = auVar249._8_4_;
      fVar395 = auVar249._12_4_;
      fVar337 = auVar230._0_4_;
      fVar339 = auVar230._4_4_;
      fVar341 = auVar230._8_4_;
      fVar342 = auVar230._12_4_;
      auVar230 = vshufps_avx(auVar209,auVar209,0x55);
      register0x000015d0 = auVar230;
      _local_560 = auVar230;
      fVar427 = auVar230._0_4_;
      fVar433 = auVar230._4_4_;
      fVar434 = auVar230._8_4_;
      fVar435 = auVar230._12_4_;
      fVar343 = auVar275._0_4_;
      fVar344 = auVar275._4_4_;
      fVar241 = auVar275._8_4_;
      fVar242 = auVar275._12_4_;
      auVar230 = vshufps_avx(auVar406,auVar406,0xff);
      register0x00001510 = auVar230;
      _local_2e0 = auVar230;
      auVar275 = vshufps_avx(auVar419,auVar419,0xff);
      register0x00001390 = auVar275;
      _local_300 = auVar275;
      fVar246 = auVar275._0_4_;
      fVar261 = auVar275._4_4_;
      fVar260 = auVar275._8_4_;
      fVar263 = auVar275._12_4_;
      fVar290 = auVar230._0_4_;
      fVar346 = auVar230._4_4_;
      fVar360 = auVar230._8_4_;
      auVar275 = vshufps_avx(auVar329,auVar329,0);
      register0x00001550 = auVar275;
      _local_580 = auVar275;
      fVar268 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar164 + 0x484);
      fVar281 = *(float *)(bspline_basis0 + lVar164 + 0x488);
      fVar285 = *(float *)(bspline_basis0 + lVar164 + 0x48c);
      fVar306 = *(float *)(bspline_basis0 + lVar164 + 0x490);
      fVar307 = *(float *)(bspline_basis0 + lVar164 + 0x494);
      fVar308 = *(float *)(bspline_basis0 + lVar164 + 0x498);
      fVar310 = *(float *)(bspline_basis0 + lVar164 + 0x49c);
      auVar154 = *(undefined1 (*) [28])(bspline_basis0 + lVar164 + 0x484);
      fVar363 = *(float *)(bspline_basis0 + lVar164 + 0x4a0);
      fVar404 = auVar275._0_4_;
      fVar411 = auVar275._4_4_;
      fVar413 = auVar275._8_4_;
      fVar415 = auVar275._12_4_;
      auVar275 = vshufps_avx(auVar329,auVar329,0x55);
      register0x00001210 = auVar275;
      _local_500 = auVar275;
      fVar169 = auVar275._0_4_;
      fVar194 = auVar275._4_4_;
      fVar197 = auVar275._8_4_;
      fVar328 = auVar275._12_4_;
      auVar275 = vpermilps_avx(auVar347,0xff);
      register0x00001590 = auVar275;
      _local_a0 = auVar275;
      fVar361 = auVar275._0_4_;
      fVar362 = auVar275._4_4_;
      fVar405 = auVar275._8_4_;
      fVar412 = auVar275._12_4_;
      auVar137._8_4_ = auVar248._8_4_;
      auVar137._0_8_ = auVar248._0_8_;
      auVar137._12_4_ = auVar248._12_4_;
      auVar275 = vshufps_avx(auVar137,auVar137,0);
      register0x00001310 = auVar275;
      _local_2c0 = auVar275;
      fVar364 = *(float *)(bspline_basis0 + lVar164);
      fVar267 = *(float *)(bspline_basis0 + lVar164 + 4);
      fVar245 = *(float *)(bspline_basis0 + lVar164 + 8);
      fVar311 = *(float *)(bspline_basis0 + lVar164 + 0xc);
      fVar376 = *(float *)(bspline_basis0 + lVar164 + 0x10);
      fVar198 = *(float *)(bspline_basis0 + lVar164 + 0x14);
      fVar200 = *(float *)(bspline_basis0 + lVar164 + 0x18);
      fVar270 = auVar275._0_4_;
      fVar283 = auVar275._4_4_;
      fVar286 = auVar275._8_4_;
      fVar289 = auVar275._12_4_;
      auVar355._0_4_ = fVar270 * fVar364 + fVar404 * fVar268 + fVar337 * fVar288 + fVar386 * fVar243
      ;
      auVar355._4_4_ = fVar283 * fVar267 + fVar411 * fVar281 + fVar339 * fVar291 + fVar393 * fVar244
      ;
      auVar355._8_4_ = fVar286 * fVar245 + fVar413 * fVar285 + fVar341 * fVar292 + fVar394 * fVar262
      ;
      auVar355._12_4_ =
           fVar289 * fVar311 + fVar415 * fVar306 + fVar342 * fVar293 + fVar395 * fVar309;
      auVar355._16_4_ =
           fVar270 * fVar376 + fVar404 * fVar307 + fVar337 * fVar294 + fVar386 * fVar264;
      auVar355._20_4_ =
           fVar283 * fVar198 + fVar411 * fVar308 + fVar339 * fVar304 + fVar393 * fVar265;
      auVar355._24_4_ =
           fVar286 * fVar200 + fVar413 * fVar310 + fVar341 * fVar305 + fVar394 * fVar266;
      auVar355._28_4_ = fVar363 + fVar342 + 0.0 + 0.0;
      auVar275 = vshufps_avx(auVar137,auVar137,0x55);
      register0x000013d0 = auVar275;
      _local_320 = auVar275;
      fVar327 = auVar275._0_4_;
      fVar336 = auVar275._4_4_;
      fVar338 = auVar275._8_4_;
      fVar340 = auVar275._12_4_;
      auVar369._0_4_ = fVar327 * fVar364 + fVar169 * fVar268 + fVar343 * fVar288 + fVar427 * fVar243
      ;
      auVar369._4_4_ = fVar336 * fVar267 + fVar194 * fVar281 + fVar344 * fVar291 + fVar433 * fVar244
      ;
      auVar369._8_4_ = fVar338 * fVar245 + fVar197 * fVar285 + fVar241 * fVar292 + fVar434 * fVar262
      ;
      auVar369._12_4_ =
           fVar340 * fVar311 + fVar328 * fVar306 + fVar242 * fVar293 + fVar435 * fVar309;
      auVar369._16_4_ =
           fVar327 * fVar376 + fVar169 * fVar307 + fVar343 * fVar294 + fVar427 * fVar264;
      auVar369._20_4_ =
           fVar336 * fVar198 + fVar194 * fVar308 + fVar344 * fVar304 + fVar433 * fVar265;
      auVar369._24_4_ =
           fVar338 * fVar200 + fVar197 * fVar310 + fVar241 * fVar305 + fVar434 * fVar266;
      auVar369._28_4_ = fVar328 + fVar242 + 0.0 + 0.0;
      auVar275 = vpermilps_avx(auVar273,0xff);
      register0x00001490 = auVar275;
      _local_c0 = auVar275;
      fVar271 = auVar275._0_4_;
      fVar284 = auVar275._4_4_;
      fVar287 = auVar275._8_4_;
      auVar178._0_4_ = fVar271 * fVar364 + fVar361 * fVar268 + fVar290 * fVar288 + fVar243 * fVar246
      ;
      auVar178._4_4_ = fVar284 * fVar267 + fVar362 * fVar281 + fVar346 * fVar291 + fVar244 * fVar261
      ;
      auVar178._8_4_ = fVar287 * fVar245 + fVar405 * fVar285 + fVar360 * fVar292 + fVar262 * fVar260
      ;
      auVar178._12_4_ =
           auVar275._12_4_ * fVar311 +
           fVar412 * fVar306 + auVar230._12_4_ * fVar293 + fVar309 * fVar263;
      auVar178._16_4_ =
           fVar271 * fVar376 + fVar361 * fVar307 + fVar290 * fVar294 + fVar264 * fVar246;
      auVar178._20_4_ =
           fVar284 * fVar198 + fVar362 * fVar308 + fVar346 * fVar304 + fVar265 * fVar261;
      auVar178._24_4_ =
           fVar287 * fVar200 + fVar405 * fVar310 + fVar360 * fVar305 + fVar266 * fVar260;
      auVar178._28_4_ = 0;
      fVar306 = *(float *)(bspline_basis1 + lVar164 + 0x908);
      fVar307 = *(float *)(bspline_basis1 + lVar164 + 0x90c);
      fVar308 = *(float *)(bspline_basis1 + lVar164 + 0x910);
      fVar310 = *(float *)(bspline_basis1 + lVar164 + 0x914);
      fVar170 = *(float *)(bspline_basis1 + lVar164 + 0x918);
      fVar195 = *(float *)(bspline_basis1 + lVar164 + 0x91c);
      fVar171 = *(float *)(bspline_basis1 + lVar164 + 0x920);
      fVar196 = *(float *)(bspline_basis1 + lVar164 + 0xd8c);
      fVar199 = *(float *)(bspline_basis1 + lVar164 + 0xd90);
      fVar201 = *(float *)(bspline_basis1 + lVar164 + 0xd94);
      fVar202 = *(float *)(bspline_basis1 + lVar164 + 0xd98);
      fStack_5f0 = *(float *)(bspline_basis1 + lVar164 + 0xd9c);
      fStack_5ec = *(float *)(bspline_basis1 + lVar164 + 0xda0);
      fStack_5e8 = *(float *)(bspline_basis1 + lVar164 + 0xda4);
      fStack_5e4 = *(float *)(bspline_basis1 + lVar164 + 0xda8);
      fVar203 = *(float *)(bspline_basis1 + lVar164 + 0x484);
      fVar204 = *(float *)(bspline_basis1 + lVar164 + 0x488);
      fVar205 = *(float *)(bspline_basis1 + lVar164 + 0x48c);
      fVar206 = *(float *)(bspline_basis1 + lVar164 + 0x490);
      fVar225 = *(float *)(bspline_basis1 + lVar164 + 0x494);
      fVar312 = *(float *)(bspline_basis1 + lVar164 + 0x498);
      fVar320 = *(float *)(bspline_basis1 + lVar164 + 0x49c);
      fVar244 = fVar415 + 0.0;
      fVar321 = *(float *)(bspline_basis1 + lVar164);
      fVar322 = *(float *)(bspline_basis1 + lVar164 + 4);
      fVar323 = *(float *)(bspline_basis1 + lVar164 + 8);
      fVar324 = *(float *)(bspline_basis1 + lVar164 + 0xc);
      fVar325 = *(float *)(bspline_basis1 + lVar164 + 0x10);
      fVar326 = *(float *)(bspline_basis1 + lVar164 + 0x14);
      fVar375 = *(float *)(bspline_basis1 + lVar164 + 0x18);
      auVar276._0_4_ = fVar270 * fVar321 + fVar404 * fVar203 + fVar306 * fVar337 + fVar386 * fVar196
      ;
      auVar276._4_4_ = fVar283 * fVar322 + fVar411 * fVar204 + fVar307 * fVar339 + fVar393 * fVar199
      ;
      auVar276._8_4_ = fVar286 * fVar323 + fVar413 * fVar205 + fVar308 * fVar341 + fVar394 * fVar201
      ;
      auVar276._12_4_ =
           fVar289 * fVar324 + fVar415 * fVar206 + fVar310 * fVar342 + fVar395 * fVar202;
      auVar276._16_4_ =
           fVar270 * fVar325 + fVar404 * fVar225 + fVar170 * fVar337 + fVar386 * fStack_5f0;
      auVar276._20_4_ =
           fVar283 * fVar326 + fVar411 * fVar312 + fVar195 * fVar339 + fVar393 * fStack_5ec;
      auVar276._24_4_ =
           fVar286 * fVar375 + fVar413 * fVar320 + fVar171 * fVar341 + fVar394 * fStack_5e8;
      auVar276._28_4_ = fVar412 + fVar244;
      auVar254._0_4_ = fVar327 * fVar321 + fVar169 * fVar203 + fVar306 * fVar343 + fVar427 * fVar196
      ;
      auVar254._4_4_ = fVar336 * fVar322 + fVar194 * fVar204 + fVar307 * fVar344 + fVar433 * fVar199
      ;
      auVar254._8_4_ = fVar338 * fVar323 + fVar197 * fVar205 + fVar308 * fVar241 + fVar434 * fVar201
      ;
      auVar254._12_4_ =
           fVar340 * fVar324 + fVar328 * fVar206 + fVar310 * fVar242 + fVar435 * fVar202;
      auVar254._16_4_ =
           fVar327 * fVar325 + fVar169 * fVar225 + fVar170 * fVar343 + fVar427 * fStack_5f0;
      auVar254._20_4_ =
           fVar336 * fVar326 + fVar194 * fVar312 + fVar195 * fVar344 + fVar433 * fStack_5ec;
      auVar254._24_4_ =
           fVar338 * fVar375 + fVar197 * fVar320 + fVar171 * fVar241 + fVar434 * fStack_5e8;
      auVar254._28_4_ = fVar244 + fVar415 + fVar363 + 0.0;
      local_8c0._0_4_ =
           fVar361 * fVar203 + fVar290 * fVar306 + fVar246 * fVar196 + fVar271 * fVar321;
      local_8c0._4_4_ =
           fVar362 * fVar204 + fVar346 * fVar307 + fVar261 * fVar199 + fVar284 * fVar322;
      fStack_8b8 = fVar405 * fVar205 + fVar360 * fVar308 + fVar260 * fVar201 + fVar287 * fVar323;
      fStack_8b4 = fVar412 * fVar206 + auVar230._12_4_ * fVar310 + fVar263 * fVar202 +
                   auVar275._12_4_ * fVar324;
      register0x00001490 =
           fVar361 * fVar225 + fVar290 * fVar170 + fVar246 * fStack_5f0 + fVar271 * fVar325;
      register0x00001494 =
           fVar362 * fVar312 + fVar346 * fVar195 + fVar261 * fStack_5ec + fVar284 * fVar326;
      register0x00001498 =
           fVar405 * fVar320 + fVar360 * fVar171 + fVar260 * fStack_5e8 + fVar287 * fVar375;
      register0x0000149c = fVar415 + fVar263 + fVar363 + fVar244;
      auVar38 = vsubps_avx(auVar276,auVar355);
      auVar335 = ZEXT3264(auVar38);
      auVar39 = vsubps_avx(auVar254,auVar369);
      fVar246 = auVar38._0_4_;
      fVar260 = auVar38._4_4_;
      auVar45._4_4_ = auVar369._4_4_ * fVar260;
      auVar45._0_4_ = auVar369._0_4_ * fVar246;
      fVar243 = auVar38._8_4_;
      auVar45._8_4_ = auVar369._8_4_ * fVar243;
      fVar262 = auVar38._12_4_;
      auVar45._12_4_ = auVar369._12_4_ * fVar262;
      fVar264 = auVar38._16_4_;
      auVar45._16_4_ = auVar369._16_4_ * fVar264;
      fVar266 = auVar38._20_4_;
      auVar45._20_4_ = auVar369._20_4_ * fVar266;
      fVar281 = auVar38._24_4_;
      auVar45._24_4_ = auVar369._24_4_ * fVar281;
      auVar45._28_4_ = fVar244;
      fVar261 = auVar39._0_4_;
      fVar263 = auVar39._4_4_;
      auVar46._4_4_ = auVar355._4_4_ * fVar263;
      auVar46._0_4_ = auVar355._0_4_ * fVar261;
      fVar244 = auVar39._8_4_;
      auVar46._8_4_ = auVar355._8_4_ * fVar244;
      fVar309 = auVar39._12_4_;
      auVar46._12_4_ = auVar355._12_4_ * fVar309;
      fVar265 = auVar39._16_4_;
      auVar46._16_4_ = auVar355._16_4_ * fVar265;
      fVar268 = auVar39._20_4_;
      auVar46._20_4_ = auVar355._20_4_ * fVar268;
      fVar285 = auVar39._24_4_;
      auVar46._24_4_ = auVar355._24_4_ * fVar285;
      auVar46._28_4_ = auVar254._28_4_;
      auVar186 = vsubps_avx(auVar45,auVar46);
      auVar175 = vmaxps_avx(auVar178,_local_8c0);
      auVar47._4_4_ = auVar175._4_4_ * auVar175._4_4_ * (fVar260 * fVar260 + fVar263 * fVar263);
      auVar47._0_4_ = auVar175._0_4_ * auVar175._0_4_ * (fVar246 * fVar246 + fVar261 * fVar261);
      auVar47._8_4_ = auVar175._8_4_ * auVar175._8_4_ * (fVar243 * fVar243 + fVar244 * fVar244);
      auVar47._12_4_ = auVar175._12_4_ * auVar175._12_4_ * (fVar262 * fVar262 + fVar309 * fVar309);
      auVar47._16_4_ = auVar175._16_4_ * auVar175._16_4_ * (fVar264 * fVar264 + fVar265 * fVar265);
      auVar47._20_4_ = auVar175._20_4_ * auVar175._20_4_ * (fVar266 * fVar266 + fVar268 * fVar268);
      auVar47._24_4_ = auVar175._24_4_ * auVar175._24_4_ * (fVar281 * fVar281 + fVar285 * fVar285);
      auVar47._28_4_ = auVar276._28_4_ + auVar254._28_4_;
      auVar48._4_4_ = auVar186._4_4_ * auVar186._4_4_;
      auVar48._0_4_ = auVar186._0_4_ * auVar186._0_4_;
      auVar48._8_4_ = auVar186._8_4_ * auVar186._8_4_;
      auVar48._12_4_ = auVar186._12_4_ * auVar186._12_4_;
      auVar48._16_4_ = auVar186._16_4_ * auVar186._16_4_;
      auVar48._20_4_ = auVar186._20_4_ * auVar186._20_4_;
      auVar48._24_4_ = auVar186._24_4_ * auVar186._24_4_;
      auVar48._28_4_ = auVar186._28_4_;
      auVar175 = vcmpps_avx(auVar48,auVar47,2);
      auVar240 = ZEXT3264(auVar175);
      auVar230 = ZEXT416((uint)(float)(int)uVar34);
      local_5a0._0_16_ = auVar230;
      auVar230 = vshufps_avx(auVar230,auVar230,0);
      auVar255._16_16_ = auVar230;
      auVar255._0_16_ = auVar230;
      auVar186 = vcmpps_avx(_DAT_02020f40,auVar255,1);
      auVar259 = ZEXT3264(auVar186);
      auVar138._8_4_ = auVar248._8_4_;
      auVar138._0_8_ = auVar248._0_8_;
      auVar138._12_4_ = auVar248._12_4_;
      auVar230 = vpermilps_avx(auVar138,0xaa);
      auVar356._16_16_ = auVar230;
      auVar356._0_16_ = auVar230;
      auVar275 = vpermilps_avx(auVar329,0xaa);
      register0x00001550 = auVar275;
      _local_520 = auVar275;
      auVar249 = vpermilps_avx(auVar348,0xaa);
      register0x00001590 = auVar249;
      _local_e0 = auVar249;
      auVar42 = vpermilps_avx(auVar209,0xaa);
      register0x00001310 = auVar42;
      _local_700 = auVar42;
      auVar40 = auVar186 & auVar175;
      uVar163 = *(uint *)(ray + k * 4 + 0x60);
      auVar173 = ZEXT416((uint)(auVar173._0_4_ * 4.7683716e-07));
      local_8a0._0_16_ = auVar173;
      uStack_908 = auVar273._8_8_;
      auVar371 = local_680;
      auVar357 = local_660;
      _local_710 = auVar406;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar40 >> 0x7f,0) != '\0') ||
            (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar40 >> 0xbf,0) != '\0') ||
          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar40[0x1f] < '\0') {
        local_340 = vandps_avx(auVar175,auVar186);
        fVar346 = auVar230._0_4_;
        fVar360 = auVar230._4_4_;
        fVar361 = auVar230._8_4_;
        fVar362 = auVar230._12_4_;
        fVar405 = auVar275._0_4_;
        fVar412 = auVar275._4_4_;
        fVar414 = auVar275._8_4_;
        fVar416 = auVar275._12_4_;
        fVar418 = auVar249._0_4_;
        fVar424 = auVar249._4_4_;
        fVar425 = auVar249._8_4_;
        fVar426 = auVar249._12_4_;
        fVar271 = auVar42._0_4_;
        fVar284 = auVar42._4_4_;
        fVar287 = auVar42._8_4_;
        fVar290 = auVar42._12_4_;
        fVar246 = auVar186._28_4_ +
                  *(float *)(bspline_basis1 + lVar164 + 0x924) +
                  *(float *)(bspline_basis1 + lVar164 + 0x4a0);
        local_600 = fVar346 * fVar321 + fVar405 * fVar203 + fVar418 * fVar306 + fVar271 * fVar196;
        fStack_5fc = fVar360 * fVar322 + fVar412 * fVar204 + fVar424 * fVar307 + fVar284 * fVar199;
        fStack_5f8 = fVar361 * fVar323 + fVar414 * fVar205 + fVar425 * fVar308 + fVar287 * fVar201;
        fStack_5f4 = fVar362 * fVar324 + fVar416 * fVar206 + fVar426 * fVar310 + fVar290 * fVar202;
        fStack_5f0 = fVar346 * fVar325 +
                     fVar405 * fVar225 + fVar418 * fVar170 + fVar271 * fStack_5f0;
        fStack_5ec = fVar360 * fVar326 +
                     fVar412 * fVar312 + fVar424 * fVar195 + fVar284 * fStack_5ec;
        fStack_5e8 = fVar361 * fVar375 +
                     fVar414 * fVar320 + fVar425 * fVar171 + fVar287 * fStack_5e8;
        fStack_5e4 = local_340._28_4_ + fVar246;
        local_880._0_4_ = auVar154._0_4_;
        local_880._4_4_ = auVar154._4_4_;
        uStack_878._0_4_ = auVar154._8_4_;
        uStack_878._4_4_ = auVar154._12_4_;
        uStack_870._0_4_ = auVar154._16_4_;
        uStack_870._4_4_ = auVar154._20_4_;
        uStack_868._0_4_ = auVar154._24_4_;
        local_860._0_4_ = auVar153._0_4_;
        local_860._4_4_ = auVar153._4_4_;
        uStack_858._0_4_ = auVar153._8_4_;
        uStack_858._4_4_ = auVar153._12_4_;
        fStack_850 = auVar153._16_4_;
        fStack_84c = auVar153._20_4_;
        fStack_848 = auVar153._24_4_;
        fVar170 = fVar346 * fVar364 +
                  fVar405 * (float)local_880._0_4_ +
                  fVar418 * fVar288 + fVar271 * (float)local_860._0_4_;
        fVar195 = fVar360 * fVar267 +
                  fVar412 * (float)local_880._4_4_ +
                  fVar424 * fVar291 + fVar284 * (float)local_860._4_4_;
        fVar171 = fVar361 * fVar245 +
                  fVar414 * (float)uStack_878 + fVar425 * fVar292 + fVar287 * (float)uStack_858;
        fVar196 = fVar362 * fVar311 +
                  fVar416 * uStack_878._4_4_ + fVar426 * fVar293 + fVar290 * uStack_858._4_4_;
        fStack_830 = fVar346 * fVar376 +
                     fVar405 * (float)uStack_870 + fVar418 * fVar294 + fVar271 * fStack_850;
        fStack_82c = fVar360 * fVar198 +
                     fVar412 * uStack_870._4_4_ + fVar424 * fVar304 + fVar284 * fStack_84c;
        fStack_828 = fVar361 * fVar200 +
                     fVar414 * (float)uStack_868 + fVar425 * fVar305 + fVar287 * fStack_848;
        fStack_824 = fStack_5e4 + fVar246 + local_340._28_4_ + auVar186._28_4_;
        fVar246 = *(float *)(bspline_basis0 + lVar164 + 0x1210);
        fVar261 = *(float *)(bspline_basis0 + lVar164 + 0x1214);
        fVar260 = *(float *)(bspline_basis0 + lVar164 + 0x1218);
        fVar263 = *(float *)(bspline_basis0 + lVar164 + 0x121c);
        fVar243 = *(float *)(bspline_basis0 + lVar164 + 0x1220);
        fVar244 = *(float *)(bspline_basis0 + lVar164 + 0x1224);
        fVar262 = *(float *)(bspline_basis0 + lVar164 + 0x1228);
        fVar309 = *(float *)(bspline_basis0 + lVar164 + 0x1694);
        fVar264 = *(float *)(bspline_basis0 + lVar164 + 0x1698);
        fVar265 = *(float *)(bspline_basis0 + lVar164 + 0x169c);
        fVar266 = *(float *)(bspline_basis0 + lVar164 + 0x16a0);
        fVar268 = *(float *)(bspline_basis0 + lVar164 + 0x16a4);
        fVar281 = *(float *)(bspline_basis0 + lVar164 + 0x16a8);
        fVar285 = *(float *)(bspline_basis0 + lVar164 + 0x16ac);
        fVar288 = *(float *)(bspline_basis0 + lVar164 + 0x1b18);
        fVar291 = *(float *)(bspline_basis0 + lVar164 + 0x1b1c);
        fVar292 = *(float *)(bspline_basis0 + lVar164 + 0x1b20);
        fVar293 = *(float *)(bspline_basis0 + lVar164 + 0x1b24);
        fVar294 = *(float *)(bspline_basis0 + lVar164 + 0x1b28);
        fVar304 = *(float *)(bspline_basis0 + lVar164 + 0x1b2c);
        fVar305 = *(float *)(bspline_basis0 + lVar164 + 0x1b30);
        fVar306 = *(float *)(bspline_basis0 + lVar164 + 0x1f9c);
        fVar307 = *(float *)(bspline_basis0 + lVar164 + 0x1fa0);
        fVar308 = *(float *)(bspline_basis0 + lVar164 + 0x1fa4);
        fVar310 = *(float *)(bspline_basis0 + lVar164 + 0x1fa8);
        fVar363 = *(float *)(bspline_basis0 + lVar164 + 0x1fac);
        fVar364 = *(float *)(bspline_basis0 + lVar164 + 0x1fb0);
        fVar267 = *(float *)(bspline_basis0 + lVar164 + 0x1fb4);
        fVar311 = auVar369._28_4_ + *(float *)(bspline_basis1 + lVar164 + 0x4a0);
        fVar245 = *(float *)(bspline_basis0 + lVar164 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar164 + 0x1fb8);
        fVar376 = *(float *)(bspline_basis0 + lVar164 + 0x16b0) + fVar245;
        local_5e0 = fVar270 * fVar246 + fVar404 * fVar309 + fVar337 * fVar288 + fVar386 * fVar306;
        fStack_5dc = fVar283 * fVar261 + fVar411 * fVar264 + fVar339 * fVar291 + fVar393 * fVar307;
        fStack_5d8 = fVar286 * fVar260 + fVar413 * fVar265 + fVar341 * fVar292 + fVar394 * fVar308;
        fStack_5d4 = fVar289 * fVar263 + fVar415 * fVar266 + fVar342 * fVar293 + fVar395 * fVar310;
        fStack_5d0 = fVar270 * fVar243 + fVar404 * fVar268 + fVar337 * fVar294 + fVar386 * fVar363;
        fStack_5cc = fVar283 * fVar244 + fVar411 * fVar281 + fVar339 * fVar304 + fVar393 * fVar364;
        fStack_5c8 = fVar286 * fVar262 + fVar413 * fVar285 + fVar341 * fVar305 + fVar394 * fVar267;
        fStack_5c4 = *(float *)(bspline_basis0 + lVar164 + 0x16b0) +
                     *(float *)(bspline_basis0 + lVar164 + 0x1fb8) + fVar311;
        auVar213._0_4_ =
             fVar327 * fVar246 + fVar169 * fVar309 + fVar343 * fVar288 + fVar427 * fVar306;
        auVar213._4_4_ =
             fVar336 * fVar261 + fVar194 * fVar264 + fVar344 * fVar291 + fVar433 * fVar307;
        auVar213._8_4_ =
             fVar338 * fVar260 + fVar197 * fVar265 + fVar241 * fVar292 + fVar434 * fVar308;
        auVar213._12_4_ =
             fVar340 * fVar263 + fVar328 * fVar266 + fVar242 * fVar293 + fVar435 * fVar310;
        auVar213._16_4_ =
             fVar327 * fVar243 + fVar169 * fVar268 + fVar343 * fVar294 + fVar427 * fVar363;
        auVar213._20_4_ =
             fVar336 * fVar244 + fVar194 * fVar281 + fVar344 * fVar304 + fVar433 * fVar364;
        auVar213._24_4_ =
             fVar338 * fVar262 + fVar197 * fVar285 + fVar241 * fVar305 + fVar434 * fVar267;
        auVar213._28_4_ =
             fVar245 + fVar311 + auVar369._28_4_ + *(float *)(bspline_basis1 + lVar164 + 0x1c);
        auVar297._0_4_ =
             fVar405 * fVar309 + fVar418 * fVar288 + fVar271 * fVar306 + fVar346 * fVar246;
        auVar297._4_4_ =
             fVar412 * fVar264 + fVar424 * fVar291 + fVar284 * fVar307 + fVar360 * fVar261;
        auVar297._8_4_ =
             fVar414 * fVar265 + fVar425 * fVar292 + fVar287 * fVar308 + fVar361 * fVar260;
        auVar297._12_4_ =
             fVar416 * fVar266 + fVar426 * fVar293 + fVar290 * fVar310 + fVar362 * fVar263;
        auVar297._16_4_ =
             fVar405 * fVar268 + fVar418 * fVar294 + fVar271 * fVar363 + fVar346 * fVar243;
        auVar297._20_4_ =
             fVar412 * fVar281 + fVar424 * fVar304 + fVar284 * fVar364 + fVar360 * fVar244;
        auVar297._24_4_ =
             fVar414 * fVar285 + fVar425 * fVar305 + fVar287 * fVar267 + fVar361 * fVar262;
        auVar297._28_4_ = fVar376 + *(float *)(bspline_basis0 + lVar164 + 0x122c);
        fVar246 = *(float *)(bspline_basis1 + lVar164 + 0x1b18);
        fVar261 = *(float *)(bspline_basis1 + lVar164 + 0x1b1c);
        fVar260 = *(float *)(bspline_basis1 + lVar164 + 0x1b20);
        fVar263 = *(float *)(bspline_basis1 + lVar164 + 0x1b24);
        fVar243 = *(float *)(bspline_basis1 + lVar164 + 0x1b28);
        fVar244 = *(float *)(bspline_basis1 + lVar164 + 0x1b2c);
        fVar262 = *(float *)(bspline_basis1 + lVar164 + 0x1b30);
        fVar309 = *(float *)(bspline_basis1 + lVar164 + 0x1f9c);
        fVar264 = *(float *)(bspline_basis1 + lVar164 + 0x1fa0);
        fVar265 = *(float *)(bspline_basis1 + lVar164 + 0x1fa4);
        fVar266 = *(float *)(bspline_basis1 + lVar164 + 0x1fa8);
        fVar268 = *(float *)(bspline_basis1 + lVar164 + 0x1fac);
        fVar281 = *(float *)(bspline_basis1 + lVar164 + 0x1fb0);
        fVar285 = *(float *)(bspline_basis1 + lVar164 + 0x1fb4);
        fVar288 = *(float *)(bspline_basis1 + lVar164 + 0x1694);
        fVar291 = *(float *)(bspline_basis1 + lVar164 + 0x1698);
        fVar292 = *(float *)(bspline_basis1 + lVar164 + 0x169c);
        fVar293 = *(float *)(bspline_basis1 + lVar164 + 0x16a0);
        fVar294 = *(float *)(bspline_basis1 + lVar164 + 0x16a4);
        fVar304 = *(float *)(bspline_basis1 + lVar164 + 0x16a8);
        fVar305 = *(float *)(bspline_basis1 + lVar164 + 0x16ac);
        fVar306 = *(float *)(bspline_basis1 + lVar164 + 0x1210);
        fVar307 = *(float *)(bspline_basis1 + lVar164 + 0x1214);
        fVar308 = *(float *)(bspline_basis1 + lVar164 + 0x1218);
        fVar310 = *(float *)(bspline_basis1 + lVar164 + 0x121c);
        fVar363 = *(float *)(bspline_basis1 + lVar164 + 0x1220);
        fVar364 = *(float *)(bspline_basis1 + lVar164 + 0x1224);
        fVar267 = *(float *)(bspline_basis1 + lVar164 + 0x1228);
        auVar315._0_4_ =
             fVar270 * fVar306 + fVar404 * fVar288 + fVar337 * fVar246 + fVar386 * fVar309;
        auVar315._4_4_ =
             fVar283 * fVar307 + fVar411 * fVar291 + fVar339 * fVar261 + fVar393 * fVar264;
        auVar315._8_4_ =
             fVar286 * fVar308 + fVar413 * fVar292 + fVar341 * fVar260 + fVar394 * fVar265;
        auVar315._12_4_ =
             fVar289 * fVar310 + fVar415 * fVar293 + fVar342 * fVar263 + fVar395 * fVar266;
        auVar315._16_4_ =
             fVar270 * fVar363 + fVar404 * fVar294 + fVar337 * fVar243 + fVar386 * fVar268;
        auVar315._20_4_ =
             fVar283 * fVar364 + fVar411 * fVar304 + fVar339 * fVar244 + fVar393 * fVar281;
        auVar315._24_4_ =
             fVar286 * fVar267 + fVar413 * fVar305 + fVar341 * fVar262 + fVar394 * fVar285;
        auVar315._28_4_ = fVar242 + fVar242 + fVar376 + fVar395;
        auVar370._0_4_ =
             fVar327 * fVar306 + fVar169 * fVar288 + fVar343 * fVar246 + fVar427 * fVar309;
        auVar370._4_4_ =
             fVar336 * fVar307 + fVar194 * fVar291 + fVar344 * fVar261 + fVar433 * fVar264;
        auVar370._8_4_ =
             fVar338 * fVar308 + fVar197 * fVar292 + fVar241 * fVar260 + fVar434 * fVar265;
        auVar370._12_4_ =
             fVar340 * fVar310 + fVar328 * fVar293 + fVar242 * fVar263 + fVar435 * fVar266;
        auVar370._16_4_ =
             fVar327 * fVar363 + fVar169 * fVar294 + fVar343 * fVar243 + fVar427 * fVar268;
        auVar370._20_4_ =
             fVar336 * fVar364 + fVar194 * fVar304 + fVar344 * fVar244 + fVar433 * fVar281;
        auVar370._24_4_ =
             fVar338 * fVar267 + fVar197 * fVar305 + fVar241 * fVar262 + fVar434 * fVar285;
        auVar370._28_4_ = fVar242 + fVar242 + fVar242 + fVar376;
        auVar237._0_4_ =
             fVar346 * fVar306 + fVar405 * fVar288 + fVar418 * fVar246 + fVar309 * fVar271;
        auVar237._4_4_ =
             fVar360 * fVar307 + fVar412 * fVar291 + fVar424 * fVar261 + fVar264 * fVar284;
        auVar237._8_4_ =
             fVar361 * fVar308 + fVar414 * fVar292 + fVar425 * fVar260 + fVar265 * fVar287;
        auVar237._12_4_ =
             fVar362 * fVar310 + fVar416 * fVar293 + fVar426 * fVar263 + fVar266 * fVar290;
        auVar237._16_4_ =
             fVar346 * fVar363 + fVar405 * fVar294 + fVar418 * fVar243 + fVar268 * fVar271;
        auVar237._20_4_ =
             fVar360 * fVar364 + fVar412 * fVar304 + fVar424 * fVar244 + fVar281 * fVar284;
        auVar237._24_4_ =
             fVar361 * fVar267 + fVar414 * fVar305 + fVar425 * fVar262 + fVar285 * fVar287;
        auVar237._28_4_ =
             *(float *)(bspline_basis1 + lVar164 + 0x122c) +
             *(float *)(bspline_basis1 + lVar164 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar164 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar164 + 0x1fb8);
        auVar277._8_4_ = 0x7fffffff;
        auVar277._0_8_ = 0x7fffffff7fffffff;
        auVar277._12_4_ = 0x7fffffff;
        auVar277._16_4_ = 0x7fffffff;
        auVar277._20_4_ = 0x7fffffff;
        auVar277._24_4_ = 0x7fffffff;
        auVar277._28_4_ = 0x7fffffff;
        auVar152._4_4_ = fStack_5dc;
        auVar152._0_4_ = local_5e0;
        auVar152._8_4_ = fStack_5d8;
        auVar152._12_4_ = fStack_5d4;
        auVar152._16_4_ = fStack_5d0;
        auVar152._20_4_ = fStack_5cc;
        auVar152._24_4_ = fStack_5c8;
        auVar152._28_4_ = fStack_5c4;
        auVar175 = vandps_avx(auVar152,auVar277);
        auVar186 = vandps_avx(auVar213,auVar277);
        auVar186 = vmaxps_avx(auVar175,auVar186);
        auVar175 = vandps_avx(auVar297,auVar277);
        auVar175 = vmaxps_avx(auVar186,auVar175);
        auVar173 = vpermilps_avx(auVar173,0);
        auVar298._16_16_ = auVar173;
        auVar298._0_16_ = auVar173;
        auVar175 = vcmpps_avx(auVar175,auVar298,1);
        auVar40 = vblendvps_avx(auVar152,auVar38,auVar175);
        auVar371 = vblendvps_avx(auVar213,auVar39,auVar175);
        auVar175 = vandps_avx(auVar315,auVar277);
        auVar186 = vandps_avx(auVar370,auVar277);
        auVar357 = vmaxps_avx(auVar175,auVar186);
        auVar175 = vandps_avx(auVar237,auVar277);
        auVar175 = vmaxps_avx(auVar357,auVar175);
        auVar357 = vcmpps_avx(auVar175,auVar298,1);
        auVar175 = vblendvps_avx(auVar315,auVar38,auVar357);
        auVar38 = vblendvps_avx(auVar370,auVar39,auVar357);
        fVar311 = auVar40._0_4_;
        fVar376 = auVar40._4_4_;
        fVar198 = auVar40._8_4_;
        fVar200 = auVar40._12_4_;
        fVar199 = auVar40._16_4_;
        fVar201 = auVar40._20_4_;
        fVar202 = auVar40._24_4_;
        fVar321 = -auVar40._28_4_;
        fVar203 = auVar175._0_4_;
        fVar204 = auVar175._4_4_;
        fVar205 = auVar175._8_4_;
        fVar206 = auVar175._12_4_;
        fVar225 = auVar175._16_4_;
        fVar312 = auVar175._20_4_;
        fVar320 = auVar175._24_4_;
        fVar246 = auVar371._0_4_;
        fVar243 = auVar371._4_4_;
        fVar264 = auVar371._8_4_;
        fVar281 = auVar371._12_4_;
        fVar292 = auVar371._16_4_;
        fVar305 = auVar371._20_4_;
        fVar310 = auVar371._24_4_;
        auVar179._0_4_ = fVar246 * fVar246 + fVar311 * fVar311;
        auVar179._4_4_ = fVar243 * fVar243 + fVar376 * fVar376;
        auVar179._8_4_ = fVar264 * fVar264 + fVar198 * fVar198;
        auVar179._12_4_ = fVar281 * fVar281 + fVar200 * fVar200;
        auVar179._16_4_ = fVar292 * fVar292 + fVar199 * fVar199;
        auVar179._20_4_ = fVar305 * fVar305 + fVar201 * fVar201;
        auVar179._24_4_ = fVar310 * fVar310 + fVar202 * fVar202;
        auVar179._28_4_ = auVar370._28_4_ + auVar40._28_4_;
        auVar39 = vrsqrtps_avx(auVar179);
        fVar261 = auVar39._0_4_;
        fVar260 = auVar39._4_4_;
        auVar49._4_4_ = fVar260 * 1.5;
        auVar49._0_4_ = fVar261 * 1.5;
        fVar263 = auVar39._8_4_;
        auVar49._8_4_ = fVar263 * 1.5;
        fVar244 = auVar39._12_4_;
        auVar49._12_4_ = fVar244 * 1.5;
        fVar262 = auVar39._16_4_;
        auVar49._16_4_ = fVar262 * 1.5;
        fVar309 = auVar39._20_4_;
        auVar49._20_4_ = fVar309 * 1.5;
        fVar265 = auVar39._24_4_;
        fVar245 = auVar186._28_4_;
        auVar49._24_4_ = fVar265 * 1.5;
        auVar49._28_4_ = fVar245;
        auVar50._4_4_ = fVar260 * fVar260 * fVar260 * auVar179._4_4_ * 0.5;
        auVar50._0_4_ = fVar261 * fVar261 * fVar261 * auVar179._0_4_ * 0.5;
        auVar50._8_4_ = fVar263 * fVar263 * fVar263 * auVar179._8_4_ * 0.5;
        auVar50._12_4_ = fVar244 * fVar244 * fVar244 * auVar179._12_4_ * 0.5;
        auVar50._16_4_ = fVar262 * fVar262 * fVar262 * auVar179._16_4_ * 0.5;
        auVar50._20_4_ = fVar309 * fVar309 * fVar309 * auVar179._20_4_ * 0.5;
        auVar50._24_4_ = fVar265 * fVar265 * fVar265 * auVar179._24_4_ * 0.5;
        auVar50._28_4_ = auVar179._28_4_;
        auVar186 = vsubps_avx(auVar49,auVar50);
        fVar261 = auVar186._0_4_;
        fVar244 = auVar186._4_4_;
        fVar265 = auVar186._8_4_;
        fVar285 = auVar186._12_4_;
        fVar293 = auVar186._16_4_;
        fVar306 = auVar186._20_4_;
        fVar363 = auVar186._24_4_;
        fVar260 = auVar38._0_4_;
        fVar262 = auVar38._4_4_;
        fVar266 = auVar38._8_4_;
        fVar288 = auVar38._12_4_;
        fVar294 = auVar38._16_4_;
        fVar307 = auVar38._20_4_;
        fVar364 = auVar38._24_4_;
        auVar180._0_4_ = fVar260 * fVar260 + fVar203 * fVar203;
        auVar180._4_4_ = fVar262 * fVar262 + fVar204 * fVar204;
        auVar180._8_4_ = fVar266 * fVar266 + fVar205 * fVar205;
        auVar180._12_4_ = fVar288 * fVar288 + fVar206 * fVar206;
        auVar180._16_4_ = fVar294 * fVar294 + fVar225 * fVar225;
        auVar180._20_4_ = fVar307 * fVar307 + fVar312 * fVar312;
        auVar180._24_4_ = fVar364 * fVar364 + fVar320 * fVar320;
        auVar180._28_4_ = auVar175._28_4_ + auVar186._28_4_;
        auVar175 = vrsqrtps_avx(auVar180);
        fVar263 = auVar175._0_4_;
        fVar309 = auVar175._4_4_;
        auVar51._4_4_ = fVar309 * 1.5;
        auVar51._0_4_ = fVar263 * 1.5;
        fVar268 = auVar175._8_4_;
        auVar51._8_4_ = fVar268 * 1.5;
        fVar291 = auVar175._12_4_;
        auVar51._12_4_ = fVar291 * 1.5;
        fVar304 = auVar175._16_4_;
        auVar51._16_4_ = fVar304 * 1.5;
        fVar308 = auVar175._20_4_;
        auVar51._20_4_ = fVar308 * 1.5;
        fVar267 = auVar175._24_4_;
        auVar51._24_4_ = fVar267 * 1.5;
        auVar51._28_4_ = fVar245;
        auVar52._4_4_ = fVar309 * fVar309 * fVar309 * auVar180._4_4_ * 0.5;
        auVar52._0_4_ = fVar263 * fVar263 * fVar263 * auVar180._0_4_ * 0.5;
        auVar52._8_4_ = fVar268 * fVar268 * fVar268 * auVar180._8_4_ * 0.5;
        auVar52._12_4_ = fVar291 * fVar291 * fVar291 * auVar180._12_4_ * 0.5;
        auVar52._16_4_ = fVar304 * fVar304 * fVar304 * auVar180._16_4_ * 0.5;
        auVar52._20_4_ = fVar308 * fVar308 * fVar308 * auVar180._20_4_ * 0.5;
        auVar52._24_4_ = fVar267 * fVar267 * fVar267 * auVar180._24_4_ * 0.5;
        auVar52._28_4_ = auVar180._28_4_;
        auVar175 = vsubps_avx(auVar51,auVar52);
        fVar263 = auVar175._0_4_;
        fVar309 = auVar175._4_4_;
        fVar268 = auVar175._8_4_;
        fVar291 = auVar175._12_4_;
        fVar304 = auVar175._16_4_;
        fVar308 = auVar175._20_4_;
        fVar267 = auVar175._24_4_;
        fVar246 = auVar178._0_4_ * fVar246 * fVar261;
        fVar243 = auVar178._4_4_ * fVar243 * fVar244;
        auVar53._4_4_ = fVar243;
        auVar53._0_4_ = fVar246;
        fVar264 = auVar178._8_4_ * fVar264 * fVar265;
        auVar53._8_4_ = fVar264;
        fVar281 = auVar178._12_4_ * fVar281 * fVar285;
        auVar53._12_4_ = fVar281;
        fVar292 = auVar178._16_4_ * fVar292 * fVar293;
        auVar53._16_4_ = fVar292;
        fVar305 = auVar178._20_4_ * fVar305 * fVar306;
        auVar53._20_4_ = fVar305;
        fVar310 = auVar178._24_4_ * fVar310 * fVar363;
        auVar53._24_4_ = fVar310;
        auVar53._28_4_ = fVar245;
        local_860._4_4_ = fVar243 + auVar355._4_4_;
        local_860._0_4_ = fVar246 + auVar355._0_4_;
        uStack_858._0_4_ = fVar264 + auVar355._8_4_;
        uStack_858._4_4_ = fVar281 + auVar355._12_4_;
        fStack_850 = fVar292 + auVar355._16_4_;
        fStack_84c = fVar305 + auVar355._20_4_;
        fStack_848 = fVar310 + auVar355._24_4_;
        fStack_844 = fVar245 + auVar355._28_4_;
        fVar246 = auVar178._0_4_ * fVar261 * -fVar311;
        fVar243 = auVar178._4_4_ * fVar244 * -fVar376;
        auVar54._4_4_ = fVar243;
        auVar54._0_4_ = fVar246;
        fVar264 = auVar178._8_4_ * fVar265 * -fVar198;
        auVar54._8_4_ = fVar264;
        fVar281 = auVar178._12_4_ * fVar285 * -fVar200;
        auVar54._12_4_ = fVar281;
        fVar292 = auVar178._16_4_ * fVar293 * -fVar199;
        auVar54._16_4_ = fVar292;
        fVar305 = auVar178._20_4_ * fVar306 * -fVar201;
        auVar54._20_4_ = fVar305;
        fVar310 = auVar178._24_4_ * fVar363 * -fVar202;
        auVar54._24_4_ = fVar310;
        auVar54._28_4_ = fVar321;
        local_880._4_4_ = auVar369._4_4_ + fVar243;
        local_880._0_4_ = auVar369._0_4_ + fVar246;
        uStack_878._0_4_ = auVar369._8_4_ + fVar264;
        uStack_878._4_4_ = auVar369._12_4_ + fVar281;
        uStack_870._0_4_ = auVar369._16_4_ + fVar292;
        uStack_870._4_4_ = auVar369._20_4_ + fVar305;
        uStack_868._0_4_ = auVar369._24_4_ + fVar310;
        uStack_868._4_4_ = auVar369._28_4_ + fVar321;
        fVar246 = fVar261 * 0.0 * auVar178._0_4_;
        fVar261 = fVar244 * 0.0 * auVar178._4_4_;
        auVar55._4_4_ = fVar261;
        auVar55._0_4_ = fVar246;
        fVar243 = fVar265 * 0.0 * auVar178._8_4_;
        auVar55._8_4_ = fVar243;
        fVar244 = fVar285 * 0.0 * auVar178._12_4_;
        auVar55._12_4_ = fVar244;
        fVar264 = fVar293 * 0.0 * auVar178._16_4_;
        auVar55._16_4_ = fVar264;
        fVar265 = fVar306 * 0.0 * auVar178._20_4_;
        auVar55._20_4_ = fVar265;
        fVar281 = fVar363 * 0.0 * auVar178._24_4_;
        auVar55._24_4_ = fVar281;
        auVar55._28_4_ = fVar416;
        auVar140._4_4_ = fVar195;
        auVar140._0_4_ = fVar170;
        auVar140._8_4_ = fVar171;
        auVar140._12_4_ = fVar196;
        auVar140._16_4_ = fStack_830;
        auVar140._20_4_ = fStack_82c;
        auVar140._24_4_ = fStack_828;
        auVar140._28_4_ = fStack_824;
        auVar316._0_4_ = fVar170 + fVar246;
        auVar316._4_4_ = fVar195 + fVar261;
        auVar316._8_4_ = fVar171 + fVar243;
        auVar316._12_4_ = fVar196 + fVar244;
        auVar316._16_4_ = fStack_830 + fVar264;
        auVar316._20_4_ = fStack_82c + fVar265;
        auVar316._24_4_ = fStack_828 + fVar281;
        auVar316._28_4_ = fStack_824 + fVar416;
        fVar246 = (float)local_8c0._0_4_ * fVar260 * fVar263;
        fVar261 = (float)local_8c0._4_4_ * fVar262 * fVar309;
        auVar56._4_4_ = fVar261;
        auVar56._0_4_ = fVar246;
        fVar260 = fStack_8b8 * fVar266 * fVar268;
        auVar56._8_4_ = fVar260;
        fVar243 = fStack_8b4 * fVar288 * fVar291;
        auVar56._12_4_ = fVar243;
        fVar244 = register0x00001490 * fVar294 * fVar304;
        auVar56._16_4_ = fVar244;
        fVar262 = register0x00001494 * fVar307 * fVar308;
        auVar56._20_4_ = fVar262;
        fVar264 = register0x00001498 * fVar364 * fVar267;
        auVar56._24_4_ = fVar264;
        auVar56._28_4_ = auVar38._28_4_;
        auVar357 = vsubps_avx(auVar355,auVar53);
        auVar381._0_4_ = auVar276._0_4_ + fVar246;
        auVar381._4_4_ = auVar276._4_4_ + fVar261;
        auVar381._8_4_ = auVar276._8_4_ + fVar260;
        auVar381._12_4_ = auVar276._12_4_ + fVar243;
        auVar381._16_4_ = auVar276._16_4_ + fVar244;
        auVar381._20_4_ = auVar276._20_4_ + fVar262;
        auVar381._24_4_ = auVar276._24_4_ + fVar264;
        auVar381._28_4_ = auVar276._28_4_ + auVar38._28_4_;
        fVar246 = (float)local_8c0._0_4_ * fVar263 * -fVar203;
        fVar261 = (float)local_8c0._4_4_ * fVar309 * -fVar204;
        auVar57._4_4_ = fVar261;
        auVar57._0_4_ = fVar246;
        fVar260 = fStack_8b8 * fVar268 * -fVar205;
        auVar57._8_4_ = fVar260;
        fVar243 = fStack_8b4 * fVar291 * -fVar206;
        auVar57._12_4_ = fVar243;
        fVar244 = register0x00001490 * fVar304 * -fVar225;
        auVar57._16_4_ = fVar244;
        fVar262 = register0x00001494 * fVar308 * -fVar312;
        auVar57._20_4_ = fVar262;
        fVar264 = register0x00001498 * fVar267 * -fVar320;
        auVar57._24_4_ = fVar264;
        auVar57._28_4_ = fVar426;
        auVar41 = vsubps_avx(auVar369,auVar54);
        auVar392._0_4_ = fVar246 + auVar254._0_4_;
        auVar392._4_4_ = fVar261 + auVar254._4_4_;
        auVar392._8_4_ = fVar260 + auVar254._8_4_;
        auVar392._12_4_ = fVar243 + auVar254._12_4_;
        auVar392._16_4_ = fVar244 + auVar254._16_4_;
        auVar392._20_4_ = fVar262 + auVar254._20_4_;
        auVar392._24_4_ = fVar264 + auVar254._24_4_;
        auVar392._28_4_ = fVar426 + auVar254._28_4_;
        fVar246 = fVar263 * 0.0 * (float)local_8c0._0_4_;
        fVar261 = fVar309 * 0.0 * (float)local_8c0._4_4_;
        auVar58._4_4_ = fVar261;
        auVar58._0_4_ = fVar246;
        fVar260 = fVar268 * 0.0 * fStack_8b8;
        auVar58._8_4_ = fVar260;
        fVar263 = fVar291 * 0.0 * fStack_8b4;
        auVar58._12_4_ = fVar263;
        fVar243 = fVar304 * 0.0 * register0x00001490;
        auVar58._16_4_ = fVar243;
        fVar244 = fVar308 * 0.0 * register0x00001494;
        auVar58._20_4_ = fVar244;
        fVar262 = fVar267 * 0.0 * register0x00001498;
        auVar58._24_4_ = fVar262;
        auVar58._28_4_ = fVar321;
        auVar431 = vsubps_avx(auVar140,auVar55);
        auVar151._4_4_ = fStack_5fc;
        auVar151._0_4_ = local_600;
        auVar151._8_4_ = fStack_5f8;
        auVar151._12_4_ = fStack_5f4;
        auVar151._16_4_ = fStack_5f0;
        auVar151._20_4_ = fStack_5ec;
        auVar151._24_4_ = fStack_5e8;
        auVar151._28_4_ = fStack_5e4;
        auVar428._0_4_ = local_600 + fVar246;
        auVar428._4_4_ = fStack_5fc + fVar261;
        auVar428._8_4_ = fStack_5f8 + fVar260;
        auVar428._12_4_ = fStack_5f4 + fVar263;
        auVar428._16_4_ = fStack_5f0 + fVar243;
        auVar428._20_4_ = fStack_5ec + fVar244;
        auVar428._24_4_ = fStack_5e8 + fVar262;
        auVar428._28_4_ = fStack_5e4 + fVar321;
        auVar175 = vsubps_avx(auVar276,auVar56);
        auVar186 = vsubps_avx(auVar254,auVar57);
        auVar38 = vsubps_avx(auVar151,auVar58);
        auVar39 = vsubps_avx(auVar392,auVar41);
        auVar40 = vsubps_avx(auVar428,auVar431);
        auVar59._4_4_ = auVar431._4_4_ * auVar39._4_4_;
        auVar59._0_4_ = auVar431._0_4_ * auVar39._0_4_;
        auVar59._8_4_ = auVar431._8_4_ * auVar39._8_4_;
        auVar59._12_4_ = auVar431._12_4_ * auVar39._12_4_;
        auVar59._16_4_ = auVar431._16_4_ * auVar39._16_4_;
        auVar59._20_4_ = auVar431._20_4_ * auVar39._20_4_;
        auVar59._24_4_ = auVar431._24_4_ * auVar39._24_4_;
        auVar59._28_4_ = fVar426;
        auVar60._4_4_ = auVar41._4_4_ * auVar40._4_4_;
        auVar60._0_4_ = auVar41._0_4_ * auVar40._0_4_;
        auVar60._8_4_ = auVar41._8_4_ * auVar40._8_4_;
        auVar60._12_4_ = auVar41._12_4_ * auVar40._12_4_;
        auVar60._16_4_ = auVar41._16_4_ * auVar40._16_4_;
        auVar60._20_4_ = auVar41._20_4_ * auVar40._20_4_;
        auVar60._24_4_ = auVar41._24_4_ * auVar40._24_4_;
        auVar60._28_4_ = auVar254._28_4_;
        auVar371 = vsubps_avx(auVar60,auVar59);
        auVar61._4_4_ = auVar357._4_4_ * auVar40._4_4_;
        auVar61._0_4_ = auVar357._0_4_ * auVar40._0_4_;
        auVar61._8_4_ = auVar357._8_4_ * auVar40._8_4_;
        auVar61._12_4_ = auVar357._12_4_ * auVar40._12_4_;
        auVar61._16_4_ = auVar357._16_4_ * auVar40._16_4_;
        auVar61._20_4_ = auVar357._20_4_ * auVar40._20_4_;
        auVar61._24_4_ = auVar357._24_4_ * auVar40._24_4_;
        auVar61._28_4_ = auVar40._28_4_;
        auVar44 = vsubps_avx(auVar381,auVar357);
        auVar62._4_4_ = auVar431._4_4_ * auVar44._4_4_;
        auVar62._0_4_ = auVar431._0_4_ * auVar44._0_4_;
        auVar62._8_4_ = auVar431._8_4_ * auVar44._8_4_;
        auVar62._12_4_ = auVar431._12_4_ * auVar44._12_4_;
        auVar62._16_4_ = auVar431._16_4_ * auVar44._16_4_;
        auVar62._20_4_ = auVar431._20_4_ * auVar44._20_4_;
        auVar62._24_4_ = auVar431._24_4_ * auVar44._24_4_;
        auVar62._28_4_ = auVar276._28_4_;
        auVar43 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar44._4_4_ * auVar41._4_4_;
        auVar63._0_4_ = auVar44._0_4_ * auVar41._0_4_;
        auVar63._8_4_ = auVar44._8_4_ * auVar41._8_4_;
        auVar63._12_4_ = auVar44._12_4_ * auVar41._12_4_;
        auVar63._16_4_ = auVar44._16_4_ * auVar41._16_4_;
        auVar63._20_4_ = auVar44._20_4_ * auVar41._20_4_;
        auVar63._24_4_ = auVar44._24_4_ * auVar41._24_4_;
        auVar63._28_4_ = auVar40._28_4_;
        auVar64._4_4_ = auVar357._4_4_ * auVar39._4_4_;
        auVar64._0_4_ = auVar357._0_4_ * auVar39._0_4_;
        auVar64._8_4_ = auVar357._8_4_ * auVar39._8_4_;
        auVar64._12_4_ = auVar357._12_4_ * auVar39._12_4_;
        auVar64._16_4_ = auVar357._16_4_ * auVar39._16_4_;
        auVar64._20_4_ = auVar357._20_4_ * auVar39._20_4_;
        auVar64._24_4_ = auVar357._24_4_ * auVar39._24_4_;
        auVar64._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar64,auVar63);
        auVar181._0_4_ = auVar371._0_4_ * 0.0 + auVar39._0_4_ + auVar43._0_4_ * 0.0;
        auVar181._4_4_ = auVar371._4_4_ * 0.0 + auVar39._4_4_ + auVar43._4_4_ * 0.0;
        auVar181._8_4_ = auVar371._8_4_ * 0.0 + auVar39._8_4_ + auVar43._8_4_ * 0.0;
        auVar181._12_4_ = auVar371._12_4_ * 0.0 + auVar39._12_4_ + auVar43._12_4_ * 0.0;
        auVar181._16_4_ = auVar371._16_4_ * 0.0 + auVar39._16_4_ + auVar43._16_4_ * 0.0;
        auVar181._20_4_ = auVar371._20_4_ * 0.0 + auVar39._20_4_ + auVar43._20_4_ * 0.0;
        auVar181._24_4_ = auVar371._24_4_ * 0.0 + auVar39._24_4_ + auVar43._24_4_ * 0.0;
        auVar181._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar43._28_4_;
        auVar44 = vcmpps_avx(auVar181,ZEXT432(0) << 0x20,2);
        auVar240 = ZEXT3264(auVar44);
        auVar175 = vblendvps_avx(auVar175,_local_860,auVar44);
        auVar186 = vblendvps_avx(auVar186,_local_880,auVar44);
        auVar38 = vblendvps_avx(auVar38,auVar316,auVar44);
        auVar39 = vblendvps_avx(auVar357,auVar381,auVar44);
        auVar40 = vblendvps_avx(auVar41,auVar392,auVar44);
        auVar371 = vblendvps_avx(auVar431,auVar428,auVar44);
        auVar357 = vblendvps_avx(auVar381,auVar357,auVar44);
        auVar41 = vblendvps_avx(auVar392,auVar41,auVar44);
        auVar173 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar431 = vblendvps_avx(auVar428,auVar431,auVar44);
        auVar357 = vsubps_avx(auVar357,auVar175);
        auVar43 = vsubps_avx(auVar41,auVar186);
        auVar431 = vsubps_avx(auVar431,auVar38);
        auVar176 = vsubps_avx(auVar186,auVar40);
        fVar246 = auVar43._0_4_;
        fVar171 = auVar38._0_4_;
        fVar244 = auVar43._4_4_;
        fVar196 = auVar38._4_4_;
        auVar65._4_4_ = fVar196 * fVar244;
        auVar65._0_4_ = fVar171 * fVar246;
        fVar266 = auVar43._8_4_;
        fVar199 = auVar38._8_4_;
        auVar65._8_4_ = fVar199 * fVar266;
        fVar291 = auVar43._12_4_;
        fVar201 = auVar38._12_4_;
        auVar65._12_4_ = fVar201 * fVar291;
        fVar305 = auVar43._16_4_;
        fVar202 = auVar38._16_4_;
        auVar65._16_4_ = fVar202 * fVar305;
        fVar363 = auVar43._20_4_;
        fVar203 = auVar38._20_4_;
        auVar65._20_4_ = fVar203 * fVar363;
        fVar376 = auVar43._24_4_;
        fVar204 = auVar38._24_4_;
        auVar65._24_4_ = fVar204 * fVar376;
        auVar65._28_4_ = auVar41._28_4_;
        fVar261 = auVar186._0_4_;
        fVar323 = auVar431._0_4_;
        fVar262 = auVar186._4_4_;
        fVar324 = auVar431._4_4_;
        auVar66._4_4_ = fVar324 * fVar262;
        auVar66._0_4_ = fVar323 * fVar261;
        fVar268 = auVar186._8_4_;
        fVar325 = auVar431._8_4_;
        auVar66._8_4_ = fVar325 * fVar268;
        fVar292 = auVar186._12_4_;
        fVar326 = auVar431._12_4_;
        auVar66._12_4_ = fVar326 * fVar292;
        fVar306 = auVar186._16_4_;
        fVar375 = auVar431._16_4_;
        auVar66._16_4_ = fVar375 * fVar306;
        fVar364 = auVar186._20_4_;
        fVar169 = auVar431._20_4_;
        auVar66._20_4_ = fVar169 * fVar364;
        fVar198 = auVar186._24_4_;
        fVar194 = auVar431._24_4_;
        auVar66._24_4_ = fVar194 * fVar198;
        auVar66._28_4_ = auVar392._28_4_;
        auVar186 = vsubps_avx(auVar66,auVar65);
        fVar260 = auVar175._0_4_;
        fVar309 = auVar175._4_4_;
        auVar67._4_4_ = fVar324 * fVar309;
        auVar67._0_4_ = fVar323 * fVar260;
        fVar281 = auVar175._8_4_;
        auVar67._8_4_ = fVar325 * fVar281;
        fVar293 = auVar175._12_4_;
        auVar67._12_4_ = fVar326 * fVar293;
        fVar307 = auVar175._16_4_;
        auVar67._16_4_ = fVar375 * fVar307;
        fVar267 = auVar175._20_4_;
        auVar67._20_4_ = fVar169 * fVar267;
        fVar200 = auVar175._24_4_;
        auVar67._24_4_ = fVar194 * fVar200;
        auVar67._28_4_ = auVar392._28_4_;
        fVar263 = auVar357._0_4_;
        auVar421._0_4_ = fVar171 * fVar263;
        fVar264 = auVar357._4_4_;
        auVar421._4_4_ = fVar196 * fVar264;
        fVar285 = auVar357._8_4_;
        auVar421._8_4_ = fVar199 * fVar285;
        fVar294 = auVar357._12_4_;
        auVar421._12_4_ = fVar201 * fVar294;
        fVar308 = auVar357._16_4_;
        auVar421._16_4_ = fVar202 * fVar308;
        fVar245 = auVar357._20_4_;
        auVar421._20_4_ = fVar203 * fVar245;
        fVar170 = auVar357._24_4_;
        auVar421._24_4_ = fVar204 * fVar170;
        auVar421._28_4_ = 0;
        auVar41 = vsubps_avx(auVar421,auVar67);
        auVar68._4_4_ = fVar262 * fVar264;
        auVar68._0_4_ = fVar261 * fVar263;
        auVar68._8_4_ = fVar268 * fVar285;
        auVar68._12_4_ = fVar292 * fVar294;
        auVar68._16_4_ = fVar306 * fVar308;
        auVar68._20_4_ = fVar364 * fVar245;
        auVar68._24_4_ = fVar198 * fVar170;
        auVar68._28_4_ = auVar392._28_4_;
        auVar69._4_4_ = fVar309 * fVar244;
        auVar69._0_4_ = fVar260 * fVar246;
        auVar69._8_4_ = fVar281 * fVar266;
        auVar69._12_4_ = fVar293 * fVar291;
        auVar69._16_4_ = fVar307 * fVar305;
        auVar69._20_4_ = fVar267 * fVar363;
        auVar69._24_4_ = fVar200 * fVar376;
        auVar69._28_4_ = auVar428._28_4_;
        auVar177 = vsubps_avx(auVar69,auVar68);
        auVar210 = vsubps_avx(auVar38,auVar371);
        fVar243 = auVar177._28_4_ + auVar41._28_4_;
        auVar214._0_4_ = auVar177._0_4_ + auVar41._0_4_ * 0.0 + auVar186._0_4_ * 0.0;
        auVar214._4_4_ = auVar177._4_4_ + auVar41._4_4_ * 0.0 + auVar186._4_4_ * 0.0;
        auVar214._8_4_ = auVar177._8_4_ + auVar41._8_4_ * 0.0 + auVar186._8_4_ * 0.0;
        auVar214._12_4_ = auVar177._12_4_ + auVar41._12_4_ * 0.0 + auVar186._12_4_ * 0.0;
        auVar214._16_4_ = auVar177._16_4_ + auVar41._16_4_ * 0.0 + auVar186._16_4_ * 0.0;
        auVar214._20_4_ = auVar177._20_4_ + auVar41._20_4_ * 0.0 + auVar186._20_4_ * 0.0;
        auVar214._24_4_ = auVar177._24_4_ + auVar41._24_4_ * 0.0 + auVar186._24_4_ * 0.0;
        auVar214._28_4_ = fVar243 + auVar186._28_4_;
        fVar205 = auVar176._0_4_;
        fVar206 = auVar176._4_4_;
        auVar70._4_4_ = fVar206 * auVar371._4_4_;
        auVar70._0_4_ = fVar205 * auVar371._0_4_;
        fVar225 = auVar176._8_4_;
        auVar70._8_4_ = fVar225 * auVar371._8_4_;
        fVar312 = auVar176._12_4_;
        auVar70._12_4_ = fVar312 * auVar371._12_4_;
        fVar320 = auVar176._16_4_;
        auVar70._16_4_ = fVar320 * auVar371._16_4_;
        fVar321 = auVar176._20_4_;
        auVar70._20_4_ = fVar321 * auVar371._20_4_;
        fVar322 = auVar176._24_4_;
        auVar70._24_4_ = fVar322 * auVar371._24_4_;
        auVar70._28_4_ = fVar243;
        fVar243 = auVar210._0_4_;
        fVar265 = auVar210._4_4_;
        auVar71._4_4_ = auVar40._4_4_ * fVar265;
        auVar71._0_4_ = auVar40._0_4_ * fVar243;
        fVar288 = auVar210._8_4_;
        auVar71._8_4_ = auVar40._8_4_ * fVar288;
        fVar304 = auVar210._12_4_;
        auVar71._12_4_ = auVar40._12_4_ * fVar304;
        fVar310 = auVar210._16_4_;
        auVar71._16_4_ = auVar40._16_4_ * fVar310;
        fVar311 = auVar210._20_4_;
        auVar71._20_4_ = auVar40._20_4_ * fVar311;
        fVar195 = auVar210._24_4_;
        auVar71._24_4_ = auVar40._24_4_ * fVar195;
        auVar71._28_4_ = auVar177._28_4_;
        auVar41 = vsubps_avx(auVar71,auVar70);
        auVar176 = vsubps_avx(auVar175,auVar39);
        fVar197 = auVar176._0_4_;
        fVar328 = auVar176._4_4_;
        auVar72._4_4_ = fVar328 * auVar371._4_4_;
        auVar72._0_4_ = fVar197 * auVar371._0_4_;
        fVar337 = auVar176._8_4_;
        auVar72._8_4_ = fVar337 * auVar371._8_4_;
        fVar339 = auVar176._12_4_;
        auVar72._12_4_ = fVar339 * auVar371._12_4_;
        fVar341 = auVar176._16_4_;
        auVar72._16_4_ = fVar341 * auVar371._16_4_;
        fVar342 = auVar176._20_4_;
        auVar72._20_4_ = fVar342 * auVar371._20_4_;
        fVar343 = auVar176._24_4_;
        auVar72._24_4_ = fVar343 * auVar371._24_4_;
        auVar72._28_4_ = auVar371._28_4_;
        auVar73._4_4_ = auVar39._4_4_ * fVar265;
        auVar73._0_4_ = auVar39._0_4_ * fVar243;
        auVar73._8_4_ = auVar39._8_4_ * fVar288;
        auVar73._12_4_ = auVar39._12_4_ * fVar304;
        auVar73._16_4_ = auVar39._16_4_ * fVar310;
        auVar73._20_4_ = auVar39._20_4_ * fVar311;
        auVar73._24_4_ = auVar39._24_4_ * fVar195;
        auVar73._28_4_ = auVar186._28_4_;
        auVar186 = vsubps_avx(auVar72,auVar73);
        auVar74._4_4_ = auVar40._4_4_ * fVar328;
        auVar74._0_4_ = auVar40._0_4_ * fVar197;
        auVar74._8_4_ = auVar40._8_4_ * fVar337;
        auVar74._12_4_ = auVar40._12_4_ * fVar339;
        auVar74._16_4_ = auVar40._16_4_ * fVar341;
        auVar74._20_4_ = auVar40._20_4_ * fVar342;
        auVar74._24_4_ = auVar40._24_4_ * fVar343;
        auVar74._28_4_ = auVar371._28_4_;
        auVar75._4_4_ = auVar39._4_4_ * fVar206;
        auVar75._0_4_ = auVar39._0_4_ * fVar205;
        auVar75._8_4_ = auVar39._8_4_ * fVar225;
        auVar75._12_4_ = auVar39._12_4_ * fVar312;
        auVar75._16_4_ = auVar39._16_4_ * fVar320;
        auVar75._20_4_ = auVar39._20_4_ * fVar321;
        auVar75._24_4_ = auVar39._24_4_ * fVar322;
        auVar75._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar75,auVar74);
        auVar193 = ZEXT864(0) << 0x20;
        auVar278._0_4_ = auVar41._0_4_ * 0.0 + auVar39._0_4_ + auVar186._0_4_ * 0.0;
        auVar278._4_4_ = auVar41._4_4_ * 0.0 + auVar39._4_4_ + auVar186._4_4_ * 0.0;
        auVar278._8_4_ = auVar41._8_4_ * 0.0 + auVar39._8_4_ + auVar186._8_4_ * 0.0;
        auVar278._12_4_ = auVar41._12_4_ * 0.0 + auVar39._12_4_ + auVar186._12_4_ * 0.0;
        auVar278._16_4_ = auVar41._16_4_ * 0.0 + auVar39._16_4_ + auVar186._16_4_ * 0.0;
        auVar278._20_4_ = auVar41._20_4_ * 0.0 + auVar39._20_4_ + auVar186._20_4_ * 0.0;
        auVar278._24_4_ = auVar41._24_4_ * 0.0 + auVar39._24_4_ + auVar186._24_4_ * 0.0;
        auVar278._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar186._28_4_;
        auVar186 = vmaxps_avx(auVar214,auVar278);
        auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
        auVar230 = vpackssdw_avx(auVar186._0_16_,auVar186._16_16_);
        auVar173 = vpand_avx(auVar230,auVar173);
        auVar230 = vpmovsxwd_avx(auVar173);
        auVar275 = vpunpckhwd_avx(auVar173,auVar173);
        auVar256._16_16_ = auVar275;
        auVar256._0_16_ = auVar230;
        if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar256 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar256 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar256 >> 0x7f,0) == '\0') &&
              (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar275 >> 0x3f,0) == '\0') &&
            (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar275[0xf]) {
LAB_01231a9c:
          auVar301._8_8_ = uStack_698;
          auVar301._0_8_ = local_6a0;
          auVar301._16_8_ = uStack_690;
          auVar301._24_8_ = uStack_688;
          auVar374 = ZEXT3264(local_680);
          auVar432 = ZEXT3264(local_660);
          auVar259 = ZEXT3264(auVar256);
        }
        else {
          auVar76._4_4_ = fVar265 * fVar244;
          auVar76._0_4_ = fVar243 * fVar246;
          auVar76._8_4_ = fVar288 * fVar266;
          auVar76._12_4_ = fVar304 * fVar291;
          auVar76._16_4_ = fVar310 * fVar305;
          auVar76._20_4_ = fVar311 * fVar363;
          auVar76._24_4_ = fVar195 * fVar376;
          auVar76._28_4_ = auVar275._12_4_;
          auVar400._0_4_ = fVar205 * fVar323;
          auVar400._4_4_ = fVar206 * fVar324;
          auVar400._8_4_ = fVar225 * fVar325;
          auVar400._12_4_ = fVar312 * fVar326;
          auVar400._16_4_ = fVar320 * fVar375;
          auVar400._20_4_ = fVar321 * fVar169;
          auVar400._24_4_ = fVar322 * fVar194;
          auVar400._28_4_ = 0;
          auVar186 = vsubps_avx(auVar400,auVar76);
          auVar77._4_4_ = fVar328 * fVar324;
          auVar77._0_4_ = fVar197 * fVar323;
          auVar77._8_4_ = fVar337 * fVar325;
          auVar77._12_4_ = fVar339 * fVar326;
          auVar77._16_4_ = fVar341 * fVar375;
          auVar77._20_4_ = fVar342 * fVar169;
          auVar77._24_4_ = fVar343 * fVar194;
          auVar77._28_4_ = auVar431._28_4_;
          auVar78._4_4_ = fVar265 * fVar264;
          auVar78._0_4_ = fVar243 * fVar263;
          auVar78._8_4_ = fVar288 * fVar285;
          auVar78._12_4_ = fVar304 * fVar294;
          auVar78._16_4_ = fVar310 * fVar308;
          auVar78._20_4_ = fVar311 * fVar245;
          auVar78._24_4_ = fVar195 * fVar170;
          auVar78._28_4_ = auVar210._28_4_;
          auVar40 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = fVar206 * fVar264;
          auVar79._0_4_ = fVar205 * fVar263;
          auVar79._8_4_ = fVar225 * fVar285;
          auVar79._12_4_ = fVar312 * fVar294;
          auVar79._16_4_ = fVar320 * fVar308;
          auVar79._20_4_ = fVar321 * fVar245;
          auVar79._24_4_ = fVar322 * fVar170;
          auVar79._28_4_ = auVar214._28_4_;
          auVar80._4_4_ = fVar328 * fVar244;
          auVar80._0_4_ = fVar197 * fVar246;
          auVar80._8_4_ = fVar337 * fVar266;
          auVar80._12_4_ = fVar339 * fVar291;
          auVar80._16_4_ = fVar341 * fVar305;
          auVar80._20_4_ = fVar342 * fVar363;
          auVar80._24_4_ = fVar343 * fVar376;
          auVar80._28_4_ = auVar43._28_4_;
          auVar371 = vsubps_avx(auVar80,auVar79);
          auVar334._0_4_ = auVar186._0_4_ * 0.0 + auVar371._0_4_ + auVar40._0_4_ * 0.0;
          auVar334._4_4_ = auVar186._4_4_ * 0.0 + auVar371._4_4_ + auVar40._4_4_ * 0.0;
          auVar334._8_4_ = auVar186._8_4_ * 0.0 + auVar371._8_4_ + auVar40._8_4_ * 0.0;
          auVar334._12_4_ = auVar186._12_4_ * 0.0 + auVar371._12_4_ + auVar40._12_4_ * 0.0;
          auVar334._16_4_ = auVar186._16_4_ * 0.0 + auVar371._16_4_ + auVar40._16_4_ * 0.0;
          auVar334._20_4_ = auVar186._20_4_ * 0.0 + auVar371._20_4_ + auVar40._20_4_ * 0.0;
          auVar334._24_4_ = auVar186._24_4_ * 0.0 + auVar371._24_4_ + auVar40._24_4_ * 0.0;
          auVar334._28_4_ = auVar43._28_4_ + auVar371._28_4_ + auVar214._28_4_;
          auVar39 = vrcpps_avx(auVar334);
          fVar246 = auVar39._0_4_;
          fVar263 = auVar39._4_4_;
          auVar81._4_4_ = auVar334._4_4_ * fVar263;
          auVar81._0_4_ = auVar334._0_4_ * fVar246;
          fVar243 = auVar39._8_4_;
          auVar81._8_4_ = auVar334._8_4_ * fVar243;
          fVar244 = auVar39._12_4_;
          auVar81._12_4_ = auVar334._12_4_ * fVar244;
          fVar264 = auVar39._16_4_;
          auVar81._16_4_ = auVar334._16_4_ * fVar264;
          fVar265 = auVar39._20_4_;
          auVar81._20_4_ = auVar334._20_4_ * fVar265;
          fVar266 = auVar39._24_4_;
          auVar81._24_4_ = auVar334._24_4_ * fVar266;
          auVar81._28_4_ = auVar210._28_4_;
          auVar401._8_4_ = 0x3f800000;
          auVar401._0_8_ = &DAT_3f8000003f800000;
          auVar401._12_4_ = 0x3f800000;
          auVar401._16_4_ = 0x3f800000;
          auVar401._20_4_ = 0x3f800000;
          auVar401._24_4_ = 0x3f800000;
          auVar401._28_4_ = 0x3f800000;
          auVar41 = vsubps_avx(auVar401,auVar81);
          fVar246 = auVar41._0_4_ * fVar246 + fVar246;
          fVar263 = auVar41._4_4_ * fVar263 + fVar263;
          fVar243 = auVar41._8_4_ * fVar243 + fVar243;
          fVar244 = auVar41._12_4_ * fVar244 + fVar244;
          fVar264 = auVar41._16_4_ * fVar264 + fVar264;
          fVar265 = auVar41._20_4_ * fVar265 + fVar265;
          fVar266 = auVar41._24_4_ * fVar266 + fVar266;
          auVar82._4_4_ =
               (auVar186._4_4_ * fVar309 + auVar40._4_4_ * fVar262 + auVar371._4_4_ * fVar196) *
               fVar263;
          auVar82._0_4_ =
               (auVar186._0_4_ * fVar260 + auVar40._0_4_ * fVar261 + auVar371._0_4_ * fVar171) *
               fVar246;
          auVar82._8_4_ =
               (auVar186._8_4_ * fVar281 + auVar40._8_4_ * fVar268 + auVar371._8_4_ * fVar199) *
               fVar243;
          auVar82._12_4_ =
               (auVar186._12_4_ * fVar293 + auVar40._12_4_ * fVar292 + auVar371._12_4_ * fVar201) *
               fVar244;
          auVar82._16_4_ =
               (auVar186._16_4_ * fVar307 + auVar40._16_4_ * fVar306 + auVar371._16_4_ * fVar202) *
               fVar264;
          auVar82._20_4_ =
               (auVar186._20_4_ * fVar267 + auVar40._20_4_ * fVar364 + auVar371._20_4_ * fVar203) *
               fVar265;
          auVar82._24_4_ =
               (auVar186._24_4_ * fVar200 + auVar40._24_4_ * fVar198 + auVar371._24_4_ * fVar204) *
               fVar266;
          auVar82._28_4_ = auVar175._28_4_ + auVar357._28_4_ + auVar38._28_4_;
          auVar230 = vpermilps_avx(ZEXT416(uVar163),0);
          auVar257._16_16_ = auVar230;
          auVar257._0_16_ = auVar230;
          auVar175 = vcmpps_avx(auVar257,auVar82,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar299._4_4_ = uVar11;
          auVar299._0_4_ = uVar11;
          auVar299._8_4_ = uVar11;
          auVar299._12_4_ = uVar11;
          auVar299._16_4_ = uVar11;
          auVar299._20_4_ = uVar11;
          auVar299._24_4_ = uVar11;
          auVar299._28_4_ = uVar11;
          auVar186 = vcmpps_avx(auVar82,auVar299,2);
          auVar175 = vandps_avx(auVar186,auVar175);
          auVar230 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
          auVar173 = vpand_avx(auVar173,auVar230);
          auVar230 = vpmovsxwd_avx(auVar173);
          auVar275 = vpshufd_avx(auVar173,0xee);
          auVar275 = vpmovsxwd_avx(auVar275);
          auVar256._16_16_ = auVar275;
          auVar256._0_16_ = auVar230;
          auVar432 = ZEXT3264(local_660);
          auVar374 = ZEXT3264(local_680);
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar256 >> 0x7f,0) == '\0') &&
                (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar275 >> 0x3f,0) == '\0') &&
              (auVar256 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar275[0xf]) goto LAB_01231a9c;
          auVar175 = vcmpps_avx(ZEXT832(0) << 0x20,auVar334,4);
          auVar230 = vpackssdw_avx(auVar175._0_16_,auVar175._16_16_);
          auVar173 = vpand_avx(auVar173,auVar230);
          auVar230 = vpmovsxwd_avx(auVar173);
          auVar173 = vpunpckhwd_avx(auVar173,auVar173);
          auVar259 = ZEXT1664(auVar173);
          auVar317._16_16_ = auVar173;
          auVar317._0_16_ = auVar230;
          auVar301._8_8_ = uStack_698;
          auVar301._0_8_ = local_6a0;
          auVar301._16_8_ = uStack_690;
          auVar301._24_8_ = uStack_688;
          if ((((((((auVar317 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar317 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar317 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar317 >> 0x7f,0) != '\0') ||
                (auVar317 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar173 >> 0x3f,0) != '\0') ||
              (auVar317 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar173[0xf] < '\0') {
            auVar258._0_4_ = auVar214._0_4_ * fVar246;
            auVar258._4_4_ = auVar214._4_4_ * fVar263;
            auVar258._8_4_ = auVar214._8_4_ * fVar243;
            auVar258._12_4_ = auVar214._12_4_ * fVar244;
            auVar258._16_4_ = auVar214._16_4_ * fVar264;
            auVar258._20_4_ = auVar214._20_4_ * fVar265;
            auVar258._24_4_ = auVar214._24_4_ * fVar266;
            auVar258._28_4_ = 0;
            auVar83._4_4_ = auVar278._4_4_ * fVar263;
            auVar83._0_4_ = auVar278._0_4_ * fVar246;
            auVar83._8_4_ = auVar278._8_4_ * fVar243;
            auVar83._12_4_ = auVar278._12_4_ * fVar244;
            auVar83._16_4_ = auVar278._16_4_ * fVar264;
            auVar83._20_4_ = auVar278._20_4_ * fVar265;
            auVar83._24_4_ = auVar278._24_4_ * fVar266;
            auVar83._28_4_ = auVar41._28_4_ + auVar39._28_4_;
            auVar300._8_4_ = 0x3f800000;
            auVar300._0_8_ = &DAT_3f8000003f800000;
            auVar300._12_4_ = 0x3f800000;
            auVar300._16_4_ = 0x3f800000;
            auVar300._20_4_ = 0x3f800000;
            auVar300._24_4_ = 0x3f800000;
            auVar300._28_4_ = 0x3f800000;
            auVar175 = vsubps_avx(auVar300,auVar258);
            auVar175 = vblendvps_avx(auVar175,auVar258,auVar44);
            auVar432 = ZEXT3264(auVar175);
            auVar175 = vsubps_avx(auVar300,auVar83);
            auVar259 = ZEXT3264(auVar175);
            _local_360 = vblendvps_avx(auVar175,auVar83,auVar44);
            auVar374 = ZEXT3264(auVar82);
            auVar301 = auVar317;
          }
        }
        auVar385 = ZEXT3264(auVar356);
        auVar335 = ZEXT3264(auVar178);
        local_660 = auVar432._0_32_;
        local_680 = auVar374._0_32_;
        auVar371 = local_680;
        auVar357 = local_660;
        if ((((((((auVar301 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar301 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar301 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar301 >> 0x7f,0) != '\0') ||
              (auVar301 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar301 >> 0xbf,0) != '\0') ||
            (auVar301 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar301[0x1f] < '\0') {
          auVar175 = vsubps_avx(_local_8c0,auVar178);
          fVar261 = auVar178._0_4_ + auVar432._0_4_ * auVar175._0_4_;
          fVar260 = auVar178._4_4_ + auVar432._4_4_ * auVar175._4_4_;
          fVar263 = auVar178._8_4_ + auVar432._8_4_ * auVar175._8_4_;
          fVar243 = auVar178._12_4_ + auVar432._12_4_ * auVar175._12_4_;
          fVar244 = auVar178._16_4_ + auVar432._16_4_ * auVar175._16_4_;
          fVar262 = auVar178._20_4_ + auVar432._20_4_ * auVar175._20_4_;
          fVar309 = auVar178._24_4_ + auVar432._24_4_ * auVar175._24_4_;
          fVar264 = auVar175._28_4_ + 0.0;
          fVar246 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar84._4_4_ = (fVar260 + fVar260) * fVar246;
          auVar84._0_4_ = (fVar261 + fVar261) * fVar246;
          auVar84._8_4_ = (fVar263 + fVar263) * fVar246;
          auVar84._12_4_ = (fVar243 + fVar243) * fVar246;
          auVar84._16_4_ = (fVar244 + fVar244) * fVar246;
          auVar84._20_4_ = (fVar262 + fVar262) * fVar246;
          auVar84._24_4_ = (fVar309 + fVar309) * fVar246;
          auVar84._28_4_ = fVar264 + fVar264;
          auVar175 = vcmpps_avx(local_680,auVar84,6);
          auVar186 = auVar301 & auVar175;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0x7f,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar186 >> 0xbf,0) != '\0') ||
              (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar186[0x1f] < '\0') {
            local_400 = vandps_avx(auVar175,auVar301);
            auVar240 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_360._0_4_ = (float)local_360._0_4_ + (float)local_360._0_4_ + -1.0;
            local_360._4_4_ = (float)local_360._4_4_ + (float)local_360._4_4_ + -1.0;
            fStack_358 = fStack_358 + fStack_358 + -1.0;
            fStack_354 = fStack_354 + fStack_354 + -1.0;
            uStack_350._0_4_ = (float)uStack_350 + (float)uStack_350 + -1.0;
            uStack_350._4_4_ = uStack_350._4_4_ + uStack_350._4_4_ + -1.0;
            uStack_348._0_4_ = (float)uStack_348 + (float)uStack_348 + -1.0;
            uStack_348._4_4_ = uStack_348._4_4_ + uStack_348._4_4_ + -1.0;
            auVar175 = _local_360;
            local_4a0._4_4_ = local_360._4_4_;
            local_4a0._0_4_ = local_360._0_4_;
            fStack_498 = fStack_358;
            fStack_494 = fStack_354;
            fStack_490 = (float)uStack_350;
            fStack_48c = uStack_350._4_4_;
            fStack_488 = (float)uStack_348;
            fStack_484 = uStack_348._4_4_;
            local_460 = 0;
            uStack_448 = uStack_908;
            uStack_788 = auVar347._8_8_;
            uStack_438 = uStack_788;
            uStack_708 = auVar406._8_8_;
            uStack_428 = uStack_708;
            uStack_718 = auVar419._8_8_;
            uStack_418 = uStack_718;
            _local_360 = auVar175;
            if ((pGVar167->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              auVar227._0_4_ = 1.0 / (float)(int)uVar34;
              auVar227._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar173 = vshufps_avx(auVar227,auVar227,0);
              local_3e0[0] = auVar173._0_4_ * (auVar432._0_4_ + 0.0);
              local_3e0[1] = auVar173._4_4_ * (auVar432._4_4_ + 1.0);
              local_3e0[2] = auVar173._8_4_ * (auVar432._8_4_ + 2.0);
              local_3e0[3] = auVar173._12_4_ * (auVar432._12_4_ + 3.0);
              fStack_3d0 = auVar173._0_4_ * (auVar432._16_4_ + 4.0);
              fStack_3cc = auVar173._4_4_ * (auVar432._20_4_ + 5.0);
              fStack_3c8 = auVar173._8_4_ * (auVar432._24_4_ + 6.0);
              fStack_3c4 = auVar432._28_4_ + 7.0;
              uStack_348 = auVar175._24_8_;
              local_3c0._16_8_ = uStack_350;
              local_3c0._0_16_ = _local_360;
              local_3c0._24_8_ = uStack_348;
              local_3a0 = local_680;
              auVar215._8_4_ = 0x7f800000;
              auVar215._0_8_ = 0x7f8000007f800000;
              auVar215._12_4_ = 0x7f800000;
              auVar215._16_4_ = 0x7f800000;
              auVar215._20_4_ = 0x7f800000;
              auVar215._24_4_ = 0x7f800000;
              auVar215._28_4_ = 0x7f800000;
              auVar175 = vblendvps_avx(auVar215,local_680,local_400);
              auVar186 = vshufps_avx(auVar175,auVar175,0xb1);
              auVar186 = vminps_avx(auVar175,auVar186);
              auVar38 = vshufpd_avx(auVar186,auVar186,5);
              auVar186 = vminps_avx(auVar186,auVar38);
              auVar38 = vperm2f128_avx(auVar186,auVar186,1);
              auVar186 = vminps_avx(auVar186,auVar38);
              auVar186 = vcmpps_avx(auVar175,auVar186,0);
              auVar38 = local_400 & auVar186;
              auVar175 = local_400;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                auVar175 = vandps_avx(auVar186,local_400);
              }
              uVar159 = vmovmskps_avx(auVar175);
              uVar160 = 0;
              if (uVar159 != 0) {
                for (; (uVar159 >> uVar160 & 1) == 0; uVar160 = uVar160 + 1) {
                }
              }
              uVar161 = (ulong)uVar160;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar167->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar246 = local_3e0[uVar161];
                uVar11 = *(undefined4 *)(local_3c0 + uVar161 * 4);
                fVar260 = 1.0 - fVar246;
                fVar261 = fVar246 * fVar260 * 4.0;
                auVar173 = ZEXT416((uint)(fVar246 * fVar246 * 0.5));
                auVar173 = vshufps_avx(auVar173,auVar173,0);
                auVar230 = ZEXT416((uint)((fVar260 * fVar260 + fVar261) * 0.5));
                auVar230 = vshufps_avx(auVar230,auVar230,0);
                auVar275 = ZEXT416((uint)((-fVar246 * fVar246 - fVar261) * 0.5));
                auVar275 = vshufps_avx(auVar275,auVar275,0);
                auVar249 = ZEXT416((uint)(fVar260 * -fVar260 * 0.5));
                auVar249 = vshufps_avx(auVar249,auVar249,0);
                auVar228._0_4_ =
                     auVar249._0_4_ * fVar269 +
                     auVar275._0_4_ * fVar345 +
                     auVar173._0_4_ * fVar417 + auVar230._0_4_ * local_840;
                auVar228._4_4_ =
                     auVar249._4_4_ * fVar282 +
                     auVar275._4_4_ * fVar359 +
                     auVar173._4_4_ * fVar423 + auVar230._4_4_ * fStack_83c;
                auVar228._8_4_ =
                     auVar249._8_4_ * auVar273._8_4_ +
                     auVar275._8_4_ * auVar347._8_4_ +
                     auVar173._8_4_ * auVar419._8_4_ + auVar230._8_4_ * auVar406._8_4_;
                auVar228._12_4_ =
                     auVar249._12_4_ * auVar273._12_4_ +
                     auVar275._12_4_ * auVar347._12_4_ +
                     auVar173._12_4_ * auVar419._12_4_ + auVar230._12_4_ * auVar406._12_4_;
                auVar240 = ZEXT1664(auVar228);
                auVar259 = ZEXT464(*(uint *)(local_3a0 + uVar161 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar161 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar228._0_4_;
                uVar35 = vextractps_avx(auVar228,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                uVar35 = vextractps_avx(auVar228,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                *(float *)(ray + k * 4 + 0x1e0) = fVar246;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                *(uint *)(ray + k * 4 + 0x220) = uVar33;
                *(uint *)(ray + k * 4 + 0x240) = uVar32;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar173 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
                auStack_730 = auVar173;
                _local_740 = auVar173;
                auVar173 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                register0x00001210 = auVar173;
                _local_820 = auVar173;
                _auStack_750 = auVar254._16_16_;
                auStack_758 = (undefined1  [8])uStack_788;
                local_760 = (Geometry *)auVar347._0_8_;
                uStack_858 = uStack_718;
                local_860 = (undefined1  [8])auVar419._0_8_;
                uStack_870 = *local_778;
                _local_880 = *local_770;
                uStack_868 = local_778[1];
                fStack_838 = auVar406._8_4_;
                fStack_834 = auVar406._12_4_;
                _local_7e0 = auVar356;
                _local_790 = auVar347;
                _local_720 = auVar419;
                local_6e0 = local_400;
                local_4c0 = local_660;
                local_480 = local_680;
                local_45c = uVar34;
                local_450 = auVar273._0_8_;
                local_440 = auVar347._0_8_;
                local_430 = auVar406._0_8_;
                local_420 = auVar419._0_8_;
                do {
                  uVar160 = *(uint *)(ray + k * 4 + 0x100);
                  local_240 = local_3e0[uVar161];
                  local_220 = *(undefined4 *)(local_3c0 + uVar161 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3a0 + uVar161 * 4);
                  fVar261 = 1.0 - local_240;
                  fVar246 = local_240 * fVar261 * 4.0;
                  auVar173 = ZEXT416((uint)(local_240 * local_240 * 0.5));
                  auVar173 = vshufps_avx(auVar173,auVar173,0);
                  auVar230 = ZEXT416((uint)((fVar261 * fVar261 + fVar246) * 0.5));
                  auVar230 = vshufps_avx(auVar230,auVar230,0);
                  auVar275 = ZEXT416((uint)((-local_240 * local_240 - fVar246) * 0.5));
                  auVar275 = vshufps_avx(auVar275,auVar275,0);
                  local_8f0.context = context->user;
                  auVar249 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                  auVar249 = vshufps_avx(auVar249,auVar249,0);
                  auVar233._0_4_ =
                       auVar249._0_4_ * fVar269 +
                       auVar275._0_4_ * (float)local_760 +
                       auVar173._0_4_ * (float)local_860._0_4_ + auVar230._0_4_ * local_840;
                  auVar233._4_4_ =
                       auVar249._4_4_ * fVar282 +
                       auVar275._4_4_ * local_760._4_4_ +
                       auVar173._4_4_ * (float)local_860._4_4_ + auVar230._4_4_ * fStack_83c;
                  auVar233._8_4_ =
                       auVar249._8_4_ * auVar273._8_4_ +
                       auVar275._8_4_ * (float)auStack_758._0_4_ +
                       auVar173._8_4_ * (float)uStack_858 + auVar230._8_4_ * fStack_838;
                  auVar233._12_4_ =
                       auVar249._12_4_ * auVar273._12_4_ +
                       auVar275._12_4_ * (float)auStack_758._4_4_ +
                       auVar173._12_4_ * uStack_858._4_4_ + auVar230._12_4_ * fStack_834;
                  auStack_290 = vshufps_avx(auVar233,auVar233,0);
                  local_2a0[0] = (RTCHitN)auStack_290[0];
                  local_2a0[1] = (RTCHitN)auStack_290[1];
                  local_2a0[2] = (RTCHitN)auStack_290[2];
                  local_2a0[3] = (RTCHitN)auStack_290[3];
                  local_2a0[4] = (RTCHitN)auStack_290[4];
                  local_2a0[5] = (RTCHitN)auStack_290[5];
                  local_2a0[6] = (RTCHitN)auStack_290[6];
                  local_2a0[7] = (RTCHitN)auStack_290[7];
                  local_2a0[8] = (RTCHitN)auStack_290[8];
                  local_2a0[9] = (RTCHitN)auStack_290[9];
                  local_2a0[10] = (RTCHitN)auStack_290[10];
                  local_2a0[0xb] = (RTCHitN)auStack_290[0xb];
                  local_2a0[0xc] = (RTCHitN)auStack_290[0xc];
                  local_2a0[0xd] = (RTCHitN)auStack_290[0xd];
                  local_2a0[0xe] = (RTCHitN)auStack_290[0xe];
                  local_2a0[0xf] = (RTCHitN)auStack_290[0xf];
                  auStack_270 = vshufps_avx(auVar233,auVar233,0x55);
                  auVar259 = ZEXT1664(auStack_270);
                  local_280 = auStack_270;
                  auStack_250 = vshufps_avx(auVar233,auVar233,0xaa);
                  local_260 = auStack_250;
                  fStack_23c = local_240;
                  fStack_238 = local_240;
                  fStack_234 = local_240;
                  fStack_230 = local_240;
                  fStack_22c = local_240;
                  fStack_228 = local_240;
                  fStack_224 = local_240;
                  uStack_21c = local_220;
                  uStack_218 = local_220;
                  uStack_214 = local_220;
                  uStack_210 = local_220;
                  uStack_20c = local_220;
                  uStack_208 = local_220;
                  uStack_204 = local_220;
                  local_200 = local_820;
                  uStack_1f8 = uStack_818;
                  uStack_1f0 = uStack_810;
                  uStack_1e8 = uStack_808;
                  local_1e0 = local_740;
                  uStack_1d8 = uStack_738;
                  uStack_1d0 = auStack_730._0_8_;
                  uStack_1c8 = auStack_730._8_8_;
                  _local_800 = vcmpps_avx(auVar193._0_32_,auVar193._0_32_,0xf);
                  local_768[1] = _local_800;
                  *local_768 = _local_800;
                  local_1c0 = (local_8f0.context)->instID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_1a0 = (local_8f0.context)->instPrimID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_7c0 = local_880;
                  uStack_7b8 = uStack_878;
                  uStack_7b0 = uStack_870;
                  uStack_7a8 = uStack_868;
                  local_8f0.valid = (int *)&local_7c0;
                  local_8f0.geometryUserPtr = pGVar167->userPtr;
                  local_8f0.hit = local_2a0;
                  local_8f0.N = 8;
                  local_8f0.ray = (RTCRayN *)ray;
                  if (pGVar167->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_8c0._0_4_ = uVar160;
                    auVar259 = ZEXT1664(auStack_270);
                    (*pGVar167->intersectionFilterN)(&local_8f0);
                    auVar385 = ZEXT3264(_local_7e0);
                    auVar374 = ZEXT3264(local_680);
                    auVar432 = ZEXT3264(local_660);
                    auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar160 = local_8c0._0_4_;
                  }
                  auVar335 = ZEXT464(uVar160);
                  auVar144._8_8_ = uStack_7b8;
                  auVar144._0_8_ = local_7c0;
                  auVar173 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar144);
                  auVar148._8_8_ = uStack_7a8;
                  auVar148._0_8_ = uStack_7b0;
                  auVar230 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar148);
                  auVar190._16_16_ = auVar230;
                  auVar190._0_16_ = auVar173;
                  auVar175 = _local_800 & ~auVar190;
                  if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar175 >> 0x7f,0) == '\0') &&
                        (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar175 >> 0xbf,0) == '\0') &&
                      (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar175[0x1f]) {
                    auVar191._0_4_ = auVar173._0_4_ ^ local_800._0_4_;
                    auVar191._4_4_ = auVar173._4_4_ ^ local_800._4_4_;
                    auVar191._8_4_ = auVar173._8_4_ ^ local_800._8_4_;
                    auVar191._12_4_ = auVar173._12_4_ ^ local_800._12_4_;
                    auVar191._16_4_ = auVar230._0_4_ ^ local_800._16_4_;
                    auVar191._20_4_ = auVar230._4_4_ ^ local_800._20_4_;
                    auVar191._24_4_ = auVar230._8_4_ ^ local_800._24_4_;
                    auVar191._28_4_ = auVar230._12_4_ ^ local_800._28_4_;
                  }
                  else {
                    p_Var37 = context->args->filter;
                    if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar167->field_8).field_0x2 & 0x40) != 0)))) {
                      local_8c0._0_4_ = uVar160;
                      auVar259 = ZEXT1664(auVar259._0_16_);
                      (*p_Var37)(&local_8f0);
                      auVar335 = ZEXT464((uint)local_8c0._0_4_);
                      auVar385 = ZEXT3264(_local_7e0);
                      auVar374 = ZEXT3264(local_680);
                      auVar432 = ZEXT3264(local_660);
                      auVar193 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar145._8_8_ = uStack_7b8;
                    auVar145._0_8_ = local_7c0;
                    auVar173 = vpcmpeqd_avx((undefined1  [16])0x0,auVar145);
                    auVar149._8_8_ = uStack_7a8;
                    auVar149._0_8_ = uStack_7b0;
                    auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar149);
                    auVar223._16_16_ = auVar230;
                    auVar223._0_16_ = auVar173;
                    auVar191._0_4_ = auVar173._0_4_ ^ local_800._0_4_;
                    auVar191._4_4_ = auVar173._4_4_ ^ local_800._4_4_;
                    auVar191._8_4_ = auVar173._8_4_ ^ local_800._8_4_;
                    auVar191._12_4_ = auVar173._12_4_ ^ local_800._12_4_;
                    auVar191._16_4_ = auVar230._0_4_ ^ local_800._16_4_;
                    auVar191._20_4_ = auVar230._4_4_ ^ local_800._20_4_;
                    auVar191._24_4_ = auVar230._8_4_ ^ local_800._24_4_;
                    auVar191._28_4_ = auVar230._12_4_ ^ local_800._28_4_;
                    _local_800 = _local_800 & ~auVar223;
                    if ((((((((_local_800 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (_local_800 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (_local_800 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(_local_800 >> 0x7f,0) != '\0') ||
                          (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(_local_800 >> 0xbf,0) != '\0') ||
                        (_local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_800[0x1f] < '\0') {
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])local_8f0.hit);
                      *(undefined1 (*) [32])(local_8f0.ray + 0x180) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x20));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1a0) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x40));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1c0) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x60));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x1e0) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x80));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x200) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar175;
                      auVar175 = vmaskmovps_avx(auVar191,*(undefined1 (*) [32])
                                                          (local_8f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar175;
                    }
                  }
                  auVar356 = auVar385._0_32_;
                  auVar371 = auVar374._0_32_;
                  if ((((((((auVar191 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar191 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar191 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar191 >> 0x7f,0) == '\0') &&
                        (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar191 >> 0xbf,0) == '\0') &&
                      (auVar191 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar191[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar335._0_4_;
                  }
                  *(undefined4 *)(local_6e0 + uVar161 * 4) = 0;
                  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar192._4_4_ = uVar11;
                  auVar192._0_4_ = uVar11;
                  auVar192._8_4_ = uVar11;
                  auVar192._12_4_ = uVar11;
                  auVar192._16_4_ = uVar11;
                  auVar192._20_4_ = uVar11;
                  auVar192._24_4_ = uVar11;
                  auVar192._28_4_ = uVar11;
                  auVar186 = vcmpps_avx(auVar371,auVar192,2);
                  auVar175 = vandps_avx(auVar186,local_6e0);
                  auVar186 = local_6e0 & auVar186;
                  bVar135 = (auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar136 = (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar134 = (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                  bVar133 = SUB321(auVar186 >> 0x7f,0) != '\0';
                  bVar132 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar131 = SUB321(auVar186 >> 0xbf,0) != '\0';
                  bVar130 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                  bVar129 = auVar186[0x1f] < '\0';
                  if (((((((bVar135 || bVar136) || bVar134) || bVar133) || bVar132) || bVar131) ||
                      bVar130) || bVar129) {
                    auVar224._8_4_ = 0x7f800000;
                    auVar224._0_8_ = 0x7f8000007f800000;
                    auVar224._12_4_ = 0x7f800000;
                    auVar224._16_4_ = 0x7f800000;
                    auVar224._20_4_ = 0x7f800000;
                    auVar224._24_4_ = 0x7f800000;
                    auVar224._28_4_ = 0x7f800000;
                    auVar186 = vblendvps_avx(auVar224,auVar371,auVar175);
                    auVar38 = vshufps_avx(auVar186,auVar186,0xb1);
                    auVar38 = vminps_avx(auVar186,auVar38);
                    auVar39 = vshufpd_avx(auVar38,auVar38,5);
                    auVar38 = vminps_avx(auVar38,auVar39);
                    auVar39 = vperm2f128_avx(auVar38,auVar38,1);
                    auVar259 = ZEXT3264(auVar39);
                    local_6e0 = vminps_avx(auVar38,auVar39);
                    auVar38 = vcmpps_avx(auVar186,local_6e0,0);
                    auVar39 = auVar175 & auVar38;
                    auVar186 = auVar175;
                    if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar39 >> 0x7f,0) != '\0') ||
                          (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar39 >> 0xbf,0) != '\0') ||
                        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar39[0x1f] < '\0') {
                      auVar186 = vandps_avx(auVar38,auVar175);
                    }
                    uVar159 = vmovmskps_avx(auVar186);
                    uVar160 = 0;
                    if (uVar159 != 0) {
                      for (; (uVar159 >> uVar160 & 1) == 0; uVar160 = uVar160 + 1) {
                      }
                    }
                    uVar161 = (ulong)uVar160;
                  }
                  auVar240 = ZEXT3264(local_6e0);
                  auVar357 = auVar432._0_32_;
                  auVar347 = _local_790;
                  auVar419 = _local_720;
                  local_6e0 = auVar175;
                } while (((((((bVar135 || bVar136) || bVar134) || bVar133) || bVar132) || bVar131)
                         || bVar130) || bVar129);
              }
            }
          }
        }
      }
      _local_720 = auVar419;
      _local_790 = auVar347;
      local_680 = auVar371;
      local_660 = auVar357;
      if (8 < (int)uVar34) {
        auVar173 = vpshufd_avx(ZEXT416(uVar34),0);
        local_600 = auVar173._0_4_;
        fStack_5fc = auVar173._4_4_;
        fStack_5f8 = auVar173._8_4_;
        fStack_5f4 = auVar173._12_4_;
        auVar173 = vshufps_avx(local_8a0._0_16_,local_8a0._0_16_,0);
        local_100._16_16_ = auVar173;
        local_100._0_16_ = auVar173;
        auVar173 = vpermilps_avx(ZEXT416(uVar163),0);
        local_120._16_16_ = auVar173;
        local_120._0_16_ = auVar173;
        auVar174._0_4_ = 1.0 / (float)local_5a0._0_4_;
        auVar174._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar173 = vshufps_avx(auVar174,auVar174,0);
        register0x00001210 = auVar173;
        _local_140 = auVar173;
        auVar173 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
        local_160._16_16_ = auVar173;
        local_160._0_16_ = auVar173;
        auVar173 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        local_180._16_16_ = auVar173;
        local_180._0_16_ = auVar173;
        auVar193 = ZEXT3264(local_180);
        lVar168 = 8;
        _local_7e0 = auVar356;
        do {
          pauVar9 = (undefined1 (*) [28])(bspline_basis0 + lVar168 * 4 + lVar164);
          fVar246 = *(float *)*pauVar9;
          fVar261 = *(float *)(*pauVar9 + 4);
          fVar260 = *(float *)(*pauVar9 + 8);
          fVar263 = *(float *)(*pauVar9 + 0xc);
          fVar243 = *(float *)(*pauVar9 + 0x10);
          fVar244 = *(float *)(*pauVar9 + 0x14);
          fVar262 = *(float *)(*pauVar9 + 0x18);
          auVar155 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar164 + 0x222bfac + lVar168 * 4);
          fVar309 = *(float *)*pauVar9;
          fVar264 = *(float *)(*pauVar9 + 4);
          fVar265 = *(float *)(*pauVar9 + 8);
          fVar266 = *(float *)(*pauVar9 + 0xc);
          fVar268 = *(float *)(*pauVar9 + 0x10);
          fVar281 = *(float *)(*pauVar9 + 0x14);
          fVar285 = *(float *)(*pauVar9 + 0x18);
          auVar154 = *pauVar9;
          pfVar1 = (float *)(lVar164 + 0x222c430 + lVar168 * 4);
          fVar306 = *pfVar1;
          fVar307 = pfVar1[1];
          fVar308 = pfVar1[2];
          fVar310 = pfVar1[3];
          fVar363 = pfVar1[4];
          fVar364 = pfVar1[5];
          fVar267 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar164 + 0x222c8b4 + lVar168 * 4);
          fVar288 = *(float *)*pauVar9;
          fVar291 = *(float *)(*pauVar9 + 4);
          fVar292 = *(float *)(*pauVar9 + 8);
          fVar293 = *(float *)(*pauVar9 + 0xc);
          fVar294 = *(float *)(*pauVar9 + 0x10);
          fVar304 = *(float *)(*pauVar9 + 0x14);
          fVar305 = *(float *)(*pauVar9 + 0x18);
          auVar153 = *pauVar9;
          fVar311 = auVar259._28_4_;
          fVar245 = fVar311 + auVar240._28_4_;
          fVar205 = fVar311 + fVar311 + auVar193._28_4_;
          auVar429._0_4_ =
               (float)local_2c0._0_4_ * fVar246 +
               (float)local_580._0_4_ * fVar309 +
               fVar306 * (float)local_4e0._0_4_ + (float)local_540._0_4_ * fVar288;
          auVar429._4_4_ =
               (float)local_2c0._4_4_ * fVar261 +
               (float)local_580._4_4_ * fVar264 +
               fVar307 * (float)local_4e0._4_4_ + (float)local_540._4_4_ * fVar291;
          auVar429._8_4_ =
               fStack_2b8 * fVar260 +
               fStack_578 * fVar265 + fVar308 * fStack_4d8 + fStack_538 * fVar292;
          auVar429._12_4_ =
               fStack_2b4 * fVar263 +
               fStack_574 * fVar266 + fVar310 * fStack_4d4 + fStack_534 * fVar293;
          auVar429._16_4_ =
               fStack_2b0 * fVar243 +
               fStack_570 * fVar268 + fVar363 * fStack_4d0 + fStack_530 * fVar294;
          auVar429._20_4_ =
               fStack_2ac * fVar244 +
               fStack_56c * fVar281 + fVar364 * fStack_4cc + fStack_52c * fVar304;
          auVar429._24_4_ =
               fStack_2a8 * fVar262 +
               fStack_568 * fVar285 + fVar267 * fStack_4c8 + fStack_528 * fVar305;
          auVar429._28_4_ = fVar245 + fVar205;
          local_8a0._0_4_ =
               (float)local_500._0_4_ * fVar309 +
               fVar306 * (float)local_5c0._0_4_ + (float)local_560._0_4_ * fVar288 +
               (float)local_320._0_4_ * fVar246;
          local_8a0._4_4_ =
               (float)local_500._4_4_ * fVar264 +
               fVar307 * (float)local_5c0._4_4_ + (float)local_560._4_4_ * fVar291 +
               (float)local_320._4_4_ * fVar261;
          local_8a0._8_4_ =
               fStack_4f8 * fVar265 + fVar308 * fStack_5b8 + fStack_558 * fVar292 +
               fStack_318 * fVar260;
          local_8a0._12_4_ =
               fStack_4f4 * fVar266 + fVar310 * fStack_5b4 + fStack_554 * fVar293 +
               fStack_314 * fVar263;
          local_8a0._16_4_ =
               fStack_4f0 * fVar268 + fVar363 * fStack_5b0 + fStack_550 * fVar294 +
               fStack_310 * fVar243;
          local_8a0._20_4_ =
               fStack_4ec * fVar281 + fVar364 * fStack_5ac + fStack_54c * fVar304 +
               fStack_30c * fVar244;
          local_8a0._24_4_ =
               fStack_4e8 * fVar285 + fVar267 * fStack_5a8 + fStack_548 * fVar305 +
               fStack_308 * fVar262;
          local_8a0._28_4_ = fVar311 + fVar311 + auVar335._28_4_ + fVar205;
          auVar259 = ZEXT3264(local_8a0);
          fVar171 = (float)local_c0._0_4_ * fVar246 +
                    (float)local_a0._0_4_ * fVar309 +
                    fVar306 * (float)local_2e0._0_4_ + fVar288 * (float)local_300._0_4_;
          fVar196 = (float)local_c0._4_4_ * fVar261 +
                    (float)local_a0._4_4_ * fVar264 +
                    fVar307 * (float)local_2e0._4_4_ + fVar291 * (float)local_300._4_4_;
          fVar199 = fStack_b8 * fVar260 +
                    fStack_98 * fVar265 + fVar308 * fStack_2d8 + fVar292 * fStack_2f8;
          fVar201 = fStack_b4 * fVar263 +
                    fStack_94 * fVar266 + fVar310 * fStack_2d4 + fVar293 * fStack_2f4;
          fVar202 = fStack_b0 * fVar243 +
                    fStack_90 * fVar268 + fVar363 * fStack_2d0 + fVar294 * fStack_2f0;
          fVar203 = fStack_ac * fVar244 +
                    fStack_8c * fVar281 + fVar364 * fStack_2cc + fVar304 * fStack_2ec;
          fVar204 = fStack_a8 * fVar262 +
                    fStack_88 * fVar285 + fVar267 * fStack_2c8 + fVar305 * fStack_2e8;
          fVar205 = fVar205 + fVar311 + fVar245;
          pauVar10 = (undefined1 (*) [32])(bspline_basis1 + lVar168 * 4 + lVar164);
          auVar156 = *(undefined1 (*) [28])*pauVar10;
          pfVar1 = (float *)(lVar164 + 0x222e3cc + lVar168 * 4);
          fVar245 = *pfVar1;
          fVar311 = pfVar1[1];
          fVar376 = pfVar1[2];
          fVar198 = pfVar1[3];
          fVar200 = pfVar1[4];
          fVar170 = pfVar1[5];
          fVar195 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar164 + 0x222e850 + lVar168 * 4);
          fVar261 = *(float *)*pauVar9;
          fVar260 = *(float *)(*pauVar9 + 4);
          fVar243 = *(float *)(*pauVar9 + 8);
          fVar244 = *(float *)(*pauVar9 + 0xc);
          fVar309 = *(float *)(*pauVar9 + 0x10);
          fVar264 = *(float *)(*pauVar9 + 0x14);
          fVar266 = *(float *)(*pauVar9 + 0x18);
          auVar157 = *pauVar9;
          pfVar1 = (float *)(lVar164 + 0x222ecd4 + lVar168 * 4);
          local_5e0 = *pfVar1;
          fStack_5dc = pfVar1[1];
          fStack_5d8 = pfVar1[2];
          fStack_5d4 = pfVar1[3];
          fStack_5d0 = pfVar1[4];
          fStack_5cc = pfVar1[5];
          fStack_5c8 = pfVar1[6];
          fStack_5c4 = pfVar1[7];
          fVar268 = fStack_5c4 + fStack_5c4 + *(float *)(*pauVar10 + 0x1c);
          auVar193 = ZEXT3264(*pauVar10);
          fVar246 = auVar156._0_4_;
          fVar263 = auVar156._4_4_;
          fVar262 = auVar156._8_4_;
          fVar265 = auVar156._12_4_;
          fVar281 = auVar156._16_4_;
          fVar291 = auVar156._20_4_;
          fVar294 = auVar156._24_4_;
          auVar318._0_4_ =
               (float)local_2c0._0_4_ * fVar246 +
               fVar245 * (float)local_580._0_4_ +
               fVar261 * (float)local_4e0._0_4_ + (float)local_540._0_4_ * local_5e0;
          auVar318._4_4_ =
               (float)local_2c0._4_4_ * fVar263 +
               fVar311 * (float)local_580._4_4_ +
               fVar260 * (float)local_4e0._4_4_ + (float)local_540._4_4_ * fStack_5dc;
          auVar318._8_4_ =
               fStack_2b8 * fVar262 +
               fVar376 * fStack_578 + fVar243 * fStack_4d8 + fStack_538 * fStack_5d8;
          auVar318._12_4_ =
               fStack_2b4 * fVar265 +
               fVar198 * fStack_574 + fVar244 * fStack_4d4 + fStack_534 * fStack_5d4;
          auVar318._16_4_ =
               fStack_2b0 * fVar281 +
               fVar200 * fStack_570 + fVar309 * fStack_4d0 + fStack_530 * fStack_5d0;
          auVar318._20_4_ =
               fStack_2ac * fVar291 +
               fVar170 * fStack_56c + fVar264 * fStack_4cc + fStack_52c * fStack_5cc;
          auVar318._24_4_ =
               fStack_2a8 * fVar294 +
               fVar195 * fStack_568 + fVar266 * fStack_4c8 + fStack_528 * fStack_5c8;
          auVar318._28_4_ = fStack_564 + fVar268;
          auVar302._0_4_ =
               (float)local_320._0_4_ * fVar246 +
               (float)local_500._0_4_ * fVar245 +
               (float)local_560._0_4_ * local_5e0 + fVar261 * (float)local_5c0._0_4_;
          auVar302._4_4_ =
               (float)local_320._4_4_ * fVar263 +
               (float)local_500._4_4_ * fVar311 +
               (float)local_560._4_4_ * fStack_5dc + fVar260 * (float)local_5c0._4_4_;
          auVar302._8_4_ =
               fStack_318 * fVar262 +
               fStack_4f8 * fVar376 + fStack_558 * fStack_5d8 + fVar243 * fStack_5b8;
          auVar302._12_4_ =
               fStack_314 * fVar265 +
               fStack_4f4 * fVar198 + fStack_554 * fStack_5d4 + fVar244 * fStack_5b4;
          auVar302._16_4_ =
               fStack_310 * fVar281 +
               fStack_4f0 * fVar200 + fStack_550 * fStack_5d0 + fVar309 * fStack_5b0;
          auVar302._20_4_ =
               fStack_30c * fVar291 +
               fStack_4ec * fVar170 + fStack_54c * fStack_5cc + fVar264 * fStack_5ac;
          auVar302._24_4_ =
               fStack_308 * fVar294 +
               fStack_4e8 * fVar195 + fStack_548 * fStack_5c8 + fVar266 * fStack_5a8;
          auVar302._28_4_ = fVar268 + fStack_5c4 + fStack_524 + fStack_5c4;
          auVar422._0_4_ =
               (float)local_a0._0_4_ * fVar245 +
               fVar261 * (float)local_2e0._0_4_ + local_5e0 * (float)local_300._0_4_ +
               (float)local_c0._0_4_ * fVar246;
          auVar422._4_4_ =
               (float)local_a0._4_4_ * fVar311 +
               fVar260 * (float)local_2e0._4_4_ + fStack_5dc * (float)local_300._4_4_ +
               (float)local_c0._4_4_ * fVar263;
          auVar422._8_4_ =
               fStack_98 * fVar376 + fVar243 * fStack_2d8 + fStack_5d8 * fStack_2f8 +
               fStack_b8 * fVar262;
          auVar422._12_4_ =
               fStack_94 * fVar198 + fVar244 * fStack_2d4 + fStack_5d4 * fStack_2f4 +
               fStack_b4 * fVar265;
          auVar422._16_4_ =
               fStack_90 * fVar200 + fVar309 * fStack_2d0 + fStack_5d0 * fStack_2f0 +
               fStack_b0 * fVar281;
          auVar422._20_4_ =
               fStack_8c * fVar170 + fVar264 * fStack_2cc + fStack_5cc * fStack_2ec +
               fStack_ac * fVar291;
          auVar422._24_4_ =
               fStack_88 * fVar195 + fVar266 * fStack_2c8 + fStack_5c8 * fStack_2e8 +
               fStack_a8 * fVar294;
          auVar422._28_4_ = fStack_5c4 + fStack_5c4 + fStack_544 + fVar268;
          auVar186 = vsubps_avx(auVar318,auVar429);
          auVar335 = ZEXT3264(auVar186);
          local_340 = vsubps_avx(auVar302,local_8a0);
          fVar261 = auVar186._0_4_;
          fVar243 = auVar186._4_4_;
          auVar85._4_4_ = local_8a0._4_4_ * fVar243;
          auVar85._0_4_ = local_8a0._0_4_ * fVar261;
          fVar309 = auVar186._8_4_;
          auVar85._8_4_ = local_8a0._8_4_ * fVar309;
          fVar266 = auVar186._12_4_;
          auVar85._12_4_ = local_8a0._12_4_ * fVar266;
          fVar285 = auVar186._16_4_;
          auVar85._16_4_ = local_8a0._16_4_ * fVar285;
          fVar292 = auVar186._20_4_;
          auVar85._20_4_ = local_8a0._20_4_ * fVar292;
          fVar304 = auVar186._24_4_;
          auVar85._24_4_ = local_8a0._24_4_ * fVar304;
          auVar85._28_4_ = fVar268;
          fVar260 = local_340._0_4_;
          fVar244 = local_340._4_4_;
          auVar86._4_4_ = auVar429._4_4_ * fVar244;
          auVar86._0_4_ = auVar429._0_4_ * fVar260;
          fVar264 = local_340._8_4_;
          auVar86._8_4_ = auVar429._8_4_ * fVar264;
          fVar268 = local_340._12_4_;
          auVar86._12_4_ = auVar429._12_4_ * fVar268;
          fVar288 = local_340._16_4_;
          auVar86._16_4_ = auVar429._16_4_ * fVar288;
          fVar293 = local_340._20_4_;
          auVar86._20_4_ = auVar429._20_4_ * fVar293;
          fVar305 = local_340._24_4_;
          auVar86._24_4_ = auVar429._24_4_ * fVar305;
          auVar86._28_4_ = auVar302._28_4_;
          auVar38 = vsubps_avx(auVar85,auVar86);
          auVar139._4_4_ = fVar196;
          auVar139._0_4_ = fVar171;
          auVar139._8_4_ = fVar199;
          auVar139._12_4_ = fVar201;
          auVar139._16_4_ = fVar202;
          auVar139._20_4_ = fVar203;
          auVar139._24_4_ = fVar204;
          auVar139._28_4_ = fVar205;
          auVar175 = vmaxps_avx(auVar139,auVar422);
          auVar87._4_4_ = auVar175._4_4_ * auVar175._4_4_ * (fVar243 * fVar243 + fVar244 * fVar244);
          auVar87._0_4_ = auVar175._0_4_ * auVar175._0_4_ * (fVar261 * fVar261 + fVar260 * fVar260);
          auVar87._8_4_ = auVar175._8_4_ * auVar175._8_4_ * (fVar309 * fVar309 + fVar264 * fVar264);
          auVar87._12_4_ =
               auVar175._12_4_ * auVar175._12_4_ * (fVar266 * fVar266 + fVar268 * fVar268);
          auVar87._16_4_ =
               auVar175._16_4_ * auVar175._16_4_ * (fVar285 * fVar285 + fVar288 * fVar288);
          auVar87._20_4_ =
               auVar175._20_4_ * auVar175._20_4_ * (fVar292 * fVar292 + fVar293 * fVar293);
          auVar87._24_4_ =
               auVar175._24_4_ * auVar175._24_4_ * (fVar304 * fVar304 + fVar305 * fVar305);
          auVar87._28_4_ = auVar318._28_4_ + auVar302._28_4_;
          auVar88._4_4_ = auVar38._4_4_ * auVar38._4_4_;
          auVar88._0_4_ = auVar38._0_4_ * auVar38._0_4_;
          auVar88._8_4_ = auVar38._8_4_ * auVar38._8_4_;
          auVar88._12_4_ = auVar38._12_4_ * auVar38._12_4_;
          auVar88._16_4_ = auVar38._16_4_ * auVar38._16_4_;
          auVar88._20_4_ = auVar38._20_4_ * auVar38._20_4_;
          auVar88._24_4_ = auVar38._24_4_ * auVar38._24_4_;
          auVar88._28_4_ = auVar38._28_4_;
          auVar175 = vcmpps_avx(auVar88,auVar87,2);
          local_460 = (uint)lVar168;
          auVar230 = vpshufd_avx(ZEXT416(local_460),0);
          auVar173 = vpor_avx(auVar230,_DAT_01ff0cf0);
          auVar230 = vpor_avx(auVar230,_DAT_02020ea0);
          auVar150._4_4_ = fStack_5fc;
          auVar150._0_4_ = local_600;
          auVar150._8_4_ = fStack_5f8;
          auVar150._12_4_ = fStack_5f4;
          auVar173 = vpcmpgtd_avx(auVar150,auVar173);
          auVar230 = vpcmpgtd_avx(auVar150,auVar230);
          auVar238._16_16_ = auVar230;
          auVar238._0_16_ = auVar173;
          auVar240 = ZEXT3264(auVar238);
          auVar38 = auVar238 & auVar175;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            local_880._0_4_ = auVar157._0_4_;
            local_880._4_4_ = auVar157._4_4_;
            uStack_878._0_4_ = auVar157._8_4_;
            uStack_878._4_4_ = auVar157._12_4_;
            uStack_870._0_4_ = auVar157._16_4_;
            uStack_870._4_4_ = auVar157._20_4_;
            uStack_868._0_4_ = auVar157._24_4_;
            local_880._0_4_ =
                 fVar246 * (float)local_7e0._0_4_ +
                 fVar245 * (float)local_520._0_4_ +
                 (float)local_e0._0_4_ * (float)local_880._0_4_ + (float)local_700._0_4_ * local_5e0
            ;
            local_880._4_4_ =
                 fVar263 * (float)local_7e0._4_4_ +
                 fVar311 * (float)local_520._4_4_ +
                 (float)local_e0._4_4_ * (float)local_880._4_4_ +
                 (float)local_700._4_4_ * fStack_5dc;
            uStack_878._0_4_ =
                 fVar262 * fStack_7d8 +
                 fVar376 * fStack_518 + fStack_d8 * (float)uStack_878 + fStack_6f8 * fStack_5d8;
            uStack_878._4_4_ =
                 fVar265 * fStack_7d4 +
                 fVar198 * fStack_514 + fStack_d4 * uStack_878._4_4_ + fStack_6f4 * fStack_5d4;
            uStack_870._0_4_ =
                 fVar281 * fStack_7d0 +
                 fVar200 * fStack_510 + fStack_d0 * (float)uStack_870 + fStack_6f0 * fStack_5d0;
            uStack_870._4_4_ =
                 fVar291 * fStack_7cc +
                 fVar170 * fStack_50c + fStack_cc * uStack_870._4_4_ + fStack_6ec * fStack_5cc;
            uStack_868._0_4_ =
                 fVar294 * fStack_7c8 +
                 fVar195 * fStack_508 + fStack_c8 * (float)uStack_868 + fStack_6e8 * fStack_5c8;
            uStack_868._4_4_ = local_340._28_4_ + *(float *)(*pauVar10 + 0x1c) + fStack_4e4 + 0.0;
            local_760._0_4_ = auVar154._0_4_;
            local_760._4_4_ = auVar154._4_4_;
            auStack_758._0_4_ = auVar154._8_4_;
            auStack_758._4_4_ = auVar154._12_4_;
            auStack_750._0_4_ = auVar154._16_4_;
            auStack_750._4_4_ = auVar154._20_4_;
            fStack_748 = auVar154._24_4_;
            local_860._0_4_ = auVar153._0_4_;
            local_860._4_4_ = auVar153._4_4_;
            uStack_858._0_4_ = auVar153._8_4_;
            uStack_858._4_4_ = auVar153._12_4_;
            fStack_850 = auVar153._16_4_;
            fStack_84c = auVar153._20_4_;
            fStack_848 = auVar153._24_4_;
            fVar312 = (float)local_700._0_4_ * (float)local_860._0_4_;
            fVar320 = (float)local_700._4_4_ * (float)local_860._4_4_;
            fVar321 = fStack_6f8 * (float)uStack_858;
            fVar322 = fStack_6f4 * uStack_858._4_4_;
            fVar323 = fStack_6f0 * fStack_850;
            fVar324 = fStack_6ec * fStack_84c;
            fVar325 = fStack_6e8 * fStack_848;
            pfVar1 = (float *)(lVar164 + 0x222d640 + lVar168 * 4);
            fVar246 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar260 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar243 = pfVar1[4];
            fVar244 = pfVar1[5];
            fVar262 = pfVar1[6];
            pfVar2 = (float *)(lVar164 + 0x222dac4 + lVar168 * 4);
            fVar309 = *pfVar2;
            fVar264 = pfVar2[1];
            fVar265 = pfVar2[2];
            fVar266 = pfVar2[3];
            fVar268 = pfVar2[4];
            fVar281 = pfVar2[5];
            fVar285 = pfVar2[6];
            pfVar3 = (float *)(lVar164 + 0x222d1bc + lVar168 * 4);
            fVar288 = *pfVar3;
            fVar291 = pfVar3[1];
            fVar292 = pfVar3[2];
            fVar293 = pfVar3[3];
            fVar294 = pfVar3[4];
            fVar304 = pfVar3[5];
            fVar305 = pfVar3[6];
            fVar206 = pfVar1[7] + pfVar2[7];
            fVar225 = pfVar2[7] + auVar422._28_4_ + 0.0;
            fVar326 = auVar422._28_4_ + fStack_304 + auVar422._28_4_ + 0.0;
            pfVar1 = (float *)(lVar164 + 0x222cd38 + lVar168 * 4);
            fVar245 = *pfVar1;
            fVar311 = pfVar1[1];
            fVar376 = pfVar1[2];
            fVar198 = pfVar1[3];
            fVar200 = pfVar1[4];
            fVar170 = pfVar1[5];
            fVar195 = pfVar1[6];
            local_860._4_4_ =
                 fVar311 * (float)local_2c0._4_4_ +
                 (float)local_580._4_4_ * fVar291 +
                 (float)local_4e0._4_4_ * fVar261 + (float)local_540._4_4_ * fVar264;
            local_860._0_4_ =
                 fVar245 * (float)local_2c0._0_4_ +
                 (float)local_580._0_4_ * fVar288 +
                 (float)local_4e0._0_4_ * fVar246 + (float)local_540._0_4_ * fVar309;
            uStack_858._0_4_ =
                 fVar376 * fStack_2b8 +
                 fStack_578 * fVar292 + fStack_4d8 * fVar260 + fStack_538 * fVar265;
            uStack_858._4_4_ =
                 fVar198 * fStack_2b4 +
                 fStack_574 * fVar293 + fStack_4d4 * fVar263 + fStack_534 * fVar266;
            fStack_850 = fVar200 * fStack_2b0 +
                         fStack_570 * fVar294 + fStack_4d0 * fVar243 + fStack_530 * fVar268;
            fStack_84c = fVar170 * fStack_2ac +
                         fStack_56c * fVar304 + fStack_4cc * fVar244 + fStack_52c * fVar281;
            fStack_848 = fVar195 * fStack_2a8 +
                         fStack_568 * fVar305 + fStack_4c8 * fVar262 + fStack_528 * fVar285;
            fStack_844 = fVar206 + fVar225;
            auVar216._0_4_ =
                 fVar245 * (float)local_320._0_4_ +
                 (float)local_5c0._0_4_ * fVar246 + (float)local_560._0_4_ * fVar309 +
                 (float)local_500._0_4_ * fVar288;
            auVar216._4_4_ =
                 fVar311 * (float)local_320._4_4_ +
                 (float)local_5c0._4_4_ * fVar261 + (float)local_560._4_4_ * fVar264 +
                 (float)local_500._4_4_ * fVar291;
            auVar216._8_4_ =
                 fVar376 * fStack_318 +
                 fStack_5b8 * fVar260 + fStack_558 * fVar265 + fStack_4f8 * fVar292;
            auVar216._12_4_ =
                 fVar198 * fStack_314 +
                 fStack_5b4 * fVar263 + fStack_554 * fVar266 + fStack_4f4 * fVar293;
            auVar216._16_4_ =
                 fVar200 * fStack_310 +
                 fStack_5b0 * fVar243 + fStack_550 * fVar268 + fStack_4f0 * fVar294;
            auVar216._20_4_ =
                 fVar170 * fStack_30c +
                 fStack_5ac * fVar244 + fStack_54c * fVar281 + fStack_4ec * fVar304;
            auVar216._24_4_ =
                 fVar195 * fStack_308 +
                 fStack_5a8 * fVar262 + fStack_548 * fVar285 + fStack_4e8 * fVar305;
            auVar216._28_4_ = fVar225 + fVar326;
            auVar409._0_4_ =
                 (float)local_520._0_4_ * fVar288 +
                 (float)local_e0._0_4_ * fVar246 + (float)local_700._0_4_ * fVar309 +
                 fVar245 * (float)local_7e0._0_4_;
            auVar409._4_4_ =
                 (float)local_520._4_4_ * fVar291 +
                 (float)local_e0._4_4_ * fVar261 + (float)local_700._4_4_ * fVar264 +
                 fVar311 * (float)local_7e0._4_4_;
            auVar409._8_4_ =
                 fStack_518 * fVar292 + fStack_d8 * fVar260 + fStack_6f8 * fVar265 +
                 fVar376 * fStack_7d8;
            auVar409._12_4_ =
                 fStack_514 * fVar293 + fStack_d4 * fVar263 + fStack_6f4 * fVar266 +
                 fVar198 * fStack_7d4;
            auVar409._16_4_ =
                 fStack_510 * fVar294 + fStack_d0 * fVar243 + fStack_6f0 * fVar268 +
                 fVar200 * fStack_7d0;
            auVar409._20_4_ =
                 fStack_50c * fVar304 + fStack_cc * fVar244 + fStack_6ec * fVar281 +
                 fVar170 * fStack_7cc;
            auVar409._24_4_ =
                 fStack_508 * fVar305 + fStack_c8 * fVar262 + fStack_6e8 * fVar285 +
                 fVar195 * fStack_7c8;
            auVar409._28_4_ = pfVar3[7] + fVar206 + fVar326;
            pfVar1 = (float *)(lVar164 + 0x222fa60 + lVar168 * 4);
            fVar246 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar260 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar243 = pfVar1[4];
            fVar244 = pfVar1[5];
            fVar262 = pfVar1[6];
            pfVar2 = (float *)(lVar164 + 0x222fee4 + lVar168 * 4);
            fVar309 = *pfVar2;
            fVar264 = pfVar2[1];
            fVar265 = pfVar2[2];
            fVar266 = pfVar2[3];
            fVar268 = pfVar2[4];
            fVar281 = pfVar2[5];
            fVar285 = pfVar2[6];
            pfVar3 = (float *)(lVar164 + 0x222f5dc + lVar168 * 4);
            fVar288 = *pfVar3;
            fVar291 = pfVar3[1];
            fVar292 = pfVar3[2];
            fVar293 = pfVar3[3];
            fVar294 = pfVar3[4];
            fVar304 = pfVar3[5];
            fVar305 = pfVar3[6];
            pfVar4 = (float *)(lVar164 + 0x222f158 + lVar168 * 4);
            fVar245 = *pfVar4;
            fVar311 = pfVar4[1];
            fVar376 = pfVar4[2];
            fVar198 = pfVar4[3];
            fVar200 = pfVar4[4];
            fVar170 = pfVar4[5];
            fVar195 = pfVar4[6];
            auVar372._0_4_ =
                 fVar245 * (float)local_2c0._0_4_ +
                 fVar288 * (float)local_580._0_4_ +
                 (float)local_4e0._0_4_ * fVar246 + (float)local_540._0_4_ * fVar309;
            auVar372._4_4_ =
                 fVar311 * (float)local_2c0._4_4_ +
                 fVar291 * (float)local_580._4_4_ +
                 (float)local_4e0._4_4_ * fVar261 + (float)local_540._4_4_ * fVar264;
            auVar372._8_4_ =
                 fVar376 * fStack_2b8 +
                 fVar292 * fStack_578 + fStack_4d8 * fVar260 + fStack_538 * fVar265;
            auVar372._12_4_ =
                 fVar198 * fStack_2b4 +
                 fVar293 * fStack_574 + fStack_4d4 * fVar263 + fStack_534 * fVar266;
            auVar372._16_4_ =
                 fVar200 * fStack_2b0 +
                 fVar294 * fStack_570 + fStack_4d0 * fVar243 + fStack_530 * fVar268;
            auVar372._20_4_ =
                 fVar170 * fStack_2ac +
                 fVar304 * fStack_56c + fStack_4cc * fVar244 + fStack_52c * fVar281;
            auVar372._24_4_ =
                 fVar195 * fStack_2a8 +
                 fVar305 * fStack_568 + fStack_4c8 * fVar262 + fStack_528 * fVar285;
            auVar372._28_4_ = fStack_4e4 + fStack_4e4 + fStack_4c4 + fStack_4e4;
            auVar402._0_4_ =
                 fVar245 * (float)local_320._0_4_ +
                 fVar288 * (float)local_500._0_4_ +
                 (float)local_5c0._0_4_ * fVar246 + fVar309 * (float)local_560._0_4_;
            auVar402._4_4_ =
                 fVar311 * (float)local_320._4_4_ +
                 fVar291 * (float)local_500._4_4_ +
                 (float)local_5c0._4_4_ * fVar261 + fVar264 * (float)local_560._4_4_;
            auVar402._8_4_ =
                 fVar376 * fStack_318 +
                 fVar292 * fStack_4f8 + fStack_5b8 * fVar260 + fVar265 * fStack_558;
            auVar402._12_4_ =
                 fVar198 * fStack_314 +
                 fVar293 * fStack_4f4 + fStack_5b4 * fVar263 + fVar266 * fStack_554;
            auVar402._16_4_ =
                 fVar200 * fStack_310 +
                 fVar294 * fStack_4f0 + fStack_5b0 * fVar243 + fVar268 * fStack_550;
            auVar402._20_4_ =
                 fVar170 * fStack_30c +
                 fVar304 * fStack_4ec + fStack_5ac * fVar244 + fVar281 * fStack_54c;
            auVar402._24_4_ =
                 fVar195 * fStack_308 +
                 fVar305 * fStack_4e8 + fStack_5a8 * fVar262 + fVar285 * fStack_548;
            auVar402._28_4_ = fStack_4e4 + fStack_4e4 + fStack_5a4 + fStack_4e4;
            auVar303._8_4_ = 0x7fffffff;
            auVar303._0_8_ = 0x7fffffff7fffffff;
            auVar303._12_4_ = 0x7fffffff;
            auVar303._16_4_ = 0x7fffffff;
            auVar303._20_4_ = 0x7fffffff;
            auVar303._24_4_ = 0x7fffffff;
            auVar303._28_4_ = 0x7fffffff;
            auVar38 = vandps_avx(_local_860,auVar303);
            auVar39 = vandps_avx(auVar216,auVar303);
            auVar39 = vmaxps_avx(auVar38,auVar39);
            auVar38 = vandps_avx(auVar409,auVar303);
            auVar39 = vmaxps_avx(auVar39,auVar38);
            auVar39 = vcmpps_avx(auVar39,local_100,1);
            auVar40 = vblendvps_avx(_local_860,auVar186,auVar39);
            auVar183._0_4_ =
                 fVar245 * (float)local_7e0._0_4_ +
                 (float)local_520._0_4_ * fVar288 +
                 (float)local_700._0_4_ * fVar309 + (float)local_e0._0_4_ * fVar246;
            auVar183._4_4_ =
                 fVar311 * (float)local_7e0._4_4_ +
                 (float)local_520._4_4_ * fVar291 +
                 (float)local_700._4_4_ * fVar264 + (float)local_e0._4_4_ * fVar261;
            auVar183._8_4_ =
                 fVar376 * fStack_7d8 +
                 fStack_518 * fVar292 + fStack_6f8 * fVar265 + fStack_d8 * fVar260;
            auVar183._12_4_ =
                 fVar198 * fStack_7d4 +
                 fStack_514 * fVar293 + fStack_6f4 * fVar266 + fStack_d4 * fVar263;
            auVar183._16_4_ =
                 fVar200 * fStack_7d0 +
                 fStack_510 * fVar294 + fStack_6f0 * fVar268 + fStack_d0 * fVar243;
            auVar183._20_4_ =
                 fVar170 * fStack_7cc +
                 fStack_50c * fVar304 + fStack_6ec * fVar281 + fStack_cc * fVar244;
            auVar183._24_4_ =
                 fVar195 * fStack_7c8 +
                 fStack_508 * fVar305 + fStack_6e8 * fVar285 + fStack_c8 * fVar262;
            auVar183._28_4_ = auVar38._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar371 = vblendvps_avx(auVar216,local_340,auVar39);
            auVar38 = vandps_avx(auVar372,auVar303);
            auVar39 = vandps_avx(auVar402,auVar303);
            auVar39 = vmaxps_avx(auVar38,auVar39);
            auVar38 = vandps_avx(auVar183,auVar303);
            auVar38 = vmaxps_avx(auVar39,auVar38);
            local_820._0_4_ = auVar155._0_4_;
            local_820._4_4_ = auVar155._4_4_;
            uStack_818._0_4_ = auVar155._8_4_;
            uStack_818._4_4_ = auVar155._12_4_;
            uStack_810._0_4_ = auVar155._16_4_;
            uStack_810._4_4_ = auVar155._20_4_;
            uStack_808._0_4_ = auVar155._24_4_;
            auVar38 = vcmpps_avx(auVar38,local_100,1);
            auVar186 = vblendvps_avx(auVar372,auVar186,auVar38);
            auVar184._0_4_ =
                 (float)local_7e0._0_4_ * (float)local_820._0_4_ +
                 (float)local_520._0_4_ * (float)local_760 +
                 (float)local_e0._0_4_ * fVar306 + fVar312;
            auVar184._4_4_ =
                 (float)local_7e0._4_4_ * (float)local_820._4_4_ +
                 (float)local_520._4_4_ * local_760._4_4_ +
                 (float)local_e0._4_4_ * fVar307 + fVar320;
            auVar184._8_4_ =
                 fStack_7d8 * (float)uStack_818 +
                 fStack_518 * (float)auStack_758._0_4_ + fStack_d8 * fVar308 + fVar321;
            auVar184._12_4_ =
                 fStack_7d4 * uStack_818._4_4_ +
                 fStack_514 * (float)auStack_758._4_4_ + fStack_d4 * fVar310 + fVar322;
            auVar184._16_4_ =
                 fStack_7d0 * (float)uStack_810 +
                 fStack_510 * (float)auStack_750._0_4_ + fStack_d0 * fVar363 + fVar323;
            auVar184._20_4_ =
                 fStack_7cc * uStack_810._4_4_ +
                 fStack_50c * (float)auStack_750._4_4_ + fStack_cc * fVar364 + fVar324;
            auVar184._24_4_ =
                 fStack_7c8 * (float)uStack_808 +
                 fStack_508 * fStack_748 + fStack_c8 * fVar267 + fVar325;
            auVar184._28_4_ = auVar39._28_4_ + uStack_868._4_4_ + fStack_4e4 + 0.0;
            auVar38 = vblendvps_avx(auVar402,local_340,auVar38);
            fVar206 = auVar40._0_4_;
            fVar225 = auVar40._4_4_;
            fVar312 = auVar40._8_4_;
            fVar320 = auVar40._12_4_;
            fVar321 = auVar40._16_4_;
            fVar322 = auVar40._20_4_;
            fVar323 = auVar40._24_4_;
            fVar324 = auVar40._28_4_;
            fVar288 = auVar186._0_4_;
            fVar292 = auVar186._4_4_;
            fVar294 = auVar186._8_4_;
            fVar305 = auVar186._12_4_;
            fVar307 = auVar186._16_4_;
            fVar310 = auVar186._20_4_;
            fVar364 = auVar186._24_4_;
            fVar246 = auVar371._0_4_;
            fVar260 = auVar371._4_4_;
            fVar243 = auVar371._8_4_;
            fVar262 = auVar371._12_4_;
            fVar264 = auVar371._16_4_;
            fVar266 = auVar371._20_4_;
            fVar281 = auVar371._24_4_;
            auVar382._0_4_ = fVar246 * fVar246 + fVar206 * fVar206;
            auVar382._4_4_ = fVar260 * fVar260 + fVar225 * fVar225;
            auVar382._8_4_ = fVar243 * fVar243 + fVar312 * fVar312;
            auVar382._12_4_ = fVar262 * fVar262 + fVar320 * fVar320;
            auVar382._16_4_ = fVar264 * fVar264 + fVar321 * fVar321;
            auVar382._20_4_ = fVar266 * fVar266 + fVar322 * fVar322;
            auVar382._24_4_ = fVar281 * fVar281 + fVar323 * fVar323;
            auVar382._28_4_ = fStack_6e4 + local_340._28_4_;
            auVar39 = vrsqrtps_avx(auVar382);
            fVar261 = auVar39._0_4_;
            fVar263 = auVar39._4_4_;
            auVar89._4_4_ = fVar263 * 1.5;
            auVar89._0_4_ = fVar261 * 1.5;
            fVar244 = auVar39._8_4_;
            auVar89._8_4_ = fVar244 * 1.5;
            fVar309 = auVar39._12_4_;
            auVar89._12_4_ = fVar309 * 1.5;
            fVar265 = auVar39._16_4_;
            auVar89._16_4_ = fVar265 * 1.5;
            fVar268 = auVar39._20_4_;
            auVar89._20_4_ = fVar268 * 1.5;
            fVar285 = auVar39._24_4_;
            auVar89._24_4_ = fVar285 * 1.5;
            auVar89._28_4_ = auVar402._28_4_;
            auVar90._4_4_ = fVar263 * fVar263 * fVar263 * auVar382._4_4_ * 0.5;
            auVar90._0_4_ = fVar261 * fVar261 * fVar261 * auVar382._0_4_ * 0.5;
            auVar90._8_4_ = fVar244 * fVar244 * fVar244 * auVar382._8_4_ * 0.5;
            auVar90._12_4_ = fVar309 * fVar309 * fVar309 * auVar382._12_4_ * 0.5;
            auVar90._16_4_ = fVar265 * fVar265 * fVar265 * auVar382._16_4_ * 0.5;
            auVar90._20_4_ = fVar268 * fVar268 * fVar268 * auVar382._20_4_ * 0.5;
            auVar90._24_4_ = fVar285 * fVar285 * fVar285 * auVar382._24_4_ * 0.5;
            auVar90._28_4_ = auVar382._28_4_;
            auVar40 = vsubps_avx(auVar89,auVar90);
            fVar245 = auVar40._0_4_;
            fVar311 = auVar40._4_4_;
            fVar376 = auVar40._8_4_;
            fVar198 = auVar40._12_4_;
            fVar200 = auVar40._16_4_;
            fVar170 = auVar40._20_4_;
            fVar195 = auVar40._24_4_;
            fVar261 = auVar38._0_4_;
            fVar263 = auVar38._4_4_;
            fVar244 = auVar38._8_4_;
            fVar309 = auVar38._12_4_;
            fVar265 = auVar38._16_4_;
            fVar268 = auVar38._20_4_;
            fVar285 = auVar38._24_4_;
            auVar358._0_4_ = fVar261 * fVar261 + fVar288 * fVar288;
            auVar358._4_4_ = fVar263 * fVar263 + fVar292 * fVar292;
            auVar358._8_4_ = fVar244 * fVar244 + fVar294 * fVar294;
            auVar358._12_4_ = fVar309 * fVar309 + fVar305 * fVar305;
            auVar358._16_4_ = fVar265 * fVar265 + fVar307 * fVar307;
            auVar358._20_4_ = fVar268 * fVar268 + fVar310 * fVar310;
            auVar358._24_4_ = fVar285 * fVar285 + fVar364 * fVar364;
            auVar358._28_4_ = auVar39._28_4_ + auVar186._28_4_;
            auVar186 = vrsqrtps_avx(auVar358);
            fVar291 = auVar186._0_4_;
            fVar293 = auVar186._4_4_;
            auVar91._4_4_ = fVar293 * 1.5;
            auVar91._0_4_ = fVar291 * 1.5;
            fVar304 = auVar186._8_4_;
            auVar91._8_4_ = fVar304 * 1.5;
            fVar306 = auVar186._12_4_;
            auVar91._12_4_ = fVar306 * 1.5;
            fVar308 = auVar186._16_4_;
            auVar91._16_4_ = fVar308 * 1.5;
            fVar363 = auVar186._20_4_;
            auVar91._20_4_ = fVar363 * 1.5;
            fVar267 = auVar186._24_4_;
            auVar91._24_4_ = fVar267 * 1.5;
            auVar91._28_4_ = auVar402._28_4_;
            auVar92._4_4_ = fVar293 * fVar293 * fVar293 * auVar358._4_4_ * 0.5;
            auVar92._0_4_ = fVar291 * fVar291 * fVar291 * auVar358._0_4_ * 0.5;
            auVar92._8_4_ = fVar304 * fVar304 * fVar304 * auVar358._8_4_ * 0.5;
            auVar92._12_4_ = fVar306 * fVar306 * fVar306 * auVar358._12_4_ * 0.5;
            auVar92._16_4_ = fVar308 * fVar308 * fVar308 * auVar358._16_4_ * 0.5;
            auVar92._20_4_ = fVar363 * fVar363 * fVar363 * auVar358._20_4_ * 0.5;
            auVar92._24_4_ = fVar267 * fVar267 * fVar267 * auVar358._24_4_ * 0.5;
            auVar92._28_4_ = auVar358._28_4_;
            auVar38 = vsubps_avx(auVar91,auVar92);
            fVar291 = auVar38._0_4_;
            fVar293 = auVar38._4_4_;
            fVar304 = auVar38._8_4_;
            fVar306 = auVar38._12_4_;
            fVar308 = auVar38._16_4_;
            fVar363 = auVar38._20_4_;
            fVar267 = auVar38._24_4_;
            fVar246 = fVar171 * fVar245 * fVar246;
            fVar260 = fVar196 * fVar311 * fVar260;
            auVar93._4_4_ = fVar260;
            auVar93._0_4_ = fVar246;
            fVar243 = fVar199 * fVar376 * fVar243;
            auVar93._8_4_ = fVar243;
            fVar262 = fVar201 * fVar198 * fVar262;
            auVar93._12_4_ = fVar262;
            fVar264 = fVar202 * fVar200 * fVar264;
            auVar93._16_4_ = fVar264;
            fVar266 = fVar203 * fVar170 * fVar266;
            auVar93._20_4_ = fVar266;
            fVar281 = fVar204 * fVar195 * fVar281;
            auVar93._24_4_ = fVar281;
            auVar93._28_4_ = auVar186._28_4_;
            local_820._4_4_ = fVar260 + auVar429._4_4_;
            local_820._0_4_ = fVar246 + auVar429._0_4_;
            uStack_818._0_4_ = fVar243 + auVar429._8_4_;
            uStack_818._4_4_ = fVar262 + auVar429._12_4_;
            uStack_810._0_4_ = fVar264 + auVar429._16_4_;
            uStack_810._4_4_ = fVar266 + auVar429._20_4_;
            uStack_808._0_4_ = fVar281 + auVar429._24_4_;
            uStack_808._4_4_ = auVar186._28_4_ + auVar429._28_4_;
            local_840 = fVar171 * fVar245 * -fVar206;
            fStack_83c = fVar196 * fVar311 * -fVar225;
            auVar94._4_4_ = fStack_83c;
            auVar94._0_4_ = local_840;
            fStack_838 = fVar199 * fVar376 * -fVar312;
            auVar94._8_4_ = fStack_838;
            fStack_834 = fVar201 * fVar198 * -fVar320;
            auVar94._12_4_ = fStack_834;
            fStack_830 = fVar202 * fVar200 * -fVar321;
            auVar94._16_4_ = fStack_830;
            fStack_82c = fVar203 * fVar170 * -fVar322;
            auVar94._20_4_ = fStack_82c;
            fStack_828 = fVar204 * fVar195 * -fVar323;
            auVar94._24_4_ = fStack_828;
            auVar94._28_4_ = -fVar324;
            local_840 = local_8a0._0_4_ + local_840;
            fStack_83c = local_8a0._4_4_ + fStack_83c;
            fStack_838 = local_8a0._8_4_ + fStack_838;
            fStack_834 = local_8a0._12_4_ + fStack_834;
            fStack_830 = local_8a0._16_4_ + fStack_830;
            fStack_82c = local_8a0._20_4_ + fStack_82c;
            fStack_828 = local_8a0._24_4_ + fStack_828;
            fStack_824 = local_8a0._28_4_ + -fVar324;
            fVar246 = fVar245 * 0.0 * fVar171;
            fVar260 = fVar311 * 0.0 * fVar196;
            auVar95._4_4_ = fVar260;
            auVar95._0_4_ = fVar246;
            fVar243 = fVar376 * 0.0 * fVar199;
            auVar95._8_4_ = fVar243;
            fVar262 = fVar198 * 0.0 * fVar201;
            auVar95._12_4_ = fVar262;
            fVar264 = fVar200 * 0.0 * fVar202;
            auVar95._16_4_ = fVar264;
            fVar266 = fVar170 * 0.0 * fVar203;
            auVar95._20_4_ = fVar266;
            fVar281 = fVar195 * 0.0 * fVar204;
            auVar95._24_4_ = fVar281;
            auVar95._28_4_ = fVar324;
            auVar41 = vsubps_avx(auVar429,auVar93);
            auVar430._0_4_ = fVar246 + auVar184._0_4_;
            auVar430._4_4_ = fVar260 + auVar184._4_4_;
            auVar430._8_4_ = fVar243 + auVar184._8_4_;
            auVar430._12_4_ = fVar262 + auVar184._12_4_;
            auVar430._16_4_ = fVar264 + auVar184._16_4_;
            auVar430._20_4_ = fVar266 + auVar184._20_4_;
            auVar430._24_4_ = fVar281 + auVar184._24_4_;
            auVar430._28_4_ = fVar324 + auVar184._28_4_;
            fVar246 = auVar422._0_4_ * fVar291 * fVar261;
            fVar261 = auVar422._4_4_ * fVar293 * fVar263;
            auVar96._4_4_ = fVar261;
            auVar96._0_4_ = fVar246;
            fVar260 = auVar422._8_4_ * fVar304 * fVar244;
            auVar96._8_4_ = fVar260;
            fVar263 = auVar422._12_4_ * fVar306 * fVar309;
            auVar96._12_4_ = fVar263;
            fVar243 = auVar422._16_4_ * fVar308 * fVar265;
            auVar96._16_4_ = fVar243;
            fVar244 = auVar422._20_4_ * fVar363 * fVar268;
            auVar96._20_4_ = fVar244;
            fVar262 = auVar422._24_4_ * fVar267 * fVar285;
            auVar96._24_4_ = fVar262;
            auVar96._28_4_ = fVar205;
            auVar43 = vsubps_avx(local_8a0,auVar94);
            auVar410._0_4_ = auVar318._0_4_ + fVar246;
            auVar410._4_4_ = auVar318._4_4_ + fVar261;
            auVar410._8_4_ = auVar318._8_4_ + fVar260;
            auVar410._12_4_ = auVar318._12_4_ + fVar263;
            auVar410._16_4_ = auVar318._16_4_ + fVar243;
            auVar410._20_4_ = auVar318._20_4_ + fVar244;
            auVar410._24_4_ = auVar318._24_4_ + fVar262;
            auVar410._28_4_ = auVar318._28_4_ + fVar205;
            fVar246 = fVar291 * -fVar288 * auVar422._0_4_;
            fVar261 = fVar293 * -fVar292 * auVar422._4_4_;
            auVar97._4_4_ = fVar261;
            auVar97._0_4_ = fVar246;
            fVar260 = fVar304 * -fVar294 * auVar422._8_4_;
            auVar97._8_4_ = fVar260;
            fVar263 = fVar306 * -fVar305 * auVar422._12_4_;
            auVar97._12_4_ = fVar263;
            fVar243 = fVar308 * -fVar307 * auVar422._16_4_;
            auVar97._16_4_ = fVar243;
            fVar244 = fVar363 * -fVar310 * auVar422._20_4_;
            auVar97._20_4_ = fVar244;
            fVar262 = fVar267 * -fVar364 * auVar422._24_4_;
            auVar97._24_4_ = fVar262;
            auVar97._28_4_ = auVar429._28_4_;
            auVar176 = vsubps_avx(auVar184,auVar95);
            auVar279._0_4_ = auVar302._0_4_ + fVar246;
            auVar279._4_4_ = auVar302._4_4_ + fVar261;
            auVar279._8_4_ = auVar302._8_4_ + fVar260;
            auVar279._12_4_ = auVar302._12_4_ + fVar263;
            auVar279._16_4_ = auVar302._16_4_ + fVar243;
            auVar279._20_4_ = auVar302._20_4_ + fVar244;
            auVar279._24_4_ = auVar302._24_4_ + fVar262;
            auVar279._28_4_ = auVar302._28_4_ + auVar429._28_4_;
            fVar246 = fVar291 * 0.0 * auVar422._0_4_;
            fVar261 = fVar293 * 0.0 * auVar422._4_4_;
            auVar98._4_4_ = fVar261;
            auVar98._0_4_ = fVar246;
            fVar260 = fVar304 * 0.0 * auVar422._8_4_;
            auVar98._8_4_ = fVar260;
            fVar263 = fVar306 * 0.0 * auVar422._12_4_;
            auVar98._12_4_ = fVar263;
            fVar243 = fVar308 * 0.0 * auVar422._16_4_;
            auVar98._16_4_ = fVar243;
            fVar244 = fVar363 * 0.0 * auVar422._20_4_;
            auVar98._20_4_ = fVar244;
            fVar262 = fVar267 * 0.0 * auVar422._24_4_;
            auVar98._24_4_ = fVar262;
            auVar98._28_4_ = auVar184._28_4_;
            auVar186 = vsubps_avx(auVar318,auVar96);
            auVar373._0_4_ = (float)local_880._0_4_ + fVar246;
            auVar373._4_4_ = (float)local_880._4_4_ + fVar261;
            auVar373._8_4_ = (float)uStack_878 + fVar260;
            auVar373._12_4_ = uStack_878._4_4_ + fVar263;
            auVar373._16_4_ = (float)uStack_870 + fVar243;
            auVar373._20_4_ = uStack_870._4_4_ + fVar244;
            auVar373._24_4_ = (float)uStack_868 + fVar262;
            auVar373._28_4_ = uStack_868._4_4_ + auVar184._28_4_;
            auVar39 = vsubps_avx(auVar302,auVar97);
            auVar40 = vsubps_avx(_local_880,auVar98);
            auVar371 = vsubps_avx(auVar279,auVar43);
            auVar357 = vsubps_avx(auVar373,auVar176);
            auVar99._4_4_ = auVar176._4_4_ * auVar371._4_4_;
            auVar99._0_4_ = auVar176._0_4_ * auVar371._0_4_;
            auVar99._8_4_ = auVar176._8_4_ * auVar371._8_4_;
            auVar99._12_4_ = auVar176._12_4_ * auVar371._12_4_;
            auVar99._16_4_ = auVar176._16_4_ * auVar371._16_4_;
            auVar99._20_4_ = auVar176._20_4_ * auVar371._20_4_;
            auVar99._24_4_ = auVar176._24_4_ * auVar371._24_4_;
            auVar99._28_4_ = auVar402._28_4_;
            auVar100._4_4_ = auVar43._4_4_ * auVar357._4_4_;
            auVar100._0_4_ = auVar43._0_4_ * auVar357._0_4_;
            auVar100._8_4_ = auVar43._8_4_ * auVar357._8_4_;
            auVar100._12_4_ = auVar43._12_4_ * auVar357._12_4_;
            auVar100._16_4_ = auVar43._16_4_ * auVar357._16_4_;
            auVar100._20_4_ = auVar43._20_4_ * auVar357._20_4_;
            auVar100._24_4_ = auVar43._24_4_ * auVar357._24_4_;
            auVar100._28_4_ = uStack_868._4_4_;
            auVar431 = vsubps_avx(auVar100,auVar99);
            auVar101._4_4_ = auVar41._4_4_ * auVar357._4_4_;
            auVar101._0_4_ = auVar41._0_4_ * auVar357._0_4_;
            auVar101._8_4_ = auVar41._8_4_ * auVar357._8_4_;
            auVar101._12_4_ = auVar41._12_4_ * auVar357._12_4_;
            auVar101._16_4_ = auVar41._16_4_ * auVar357._16_4_;
            auVar101._20_4_ = auVar41._20_4_ * auVar357._20_4_;
            auVar101._24_4_ = auVar41._24_4_ * auVar357._24_4_;
            auVar101._28_4_ = auVar357._28_4_;
            auVar357 = vsubps_avx(auVar410,auVar41);
            auVar102._4_4_ = auVar176._4_4_ * auVar357._4_4_;
            auVar102._0_4_ = auVar176._0_4_ * auVar357._0_4_;
            auVar102._8_4_ = auVar176._8_4_ * auVar357._8_4_;
            auVar102._12_4_ = auVar176._12_4_ * auVar357._12_4_;
            auVar102._16_4_ = auVar176._16_4_ * auVar357._16_4_;
            auVar102._20_4_ = auVar176._20_4_ * auVar357._20_4_;
            auVar102._24_4_ = auVar176._24_4_ * auVar357._24_4_;
            auVar102._28_4_ = auVar38._28_4_;
            auVar44 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = auVar43._4_4_ * auVar357._4_4_;
            auVar103._0_4_ = auVar43._0_4_ * auVar357._0_4_;
            auVar103._8_4_ = auVar43._8_4_ * auVar357._8_4_;
            auVar103._12_4_ = auVar43._12_4_ * auVar357._12_4_;
            auVar103._16_4_ = auVar43._16_4_ * auVar357._16_4_;
            auVar103._20_4_ = auVar43._20_4_ * auVar357._20_4_;
            auVar103._24_4_ = auVar43._24_4_ * auVar357._24_4_;
            auVar103._28_4_ = auVar38._28_4_;
            auVar104._4_4_ = auVar41._4_4_ * auVar371._4_4_;
            auVar104._0_4_ = auVar41._0_4_ * auVar371._0_4_;
            auVar104._8_4_ = auVar41._8_4_ * auVar371._8_4_;
            auVar104._12_4_ = auVar41._12_4_ * auVar371._12_4_;
            auVar104._16_4_ = auVar41._16_4_ * auVar371._16_4_;
            auVar104._20_4_ = auVar41._20_4_ * auVar371._20_4_;
            auVar104._24_4_ = auVar41._24_4_ * auVar371._24_4_;
            auVar104._28_4_ = auVar371._28_4_;
            auVar38 = vsubps_avx(auVar104,auVar103);
            auVar217._0_4_ = auVar431._0_4_ * 0.0 + auVar38._0_4_ + auVar44._0_4_ * 0.0;
            auVar217._4_4_ = auVar431._4_4_ * 0.0 + auVar38._4_4_ + auVar44._4_4_ * 0.0;
            auVar217._8_4_ = auVar431._8_4_ * 0.0 + auVar38._8_4_ + auVar44._8_4_ * 0.0;
            auVar217._12_4_ = auVar431._12_4_ * 0.0 + auVar38._12_4_ + auVar44._12_4_ * 0.0;
            auVar217._16_4_ = auVar431._16_4_ * 0.0 + auVar38._16_4_ + auVar44._16_4_ * 0.0;
            auVar217._20_4_ = auVar431._20_4_ * 0.0 + auVar38._20_4_ + auVar44._20_4_ * 0.0;
            auVar217._24_4_ = auVar431._24_4_ * 0.0 + auVar38._24_4_ + auVar44._24_4_ * 0.0;
            auVar217._28_4_ = auVar431._28_4_ + auVar38._28_4_ + auVar44._28_4_;
            auVar239 = vcmpps_avx(auVar217,ZEXT832(0) << 0x20,2);
            auVar186 = vblendvps_avx(auVar186,_local_820,auVar239);
            auVar259 = ZEXT3264(auVar186);
            auVar141._4_4_ = fStack_83c;
            auVar141._0_4_ = local_840;
            auVar141._8_4_ = fStack_838;
            auVar141._12_4_ = fStack_834;
            auVar141._16_4_ = fStack_830;
            auVar141._20_4_ = fStack_82c;
            auVar141._24_4_ = fStack_828;
            auVar141._28_4_ = fStack_824;
            auVar38 = vblendvps_avx(auVar39,auVar141,auVar239);
            auVar39 = vblendvps_avx(auVar40,auVar430,auVar239);
            auVar40 = vblendvps_avx(auVar41,auVar410,auVar239);
            auVar371 = vblendvps_avx(auVar43,auVar279,auVar239);
            auVar357 = vblendvps_avx(auVar176,auVar373,auVar239);
            auVar41 = vblendvps_avx(auVar410,auVar41,auVar239);
            auVar431 = vblendvps_avx(auVar279,auVar43,auVar239);
            auVar44 = vblendvps_avx(auVar373,auVar176,auVar239);
            local_8a0 = vandps_avx(auVar175,auVar238);
            auVar41 = vsubps_avx(auVar41,auVar186);
            auVar177 = vsubps_avx(auVar431,auVar38);
            auVar44 = vsubps_avx(auVar44,auVar39);
            auVar210 = vsubps_avx(auVar38,auVar371);
            fVar246 = auVar177._0_4_;
            fVar328 = auVar39._0_4_;
            fVar309 = auVar177._4_4_;
            fVar337 = auVar39._4_4_;
            auVar105._4_4_ = fVar337 * fVar309;
            auVar105._0_4_ = fVar328 * fVar246;
            fVar288 = auVar177._8_4_;
            fVar339 = auVar39._8_4_;
            auVar105._8_4_ = fVar339 * fVar288;
            fVar306 = auVar177._12_4_;
            fVar341 = auVar39._12_4_;
            auVar105._12_4_ = fVar341 * fVar306;
            fVar245 = auVar177._16_4_;
            fVar342 = auVar39._16_4_;
            auVar105._16_4_ = fVar342 * fVar245;
            fVar206 = auVar177._20_4_;
            fVar343 = auVar39._20_4_;
            auVar105._20_4_ = fVar343 * fVar206;
            fVar324 = auVar177._24_4_;
            fVar344 = auVar39._24_4_;
            auVar105._24_4_ = fVar344 * fVar324;
            auVar105._28_4_ = auVar431._28_4_;
            fVar261 = auVar38._0_4_;
            fVar241 = auVar44._0_4_;
            fVar264 = auVar38._4_4_;
            fVar242 = auVar44._4_4_;
            auVar106._4_4_ = fVar242 * fVar264;
            auVar106._0_4_ = fVar241 * fVar261;
            fVar291 = auVar38._8_4_;
            fVar270 = auVar44._8_4_;
            auVar106._8_4_ = fVar270 * fVar291;
            fVar307 = auVar38._12_4_;
            fVar283 = auVar44._12_4_;
            auVar106._12_4_ = fVar283 * fVar307;
            fVar311 = auVar38._16_4_;
            fVar286 = auVar44._16_4_;
            auVar106._16_4_ = fVar286 * fVar311;
            fVar225 = auVar38._20_4_;
            fVar289 = auVar44._20_4_;
            auVar106._20_4_ = fVar289 * fVar225;
            fVar325 = auVar38._24_4_;
            fVar327 = auVar44._24_4_;
            uVar11 = auVar43._28_4_;
            auVar106._24_4_ = fVar327 * fVar325;
            auVar106._28_4_ = uVar11;
            auVar431 = vsubps_avx(auVar106,auVar105);
            fVar260 = auVar186._0_4_;
            fVar265 = auVar186._4_4_;
            auVar107._4_4_ = fVar242 * fVar265;
            auVar107._0_4_ = fVar241 * fVar260;
            fVar292 = auVar186._8_4_;
            auVar107._8_4_ = fVar270 * fVar292;
            fVar308 = auVar186._12_4_;
            auVar107._12_4_ = fVar283 * fVar308;
            fVar376 = auVar186._16_4_;
            auVar107._16_4_ = fVar286 * fVar376;
            fVar312 = auVar186._20_4_;
            auVar107._20_4_ = fVar289 * fVar312;
            fVar326 = auVar186._24_4_;
            auVar107._24_4_ = fVar327 * fVar326;
            auVar107._28_4_ = uVar11;
            fVar263 = auVar41._0_4_;
            fVar266 = auVar41._4_4_;
            auVar108._4_4_ = fVar337 * fVar266;
            auVar108._0_4_ = fVar328 * fVar263;
            fVar293 = auVar41._8_4_;
            auVar108._8_4_ = fVar339 * fVar293;
            fVar310 = auVar41._12_4_;
            auVar108._12_4_ = fVar341 * fVar310;
            fVar198 = auVar41._16_4_;
            auVar108._16_4_ = fVar342 * fVar198;
            fVar320 = auVar41._20_4_;
            auVar108._20_4_ = fVar343 * fVar320;
            fVar375 = auVar41._24_4_;
            auVar108._24_4_ = fVar344 * fVar375;
            auVar108._28_4_ = auVar410._28_4_;
            auVar43 = vsubps_avx(auVar108,auVar107);
            auVar109._4_4_ = fVar264 * fVar266;
            auVar109._0_4_ = fVar261 * fVar263;
            auVar109._8_4_ = fVar291 * fVar293;
            auVar109._12_4_ = fVar307 * fVar310;
            auVar109._16_4_ = fVar311 * fVar198;
            auVar109._20_4_ = fVar225 * fVar320;
            auVar109._24_4_ = fVar325 * fVar375;
            auVar109._28_4_ = uVar11;
            auVar110._4_4_ = fVar265 * fVar309;
            auVar110._0_4_ = fVar260 * fVar246;
            auVar110._8_4_ = fVar292 * fVar288;
            auVar110._12_4_ = fVar308 * fVar306;
            auVar110._16_4_ = fVar376 * fVar245;
            auVar110._20_4_ = fVar312 * fVar206;
            auVar110._24_4_ = fVar326 * fVar324;
            auVar110._28_4_ = auVar176._28_4_;
            auVar176 = vsubps_avx(auVar110,auVar109);
            auVar211 = vsubps_avx(auVar39,auVar357);
            fVar244 = auVar176._28_4_ + auVar43._28_4_;
            auVar383._0_4_ = auVar176._0_4_ + auVar43._0_4_ * 0.0 + auVar431._0_4_ * 0.0;
            auVar383._4_4_ = auVar176._4_4_ + auVar43._4_4_ * 0.0 + auVar431._4_4_ * 0.0;
            auVar383._8_4_ = auVar176._8_4_ + auVar43._8_4_ * 0.0 + auVar431._8_4_ * 0.0;
            auVar383._12_4_ = auVar176._12_4_ + auVar43._12_4_ * 0.0 + auVar431._12_4_ * 0.0;
            auVar383._16_4_ = auVar176._16_4_ + auVar43._16_4_ * 0.0 + auVar431._16_4_ * 0.0;
            auVar383._20_4_ = auVar176._20_4_ + auVar43._20_4_ * 0.0 + auVar431._20_4_ * 0.0;
            auVar383._24_4_ = auVar176._24_4_ + auVar43._24_4_ * 0.0 + auVar431._24_4_ * 0.0;
            auVar383._28_4_ = fVar244 + auVar431._28_4_;
            fVar243 = auVar210._0_4_;
            fVar268 = auVar210._4_4_;
            auVar111._4_4_ = auVar357._4_4_ * fVar268;
            auVar111._0_4_ = auVar357._0_4_ * fVar243;
            fVar294 = auVar210._8_4_;
            auVar111._8_4_ = auVar357._8_4_ * fVar294;
            fVar363 = auVar210._12_4_;
            auVar111._12_4_ = auVar357._12_4_ * fVar363;
            fVar200 = auVar210._16_4_;
            auVar111._16_4_ = auVar357._16_4_ * fVar200;
            fVar321 = auVar210._20_4_;
            auVar111._20_4_ = auVar357._20_4_ * fVar321;
            fVar169 = auVar210._24_4_;
            auVar111._24_4_ = auVar357._24_4_ * fVar169;
            auVar111._28_4_ = fVar244;
            fVar244 = auVar211._0_4_;
            fVar281 = auVar211._4_4_;
            auVar112._4_4_ = auVar371._4_4_ * fVar281;
            auVar112._0_4_ = auVar371._0_4_ * fVar244;
            fVar304 = auVar211._8_4_;
            auVar112._8_4_ = auVar371._8_4_ * fVar304;
            fVar364 = auVar211._12_4_;
            auVar112._12_4_ = auVar371._12_4_ * fVar364;
            fVar170 = auVar211._16_4_;
            auVar112._16_4_ = auVar371._16_4_ * fVar170;
            fVar322 = auVar211._20_4_;
            auVar112._20_4_ = auVar371._20_4_ * fVar322;
            fVar194 = auVar211._24_4_;
            auVar112._24_4_ = auVar371._24_4_ * fVar194;
            auVar112._28_4_ = auVar176._28_4_;
            auVar43 = vsubps_avx(auVar112,auVar111);
            auVar176 = vsubps_avx(auVar186,auVar40);
            fVar262 = auVar176._0_4_;
            fVar285 = auVar176._4_4_;
            auVar113._4_4_ = auVar357._4_4_ * fVar285;
            auVar113._0_4_ = auVar357._0_4_ * fVar262;
            fVar305 = auVar176._8_4_;
            auVar113._8_4_ = auVar357._8_4_ * fVar305;
            fVar267 = auVar176._12_4_;
            auVar113._12_4_ = auVar357._12_4_ * fVar267;
            fVar195 = auVar176._16_4_;
            auVar113._16_4_ = auVar357._16_4_ * fVar195;
            fVar323 = auVar176._20_4_;
            auVar113._20_4_ = auVar357._20_4_ * fVar323;
            fVar197 = auVar176._24_4_;
            auVar113._24_4_ = auVar357._24_4_ * fVar197;
            auVar113._28_4_ = auVar357._28_4_;
            auVar114._4_4_ = fVar281 * auVar40._4_4_;
            auVar114._0_4_ = fVar244 * auVar40._0_4_;
            auVar114._8_4_ = fVar304 * auVar40._8_4_;
            auVar114._12_4_ = fVar364 * auVar40._12_4_;
            auVar114._16_4_ = fVar170 * auVar40._16_4_;
            auVar114._20_4_ = fVar322 * auVar40._20_4_;
            auVar114._24_4_ = fVar194 * auVar40._24_4_;
            auVar114._28_4_ = auVar431._28_4_;
            auVar357 = vsubps_avx(auVar113,auVar114);
            auVar432 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar115._4_4_ = auVar371._4_4_ * fVar285;
            auVar115._0_4_ = auVar371._0_4_ * fVar262;
            auVar115._8_4_ = auVar371._8_4_ * fVar305;
            auVar115._12_4_ = auVar371._12_4_ * fVar267;
            auVar115._16_4_ = auVar371._16_4_ * fVar195;
            auVar115._20_4_ = auVar371._20_4_ * fVar323;
            auVar115._24_4_ = auVar371._24_4_ * fVar197;
            auVar115._28_4_ = auVar371._28_4_;
            auVar116._4_4_ = fVar268 * auVar40._4_4_;
            auVar116._0_4_ = fVar243 * auVar40._0_4_;
            auVar116._8_4_ = fVar294 * auVar40._8_4_;
            auVar116._12_4_ = fVar363 * auVar40._12_4_;
            auVar116._16_4_ = fVar200 * auVar40._16_4_;
            auVar116._20_4_ = fVar321 * auVar40._20_4_;
            auVar116._24_4_ = fVar169 * auVar40._24_4_;
            auVar116._28_4_ = auVar40._28_4_;
            auVar40 = vsubps_avx(auVar116,auVar115);
            auVar431 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar185._0_4_ = auVar43._0_4_ * 0.0 + auVar40._0_4_ + auVar357._0_4_ * 0.0;
            auVar185._4_4_ = auVar43._4_4_ * 0.0 + auVar40._4_4_ + auVar357._4_4_ * 0.0;
            auVar185._8_4_ = auVar43._8_4_ * 0.0 + auVar40._8_4_ + auVar357._8_4_ * 0.0;
            auVar185._12_4_ = auVar43._12_4_ * 0.0 + auVar40._12_4_ + auVar357._12_4_ * 0.0;
            auVar185._16_4_ = auVar43._16_4_ * 0.0 + auVar40._16_4_ + auVar357._16_4_ * 0.0;
            auVar185._20_4_ = auVar43._20_4_ * 0.0 + auVar40._20_4_ + auVar357._20_4_ * 0.0;
            auVar185._24_4_ = auVar43._24_4_ * 0.0 + auVar40._24_4_ + auVar357._24_4_ * 0.0;
            auVar185._28_4_ = auVar357._28_4_ + auVar40._28_4_ + auVar357._28_4_;
            auVar193 = ZEXT3264(auVar185);
            auVar40 = vmaxps_avx(auVar383,auVar185);
            auVar40 = vcmpps_avx(auVar40,auVar431,2);
            auVar371 = local_8a0 & auVar40;
            auVar124 = auVar39;
            if ((((((((auVar371 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar371 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar371 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar371 >> 0x7f,0) == '\0') &&
                  (auVar371 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar371 >> 0xbf,0) == '\0') &&
                (auVar371 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar371[0x1f]) {
LAB_01231586:
              auVar335 = ZEXT3264(auVar124);
              auVar219._8_8_ = uStack_698;
              auVar219._0_8_ = local_6a0;
              auVar219._16_8_ = uStack_690;
              auVar219._24_8_ = uStack_688;
              auVar374 = ZEXT3264(local_620);
              auVar384._4_4_ = fVar196;
              auVar384._0_4_ = fVar171;
              auVar384._8_4_ = fVar199;
              auVar384._12_4_ = fVar201;
              auVar384._16_4_ = fVar202;
              auVar384._20_4_ = fVar203;
              auVar384._24_4_ = fVar204;
              auVar384._28_4_ = fVar205;
            }
            else {
              auVar371 = vandps_avx(auVar40,local_8a0);
              auVar117._4_4_ = fVar281 * fVar309;
              auVar117._0_4_ = fVar244 * fVar246;
              auVar117._8_4_ = fVar304 * fVar288;
              auVar117._12_4_ = fVar364 * fVar306;
              auVar117._16_4_ = fVar170 * fVar245;
              auVar117._20_4_ = fVar322 * fVar206;
              auVar117._24_4_ = fVar194 * fVar324;
              auVar117._28_4_ = local_8a0._28_4_;
              auVar118._4_4_ = fVar268 * fVar242;
              auVar118._0_4_ = fVar243 * fVar241;
              auVar118._8_4_ = fVar294 * fVar270;
              auVar118._12_4_ = fVar363 * fVar283;
              auVar118._16_4_ = fVar200 * fVar286;
              auVar118._20_4_ = fVar321 * fVar289;
              auVar118._24_4_ = fVar169 * fVar327;
              auVar118._28_4_ = auVar40._28_4_;
              auVar357 = vsubps_avx(auVar118,auVar117);
              auVar119._4_4_ = fVar285 * fVar242;
              auVar119._0_4_ = fVar262 * fVar241;
              auVar119._8_4_ = fVar305 * fVar270;
              auVar119._12_4_ = fVar267 * fVar283;
              auVar119._16_4_ = fVar195 * fVar286;
              auVar119._20_4_ = fVar323 * fVar289;
              auVar119._24_4_ = fVar197 * fVar327;
              auVar119._28_4_ = auVar44._28_4_;
              auVar120._4_4_ = fVar281 * fVar266;
              auVar120._0_4_ = fVar244 * fVar263;
              auVar120._8_4_ = fVar304 * fVar293;
              auVar120._12_4_ = fVar364 * fVar310;
              auVar120._16_4_ = fVar170 * fVar198;
              auVar120._20_4_ = fVar322 * fVar320;
              auVar120._24_4_ = fVar194 * fVar375;
              auVar120._28_4_ = auVar211._28_4_;
              auVar44 = vsubps_avx(auVar120,auVar119);
              auVar121._4_4_ = fVar268 * fVar266;
              auVar121._0_4_ = fVar243 * fVar263;
              auVar121._8_4_ = fVar294 * fVar293;
              auVar121._12_4_ = fVar363 * fVar310;
              auVar121._16_4_ = fVar200 * fVar198;
              auVar121._20_4_ = fVar321 * fVar320;
              auVar121._24_4_ = fVar169 * fVar375;
              auVar121._28_4_ = auVar41._28_4_;
              auVar122._4_4_ = fVar285 * fVar309;
              auVar122._0_4_ = fVar262 * fVar246;
              auVar122._8_4_ = fVar305 * fVar288;
              auVar122._12_4_ = fVar267 * fVar306;
              auVar122._16_4_ = fVar195 * fVar245;
              auVar122._20_4_ = fVar323 * fVar206;
              auVar122._24_4_ = fVar197 * fVar324;
              auVar122._28_4_ = auVar177._28_4_;
              auVar43 = vsubps_avx(auVar122,auVar121);
              auVar218._0_4_ = auVar357._0_4_ * 0.0 + auVar43._0_4_ + auVar44._0_4_ * 0.0;
              auVar218._4_4_ = auVar357._4_4_ * 0.0 + auVar43._4_4_ + auVar44._4_4_ * 0.0;
              auVar218._8_4_ = auVar357._8_4_ * 0.0 + auVar43._8_4_ + auVar44._8_4_ * 0.0;
              auVar218._12_4_ = auVar357._12_4_ * 0.0 + auVar43._12_4_ + auVar44._12_4_ * 0.0;
              auVar218._16_4_ = auVar357._16_4_ * 0.0 + auVar43._16_4_ + auVar44._16_4_ * 0.0;
              auVar218._20_4_ = auVar357._20_4_ * 0.0 + auVar43._20_4_ + auVar44._20_4_ * 0.0;
              auVar218._24_4_ = auVar357._24_4_ * 0.0 + auVar43._24_4_ + auVar44._24_4_ * 0.0;
              auVar218._28_4_ = auVar177._28_4_ + auVar43._28_4_ + auVar41._28_4_;
              auVar40 = vrcpps_avx(auVar218);
              fVar246 = auVar40._0_4_;
              fVar263 = auVar40._4_4_;
              auVar123._4_4_ = auVar218._4_4_ * fVar263;
              auVar123._0_4_ = auVar218._0_4_ * fVar246;
              fVar243 = auVar40._8_4_;
              auVar123._8_4_ = auVar218._8_4_ * fVar243;
              fVar244 = auVar40._12_4_;
              auVar123._12_4_ = auVar218._12_4_ * fVar244;
              fVar262 = auVar40._16_4_;
              auVar123._16_4_ = auVar218._16_4_ * fVar262;
              fVar309 = auVar40._20_4_;
              auVar123._20_4_ = auVar218._20_4_ * fVar309;
              fVar266 = auVar40._24_4_;
              auVar123._24_4_ = auVar218._24_4_ * fVar266;
              auVar123._28_4_ = auVar211._28_4_;
              auVar403._8_4_ = 0x3f800000;
              auVar403._0_8_ = &DAT_3f8000003f800000;
              auVar403._12_4_ = 0x3f800000;
              auVar403._16_4_ = 0x3f800000;
              auVar403._20_4_ = 0x3f800000;
              auVar403._24_4_ = 0x3f800000;
              auVar403._28_4_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar403,auVar123);
              fVar246 = auVar40._0_4_ * fVar246 + fVar246;
              fVar263 = auVar40._4_4_ * fVar263 + fVar263;
              fVar243 = auVar40._8_4_ * fVar243 + fVar243;
              fVar244 = auVar40._12_4_ * fVar244 + fVar244;
              fVar262 = auVar40._16_4_ * fVar262 + fVar262;
              fVar309 = auVar40._20_4_ * fVar309 + fVar309;
              fVar266 = auVar40._24_4_ * fVar266 + fVar266;
              fVar328 = auVar43._0_4_ * fVar328;
              fVar337 = auVar43._4_4_ * fVar337;
              auVar124._4_4_ = fVar337;
              auVar124._0_4_ = fVar328;
              fVar339 = auVar43._8_4_ * fVar339;
              auVar124._8_4_ = fVar339;
              fVar341 = auVar43._12_4_ * fVar341;
              auVar124._12_4_ = fVar341;
              fVar342 = auVar43._16_4_ * fVar342;
              auVar124._16_4_ = fVar342;
              fVar343 = auVar43._20_4_ * fVar343;
              auVar124._20_4_ = fVar343;
              fVar344 = auVar43._24_4_ * fVar344;
              auVar124._24_4_ = fVar344;
              auVar124._28_4_ = auVar39._28_4_;
              auVar125._4_4_ =
                   (fVar265 * auVar357._4_4_ + auVar44._4_4_ * fVar264 + fVar337) * fVar263;
              auVar125._0_4_ =
                   (fVar260 * auVar357._0_4_ + auVar44._0_4_ * fVar261 + fVar328) * fVar246;
              auVar125._8_4_ =
                   (fVar292 * auVar357._8_4_ + auVar44._8_4_ * fVar291 + fVar339) * fVar243;
              auVar125._12_4_ =
                   (fVar308 * auVar357._12_4_ + auVar44._12_4_ * fVar307 + fVar341) * fVar244;
              auVar125._16_4_ =
                   (fVar376 * auVar357._16_4_ + auVar44._16_4_ * fVar311 + fVar342) * fVar262;
              auVar125._20_4_ =
                   (fVar312 * auVar357._20_4_ + auVar44._20_4_ * fVar225 + fVar343) * fVar309;
              auVar125._24_4_ =
                   (fVar326 * auVar357._24_4_ + auVar44._24_4_ * fVar325 + fVar344) * fVar266;
              auVar125._28_4_ = auVar186._28_4_ + auVar38._28_4_ + auVar39._28_4_;
              auVar259 = ZEXT3264(auVar125);
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar280._4_4_ = uVar11;
              auVar280._0_4_ = uVar11;
              auVar280._8_4_ = uVar11;
              auVar280._12_4_ = uVar11;
              auVar280._16_4_ = uVar11;
              auVar280._20_4_ = uVar11;
              auVar280._24_4_ = uVar11;
              auVar280._28_4_ = uVar11;
              auVar186 = vcmpps_avx(local_120,auVar125,2);
              auVar38 = vcmpps_avx(auVar125,auVar280,2);
              auVar186 = vandps_avx(auVar186,auVar38);
              auVar38 = auVar371 & auVar186;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) goto LAB_01231586;
              auVar186 = vandps_avx(auVar371,auVar186);
              auVar38 = vcmpps_avx(auVar431,auVar218,4);
              auVar335 = ZEXT3264(auVar38);
              auVar39 = auVar186 & auVar38;
              auVar219._8_8_ = uStack_698;
              auVar219._0_8_ = local_6a0;
              auVar219._16_8_ = uStack_690;
              auVar219._24_8_ = uStack_688;
              auVar374 = ZEXT3264(local_620);
              auVar384._4_4_ = fVar196;
              auVar384._0_4_ = fVar171;
              auVar384._8_4_ = fVar199;
              auVar384._12_4_ = fVar201;
              auVar384._16_4_ = fVar202;
              auVar384._20_4_ = fVar203;
              auVar384._24_4_ = fVar204;
              auVar384._28_4_ = fVar205;
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar219 = vandps_avx(auVar38,auVar186);
                auVar126._4_4_ = auVar383._4_4_ * fVar263;
                auVar126._0_4_ = auVar383._0_4_ * fVar246;
                auVar126._8_4_ = auVar383._8_4_ * fVar243;
                auVar126._12_4_ = auVar383._12_4_ * fVar244;
                auVar126._16_4_ = auVar383._16_4_ * fVar262;
                auVar126._20_4_ = auVar383._20_4_ * fVar309;
                auVar126._24_4_ = auVar383._24_4_ * fVar266;
                auVar126._28_4_ = local_640._28_4_;
                auVar127._4_4_ = auVar185._4_4_ * fVar263;
                auVar127._0_4_ = auVar185._0_4_ * fVar246;
                auVar127._8_4_ = auVar185._8_4_ * fVar243;
                auVar127._12_4_ = auVar185._12_4_ * fVar244;
                auVar127._16_4_ = auVar185._16_4_ * fVar262;
                auVar127._20_4_ = auVar185._20_4_ * fVar309;
                auVar127._24_4_ = auVar185._24_4_ * fVar266;
                auVar127._28_4_ = auVar185._28_4_;
                auVar193 = ZEXT3264(auVar127);
                auVar319._8_4_ = 0x3f800000;
                auVar319._0_8_ = &DAT_3f8000003f800000;
                auVar319._12_4_ = 0x3f800000;
                auVar319._16_4_ = 0x3f800000;
                auVar319._20_4_ = 0x3f800000;
                auVar319._24_4_ = 0x3f800000;
                auVar319._28_4_ = 0x3f800000;
                auVar186 = vsubps_avx(auVar319,auVar126);
                local_380 = vblendvps_avx(auVar186,auVar126,auVar239);
                auVar186 = vsubps_avx(auVar319,auVar127);
                local_640 = vblendvps_avx(auVar186,auVar127,auVar239);
                auVar374 = ZEXT3264(auVar125);
              }
            }
            local_620 = auVar374._0_32_;
            local_5a0 = auVar238;
            if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar219 >> 0x7f,0) != '\0') ||
                  (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0xbf,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar219[0x1f] < '\0') {
              auVar186 = vsubps_avx(auVar422,auVar384);
              fVar261 = auVar384._0_4_ + local_380._0_4_ * auVar186._0_4_;
              fVar260 = auVar384._4_4_ + local_380._4_4_ * auVar186._4_4_;
              fVar263 = auVar384._8_4_ + local_380._8_4_ * auVar186._8_4_;
              fVar243 = auVar384._12_4_ + local_380._12_4_ * auVar186._12_4_;
              fVar244 = auVar384._16_4_ + local_380._16_4_ * auVar186._16_4_;
              fVar262 = auVar384._20_4_ + local_380._20_4_ * auVar186._20_4_;
              fVar309 = auVar384._24_4_ + local_380._24_4_ * auVar186._24_4_;
              fVar264 = auVar384._28_4_ + auVar186._28_4_;
              fVar246 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar239._4_4_ = fVar246;
              auVar239._0_4_ = fVar246;
              auVar239._8_4_ = fVar246;
              auVar239._12_4_ = fVar246;
              auVar239._16_4_ = fVar246;
              auVar239._20_4_ = fVar246;
              auVar239._24_4_ = fVar246;
              auVar239._28_4_ = fVar246;
              auVar128._4_4_ = (fVar260 + fVar260) * fVar246;
              auVar128._0_4_ = (fVar261 + fVar261) * fVar246;
              auVar128._8_4_ = (fVar263 + fVar263) * fVar246;
              auVar128._12_4_ = (fVar243 + fVar243) * fVar246;
              auVar128._16_4_ = (fVar244 + fVar244) * fVar246;
              auVar128._20_4_ = (fVar262 + fVar262) * fVar246;
              auVar128._24_4_ = (fVar309 + fVar309) * fVar246;
              auVar128._28_4_ = fVar264 + fVar264;
              auVar186 = vcmpps_avx(local_620,auVar128,6);
              auVar193 = ZEXT3264(auVar186);
              auVar38 = auVar219 & auVar186;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                local_400 = vandps_avx(auVar186,auVar219);
                auVar193 = ZEXT3264(local_400);
                fVar246 = local_640._4_4_;
                fVar261 = local_640._8_4_;
                fVar260 = local_640._12_4_;
                fVar263 = local_640._16_4_;
                fVar243 = local_640._20_4_;
                fVar244 = local_640._24_4_;
                fVar262 = local_640._28_4_;
                auVar240 = ZEXT3264(CONCAT428(0xbf800000,
                                              CONCAT424(0xbf800000,
                                                        CONCAT420(0xbf800000,
                                                                  CONCAT416(0xbf800000,
                                                                            CONCAT412(0xbf800000,
                                                                                      CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
                local_640._0_4_ = local_640._0_4_ + local_640._0_4_ + -1.0;
                local_640._4_4_ = fVar246 + fVar246 + -1.0;
                local_640._8_4_ = fVar261 + fVar261 + -1.0;
                local_640._12_4_ = fVar260 + fVar260 + -1.0;
                local_640._16_4_ = fVar263 + fVar263 + -1.0;
                local_640._20_4_ = fVar243 + fVar243 + -1.0;
                local_640._24_4_ = fVar244 + fVar244 + -1.0;
                local_640._28_4_ = fVar262 + fVar262 + -1.0;
                auVar335 = ZEXT3264(local_640);
                uStack_448 = uStack_908;
                local_440 = local_790;
                uStack_438 = uStack_788;
                local_430 = local_710;
                uStack_428 = uStack_708;
                local_420 = local_720;
                uStack_418 = uStack_718;
                pGVar167 = (context->scene->geometries).items[uVar32].ptr;
                if ((pGVar167->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar229._0_4_ = (float)(int)local_460;
                  auVar229._4_8_ = SUB128(ZEXT812(0),4);
                  auVar229._12_4_ = 0;
                  auVar173 = vshufps_avx(auVar229,auVar229,0);
                  local_3e0[0] = (auVar173._0_4_ + local_380._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_3e0[1] = (auVar173._4_4_ + local_380._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_3e0[2] = (auVar173._8_4_ + local_380._8_4_ + 2.0) * fStack_138;
                  local_3e0[3] = (auVar173._12_4_ + local_380._12_4_ + 3.0) * fStack_134;
                  fStack_3d0 = (auVar173._0_4_ + local_380._16_4_ + 4.0) * fStack_130;
                  fStack_3cc = (auVar173._4_4_ + local_380._20_4_ + 5.0) * fStack_12c;
                  fStack_3c8 = (auVar173._8_4_ + local_380._24_4_ + 6.0) * fStack_128;
                  fStack_3c4 = auVar173._12_4_ + local_380._28_4_ + 7.0;
                  local_3c0 = local_640;
                  local_3a0 = local_620;
                  auVar220._8_4_ = 0x7f800000;
                  auVar220._0_8_ = 0x7f8000007f800000;
                  auVar220._12_4_ = 0x7f800000;
                  auVar220._16_4_ = 0x7f800000;
                  auVar220._20_4_ = 0x7f800000;
                  auVar220._24_4_ = 0x7f800000;
                  auVar220._28_4_ = 0x7f800000;
                  auVar186 = vblendvps_avx(auVar220,local_620,local_400);
                  auVar38 = vshufps_avx(auVar186,auVar186,0xb1);
                  auVar38 = vminps_avx(auVar186,auVar38);
                  auVar39 = vshufpd_avx(auVar38,auVar38,5);
                  auVar38 = vminps_avx(auVar38,auVar39);
                  auVar39 = vperm2f128_avx(auVar38,auVar38,1);
                  auVar38 = vminps_avx(auVar38,auVar39);
                  auVar38 = vcmpps_avx(auVar186,auVar38,0);
                  auVar39 = local_400 & auVar38;
                  auVar186 = local_400;
                  if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar39 >> 0x7f,0) != '\0') ||
                        (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar39 >> 0xbf,0) != '\0') ||
                      (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar39[0x1f] < '\0') {
                    auVar186 = vandps_avx(auVar38,local_400);
                  }
                  uVar160 = vmovmskps_avx(auVar186);
                  uVar163 = 0;
                  if (uVar160 != 0) {
                    for (; (uVar160 >> uVar163 & 1) == 0; uVar163 = uVar163 + 1) {
                    }
                  }
                  uVar161 = (ulong)uVar163;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar167->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar246 = local_3e0[uVar161];
                    auVar193 = ZEXT464((uint)fVar246);
                    uVar11 = *(undefined4 *)(local_3c0 + uVar161 * 4);
                    fVar260 = 1.0 - fVar246;
                    fVar261 = fVar246 * fVar260 * 4.0;
                    auVar173 = ZEXT416((uint)(fVar246 * fVar246 * 0.5));
                    auVar173 = vshufps_avx(auVar173,auVar173,0);
                    auVar230 = ZEXT416((uint)((fVar260 * fVar260 + fVar261) * 0.5));
                    auVar230 = vshufps_avx(auVar230,auVar230,0);
                    auVar275 = ZEXT416((uint)((-fVar246 * fVar246 - fVar261) * 0.5));
                    auVar275 = vshufps_avx(auVar275,auVar275,0);
                    auVar249 = ZEXT416((uint)(fVar260 * -fVar260 * 0.5));
                    auVar249 = vshufps_avx(auVar249,auVar249,0);
                    auVar231._0_4_ =
                         auVar249._0_4_ * fVar269 +
                         auVar275._0_4_ * (float)local_790._0_4_ +
                         auVar173._0_4_ * (float)local_720._0_4_ +
                         auVar230._0_4_ * (float)local_710._0_4_;
                    auVar231._4_4_ =
                         auVar249._4_4_ * fVar282 +
                         auVar275._4_4_ * (float)local_790._4_4_ +
                         auVar173._4_4_ * (float)local_720._4_4_ +
                         auVar230._4_4_ * (float)local_710._4_4_;
                    auVar231._8_4_ =
                         auVar249._8_4_ * auVar273._8_4_ +
                         auVar275._8_4_ * (float)uStack_788 +
                         auVar173._8_4_ * (float)uStack_718 + auVar230._8_4_ * (float)uStack_708;
                    auVar231._12_4_ =
                         auVar249._12_4_ * auVar273._12_4_ +
                         auVar275._12_4_ * uStack_788._4_4_ +
                         auVar173._12_4_ * uStack_718._4_4_ + auVar230._12_4_ * uStack_708._4_4_;
                    auVar240 = ZEXT1664(auVar231);
                    auVar259 = ZEXT464(*(uint *)(local_3a0 + uVar161 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_3a0 + uVar161 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar231._0_4_;
                    uVar35 = vextractps_avx(auVar231,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                    uVar35 = vextractps_avx(auVar231,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar246;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                    *(uint *)(ray + k * 4 + 0x220) = uVar33;
                    *(uint *)(ray + k * 4 + 0x240) = uVar32;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    auStack_8b0 = auVar429._16_16_;
                    _local_8c0 = _local_790;
                    auStack_7f0 = auVar318._16_16_;
                    _local_800 = _local_710;
                    auStack_730 = auVar302._16_16_;
                    _local_740 = _local_720;
                    uStack_810 = *local_778;
                    _local_820 = *local_770;
                    uStack_808 = local_778[1];
                    _auStack_758 = auVar175._8_24_;
                    local_760 = pGVar167;
                    local_6e0 = local_400;
                    local_4c0 = local_380;
                    _local_4a0 = local_640;
                    local_480 = local_620;
                    local_45c = uVar34;
                    local_450 = auVar273._0_8_;
                    do {
                      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_240 = local_3e0[uVar161];
                      local_220 = *(undefined4 *)(local_3c0 + uVar161 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_3a0 + uVar161 * 4);
                      fVar261 = 1.0 - local_240;
                      fVar246 = local_240 * fVar261 * 4.0;
                      auVar173 = ZEXT416((uint)(local_240 * local_240 * 0.5));
                      auVar173 = vshufps_avx(auVar173,auVar173,0);
                      auVar230 = ZEXT416((uint)((fVar261 * fVar261 + fVar246) * 0.5));
                      auVar230 = vshufps_avx(auVar230,auVar230,0);
                      auVar275 = ZEXT416((uint)((-local_240 * local_240 - fVar246) * 0.5));
                      auVar275 = vshufps_avx(auVar275,auVar275,0);
                      local_8f0.context = context->user;
                      auVar249 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                      auVar249 = vshufps_avx(auVar249,auVar249,0);
                      auVar232._0_4_ =
                           auVar249._0_4_ * fVar269 +
                           auVar275._0_4_ * (float)local_8c0._0_4_ +
                           auVar173._0_4_ * (float)local_740._0_4_ +
                           auVar230._0_4_ * (float)local_800._0_4_;
                      auVar232._4_4_ =
                           auVar249._4_4_ * fVar282 +
                           auVar275._4_4_ * (float)local_8c0._4_4_ +
                           auVar173._4_4_ * (float)local_740._4_4_ +
                           auVar230._4_4_ * (float)local_800._4_4_;
                      auVar232._8_4_ =
                           auVar249._8_4_ * auVar273._8_4_ +
                           auVar275._8_4_ * fStack_8b8 +
                           auVar173._8_4_ * (float)uStack_738 + auVar230._8_4_ * fStack_7f8;
                      auVar232._12_4_ =
                           auVar249._12_4_ * auVar273._12_4_ +
                           auVar275._12_4_ * fStack_8b4 +
                           auVar173._12_4_ * uStack_738._4_4_ + auVar230._12_4_ * fStack_7f4;
                      auStack_290 = vshufps_avx(auVar232,auVar232,0);
                      local_2a0[0] = (RTCHitN)auStack_290[0];
                      local_2a0[1] = (RTCHitN)auStack_290[1];
                      local_2a0[2] = (RTCHitN)auStack_290[2];
                      local_2a0[3] = (RTCHitN)auStack_290[3];
                      local_2a0[4] = (RTCHitN)auStack_290[4];
                      local_2a0[5] = (RTCHitN)auStack_290[5];
                      local_2a0[6] = (RTCHitN)auStack_290[6];
                      local_2a0[7] = (RTCHitN)auStack_290[7];
                      local_2a0[8] = (RTCHitN)auStack_290[8];
                      local_2a0[9] = (RTCHitN)auStack_290[9];
                      local_2a0[10] = (RTCHitN)auStack_290[10];
                      local_2a0[0xb] = (RTCHitN)auStack_290[0xb];
                      local_2a0[0xc] = (RTCHitN)auStack_290[0xc];
                      local_2a0[0xd] = (RTCHitN)auStack_290[0xd];
                      local_2a0[0xe] = (RTCHitN)auStack_290[0xe];
                      local_2a0[0xf] = (RTCHitN)auStack_290[0xf];
                      auStack_270 = vshufps_avx(auVar232,auVar232,0x55);
                      auVar259 = ZEXT1664(auStack_270);
                      local_280 = auStack_270;
                      auStack_250 = vshufps_avx(auVar232,auVar232,0xaa);
                      local_260 = auStack_250;
                      fStack_23c = local_240;
                      fStack_238 = local_240;
                      fStack_234 = local_240;
                      fStack_230 = local_240;
                      fStack_22c = local_240;
                      fStack_228 = local_240;
                      fStack_224 = local_240;
                      uStack_21c = local_220;
                      uStack_218 = local_220;
                      uStack_214 = local_220;
                      uStack_210 = local_220;
                      uStack_20c = local_220;
                      uStack_208 = local_220;
                      uStack_204 = local_220;
                      local_200 = local_180._0_8_;
                      uStack_1f8 = local_180._8_8_;
                      uStack_1f0 = local_180._16_8_;
                      uStack_1e8 = local_180._24_8_;
                      local_1e0 = local_160._0_8_;
                      uStack_1d8 = local_160._8_8_;
                      uStack_1d0 = local_160._16_8_;
                      uStack_1c8 = local_160._24_8_;
                      auVar175 = vcmpps_avx(auVar432._0_32_,auVar432._0_32_,0xf);
                      local_768[1] = auVar175;
                      *local_768 = auVar175;
                      local_1c0 = (local_8f0.context)->instID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_1a0 = (local_8f0.context)->instPrimID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_7c0 = local_820;
                      uStack_7b8 = uStack_818;
                      uStack_7b0 = uStack_810;
                      uStack_7a8 = uStack_808;
                      local_8f0.valid = (int *)&local_7c0;
                      local_8f0.geometryUserPtr = pGVar167->userPtr;
                      local_8f0.hit = local_2a0;
                      local_8f0.N = 8;
                      local_8f0.ray = (RTCRayN *)ray;
                      if (pGVar167->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar259 = ZEXT1664(auStack_270);
                        auVar335 = ZEXT1664(auVar335._0_16_);
                        local_8a0 = auVar175;
                        (*pGVar167->intersectionFilterN)(&local_8f0);
                        auVar374 = ZEXT3264(local_620);
                        auVar432 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar167 = local_760;
                        auVar175 = local_8a0;
                      }
                      auVar142._8_8_ = uStack_7b8;
                      auVar142._0_8_ = local_7c0;
                      auVar173 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar142);
                      auVar146._8_8_ = uStack_7a8;
                      auVar146._0_8_ = uStack_7b0;
                      auVar230 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar146);
                      auVar187._16_16_ = auVar230;
                      auVar187._0_16_ = auVar173;
                      auVar186 = auVar175 & ~auVar187;
                      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar186 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar186 >> 0x7f,0) == '\0') &&
                            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar186 >> 0xbf,0) == '\0') &&
                          (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar186[0x1f]) {
                        auVar188._0_4_ = auVar173._0_4_ ^ auVar175._0_4_;
                        auVar188._4_4_ = auVar173._4_4_ ^ auVar175._4_4_;
                        auVar188._8_4_ = auVar173._8_4_ ^ auVar175._8_4_;
                        auVar188._12_4_ = auVar173._12_4_ ^ auVar175._12_4_;
                        auVar188._16_4_ = auVar230._0_4_ ^ auVar175._16_4_;
                        auVar188._20_4_ = auVar230._4_4_ ^ auVar175._20_4_;
                        auVar188._24_4_ = auVar230._8_4_ ^ auVar175._24_4_;
                        auVar188._28_4_ = auVar230._12_4_ ^ auVar175._28_4_;
                      }
                      else {
                        p_Var37 = context->args->filter;
                        if ((p_Var37 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar167->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar335 = ZEXT1664(auVar335._0_16_);
                          local_8a0 = auVar175;
                          (*p_Var37)(&local_8f0);
                          auVar374 = ZEXT3264(local_620);
                          auVar432 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar167 = local_760;
                          auVar175 = local_8a0;
                        }
                        auVar143._8_8_ = uStack_7b8;
                        auVar143._0_8_ = local_7c0;
                        auVar173 = vpcmpeqd_avx((undefined1  [16])0x0,auVar143);
                        auVar147._8_8_ = uStack_7a8;
                        auVar147._0_8_ = uStack_7b0;
                        auVar230 = vpcmpeqd_avx((undefined1  [16])0x0,auVar147);
                        auVar221._16_16_ = auVar230;
                        auVar221._0_16_ = auVar173;
                        auVar188._0_4_ = auVar173._0_4_ ^ auVar175._0_4_;
                        auVar188._4_4_ = auVar173._4_4_ ^ auVar175._4_4_;
                        auVar188._8_4_ = auVar173._8_4_ ^ auVar175._8_4_;
                        auVar188._12_4_ = auVar173._12_4_ ^ auVar175._12_4_;
                        auVar188._16_4_ = auVar230._0_4_ ^ auVar175._16_4_;
                        auVar188._20_4_ = auVar230._4_4_ ^ auVar175._20_4_;
                        auVar188._24_4_ = auVar230._8_4_ ^ auVar175._24_4_;
                        auVar188._28_4_ = auVar230._12_4_ ^ auVar175._28_4_;
                        auVar175 = auVar175 & ~auVar221;
                        if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar175 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar175 >> 0x7f,0) != '\0')
                              || (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar175 >> 0xbf,0) != '\0') ||
                            (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar175[0x1f] < '\0') {
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])local_8f0.hit);
                          *(undefined1 (*) [32])(local_8f0.ray + 0x180) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x20));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1a0) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x40));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1c0) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x60));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x1e0) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x80));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x200) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar175;
                          auVar175 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                              (local_8f0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar175;
                        }
                      }
                      if ((((((((auVar188 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar188 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar188 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar188 >> 0x7f,0) == '\0') &&
                            (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar188 >> 0xbf,0) == '\0') &&
                          (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar188[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
                      }
                      *(undefined4 *)(local_6e0 + uVar161 * 4) = 0;
                      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar189._4_4_ = uVar11;
                      auVar189._0_4_ = uVar11;
                      auVar189._8_4_ = uVar11;
                      auVar189._12_4_ = uVar11;
                      auVar189._16_4_ = uVar11;
                      auVar189._20_4_ = uVar11;
                      auVar189._24_4_ = uVar11;
                      auVar189._28_4_ = uVar11;
                      auVar186 = vcmpps_avx(auVar374._0_32_,auVar189,2);
                      auVar175 = vandps_avx(auVar186,local_6e0);
                      auVar193 = ZEXT3264(auVar175);
                      auVar186 = local_6e0 & auVar186;
                      bVar135 = (auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar136 = (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar134 = (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                      bVar133 = SUB321(auVar186 >> 0x7f,0) != '\0';
                      bVar132 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar131 = SUB321(auVar186 >> 0xbf,0) != '\0';
                      bVar130 = (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                      bVar129 = auVar186[0x1f] < '\0';
                      if (((((((bVar135 || bVar136) || bVar134) || bVar133) || bVar132) || bVar131)
                          || bVar130) || bVar129) {
                        auVar222._8_4_ = 0x7f800000;
                        auVar222._0_8_ = 0x7f8000007f800000;
                        auVar222._12_4_ = 0x7f800000;
                        auVar222._16_4_ = 0x7f800000;
                        auVar222._20_4_ = 0x7f800000;
                        auVar222._24_4_ = 0x7f800000;
                        auVar222._28_4_ = 0x7f800000;
                        auVar186 = vblendvps_avx(auVar222,auVar374._0_32_,auVar175);
                        auVar38 = vshufps_avx(auVar186,auVar186,0xb1);
                        auVar38 = vminps_avx(auVar186,auVar38);
                        auVar39 = vshufpd_avx(auVar38,auVar38,5);
                        auVar38 = vminps_avx(auVar38,auVar39);
                        auVar39 = vperm2f128_avx(auVar38,auVar38,1);
                        auVar259 = ZEXT3264(auVar39);
                        local_6e0 = vminps_avx(auVar38,auVar39);
                        auVar186 = vcmpps_avx(auVar186,local_6e0,0);
                        auVar38 = auVar175 & auVar186;
                        if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar38 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar38 >> 0x7f,0) != '\0') ||
                              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar38 >> 0xbf,0) != '\0') ||
                            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar38[0x1f] < '\0') {
                          auVar186 = vandps_avx(auVar186,auVar175);
                          auVar193 = ZEXT3264(auVar186);
                        }
                        uVar160 = vmovmskps_avx(auVar193._0_32_);
                        uVar163 = 0;
                        if (uVar160 != 0) {
                          for (; (uVar160 >> uVar163 & 1) == 0; uVar163 = uVar163 + 1) {
                          }
                        }
                        uVar161 = (ulong)uVar163;
                      }
                      auVar240 = ZEXT3264(local_6e0);
                      local_6e0 = auVar175;
                    } while (((((((bVar135 || bVar136) || bVar134) || bVar133) || bVar132) ||
                              bVar131) || bVar130) || bVar129);
                  }
                }
                goto LAB_0123129b;
              }
            }
            auVar240 = ZEXT3264(auVar239);
          }
LAB_0123129b:
          lVar168 = lVar168 + 8;
        } while ((int)lVar168 < (int)uVar34);
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar182._4_4_ = uVar11;
      auVar182._0_4_ = uVar11;
      auVar182._8_4_ = uVar11;
      auVar182._12_4_ = uVar11;
      auVar182._16_4_ = uVar11;
      auVar182._20_4_ = uVar11;
      auVar182._24_4_ = uVar11;
      auVar182._28_4_ = uVar11;
      auVar175 = vcmpps_avx(local_80,auVar182,2);
      uVar163 = vmovmskps_avx(auVar175);
      uVar158 = uVar158 & uVar158 + 0xff & uVar163;
    } while (uVar158 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }